

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86.cpp
# Opt level: O0

void ncnn::softmax_pack4(float *_ptr,int elemcount,int stride,int size1,float *_maxptr,
                        float *_sumptr)

{
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  ushort uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [56];
  undefined1 auVar235 [24];
  undefined1 auVar236 [40];
  undefined1 auVar237 [48];
  float *pfVar238;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined1 (*in_R8) [64];
  undefined1 (*in_R9) [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar253 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  __m128 _sum_7;
  __m128 _p_2;
  __m128 _p3_8;
  __m128 _p2_8;
  __m128 _p1_8;
  __m128 _p0_8;
  __m256 _p3_7;
  __m256 _p2_7;
  __m256 _p1_7;
  __m256 _p0_7;
  __m512 _sum3;
  __m512 _sum2;
  __m512 _sum1;
  __m512 _sum0;
  __m512 _sum_6;
  __m512 _p3_6;
  __m512 _p2_6;
  __m512 _p1_6;
  __m512 _p0_6;
  __m512i _pidx3_1;
  __m512i _pidx2_1;
  __m512i _pidx1_1;
  __m512i _pidx0_1;
  int j_3;
  float *sumptr_2;
  float *ptr_2;
  int i_2;
  __m128 _sum_5;
  __m128 _one;
  __m256 _sum_4;
  __m256 _one_avx;
  __m512 _sum_3;
  __m512 _one_avx512;
  int j_2;
  float *sumptr_1;
  __m128 _max_4;
  __m128 _p_1;
  __m128 _sum_2;
  __m128 _sum0123_2;
  __m128 _sum23_2;
  __m128 _sum01_2;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 _p3_5;
  __m128 _p2_5;
  __m128 _p1_5;
  __m128 _p0_5;
  __m256 _sum_1;
  __m256 _sum0123_1;
  __m256 _sum23_1;
  __m256 _sum01_1;
  __m256 _tmp3_3;
  __m256 _tmp2_3;
  __m256 _tmp1_3;
  __m256 _tmp0_3;
  __m256 _p3_4;
  __m256 _p2_4;
  __m256 _p1_4;
  __m256 _p0_4;
  __m512 _sum;
  __m512 _sum0123;
  __m512 _sum23;
  __m512 _sum01;
  __m512 _tmp3_2;
  __m512 _tmp2_2;
  __m512 _tmp1_2;
  __m512 _tmp0_2;
  __m512 _max3;
  __m512 _max2;
  __m512 _max1;
  __m512 _max0;
  __m512 _max_3;
  __m512 _p3_3;
  __m512 _p2_3;
  __m512 _p1_3;
  __m512 _p0_3;
  __m512i _pidx_1;
  __m512i _pidx3;
  __m512i _pidx2;
  __m512i _pidx1;
  __m512i _pidx0;
  int j_1;
  float *sumptr;
  float *maxptr_1;
  float *ptr_1;
  int i_1;
  __m128 _p;
  __m128 _max_2;
  __m128 _max0123_2;
  __m128 _max23_2;
  __m128 _max01_2;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _p3_2;
  __m128 _p2_2;
  __m128 _p1_2;
  __m128 _p0_2;
  __m256 _max_1;
  __m256 _max0123_1;
  __m256 _max23_1;
  __m256 _max01_1;
  __m256 _tmp3_1;
  __m256 _tmp2_1;
  __m256 _tmp1_1;
  __m256 _tmp0_1;
  __m256 _p3_1;
  __m256 _p2_1;
  __m256 _p1_1;
  __m256 _p0_1;
  __m512 _max;
  __m512 _max0123;
  __m512 _max23;
  __m512 _max01;
  __m512 _tmp3;
  __m512 _tmp2;
  __m512 _tmp1;
  __m512 _tmp0;
  __m512 _p3;
  __m512 _p2;
  __m512 _p1;
  __m512 _p0;
  __m512i _pidx;
  int j;
  float *maxptr;
  float *ptr;
  int i;
  __m128 x32;
  __m128 x64;
  __m512 pow2n_3;
  __m512 y_3;
  __mmask16 mask_3;
  __m512 one_3;
  __m512i imm0_3;
  __m512 fx_3;
  __m512 tmp_3;
  __m512 pow2n_2;
  __m512 y_2;
  __mmask16 mask_2;
  __m512 one_2;
  __m512i imm0_2;
  __m512 fx_2;
  __m512 tmp_2;
  __m512 pow2n_1;
  __m512 y_1;
  __mmask16 mask_1;
  __m512 one_1;
  __m512i imm0_1;
  __m512 fx_1;
  __m512 tmp_1;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 pow2n_7;
  __m256 y_7;
  __m256 mask_7;
  __m256 one_7;
  __m256i imm0_7;
  __m256 fx_7;
  __m256 tmp_7;
  __m256 pow2n_6;
  __m256 y_6;
  __m256 mask_6;
  __m256 one_6;
  __m256i imm0_6;
  __m256 fx_6;
  __m256 tmp_6;
  __m256 pow2n_5;
  __m256 y_5;
  __m256 mask_5;
  __m256 one_5;
  __m256i imm0_5;
  __m256 fx_5;
  __m256 tmp_5;
  __m256 pow2n_4;
  __m256 y_4;
  __m256 mask_4;
  __m256 one_4;
  __m256i imm0_4;
  __m256 fx_4;
  __m256 tmp_4;
  v4sf pow2n_12;
  v4sf y_12;
  v4sf mask_12;
  v4sf one_12;
  v4si emm0_4;
  v4sf fx_12;
  v4sf tmp_12;
  v4sf pow2n_11;
  v4sf y_11;
  v4sf mask_11;
  v4sf one_11;
  v4si emm0_3;
  v4sf fx_11;
  v4sf tmp_11;
  v4sf pow2n_10;
  v4sf y_10;
  v4sf mask_10;
  v4sf one_10;
  v4si emm0_2;
  v4sf fx_10;
  v4sf tmp_10;
  v4sf pow2n_9;
  v4sf y_9;
  v4sf mask_9;
  v4sf one_9;
  v4si emm0_1;
  v4sf fx_9;
  v4sf tmp_9;
  v4sf pow2n_8;
  v4sf y_8;
  v4sf mask_8;
  v4sf one_8;
  v4si emm0;
  v4sf fx_8;
  v4sf tmp_8;
  __m128 x32_1;
  __m128 x64_1;
  undefined8 local_bd90;
  undefined8 uStack_bd88;
  undefined8 local_bd80;
  undefined8 uStack_bd78;
  undefined8 local_bd70;
  undefined8 uStack_bd68;
  undefined8 local_bd60;
  undefined8 uStack_bd58;
  undefined8 local_bd50;
  undefined8 uStack_bd48;
  undefined8 local_bd40;
  undefined8 uStack_bd38;
  undefined8 uStack_bd30;
  undefined8 uStack_bd28;
  undefined8 local_bd20;
  undefined8 uStack_bd18;
  undefined8 uStack_bd10;
  undefined8 uStack_bd08;
  undefined8 local_bd00;
  undefined8 uStack_bcf8;
  undefined8 uStack_bcf0;
  undefined8 uStack_bce8;
  undefined8 local_bce0;
  undefined8 uStack_bcd8;
  undefined8 uStack_bcd0;
  undefined8 uStack_bcc8;
  undefined8 local_bb80;
  undefined8 uStack_bb78;
  undefined8 uStack_bb70;
  undefined8 uStack_bb68;
  undefined8 uStack_bb60;
  undefined8 uStack_bb58;
  undefined8 uStack_bb50;
  undefined8 uStack_bb48;
  undefined8 local_bb40;
  undefined8 uStack_bb38;
  undefined8 uStack_bb30;
  undefined8 uStack_bb28;
  undefined8 uStack_bb20;
  undefined8 uStack_bb18;
  undefined8 uStack_bb10;
  undefined8 uStack_bb08;
  undefined8 local_bb00;
  undefined8 uStack_baf8;
  undefined8 uStack_baf0;
  undefined8 uStack_bae8;
  undefined8 uStack_bae0;
  undefined8 uStack_bad8;
  undefined8 uStack_bad0;
  undefined8 uStack_bac8;
  undefined8 local_bac0;
  undefined8 uStack_bab8;
  undefined8 uStack_bab0;
  undefined8 uStack_baa8;
  undefined8 uStack_baa0;
  undefined8 uStack_ba98;
  undefined8 uStack_ba90;
  undefined8 uStack_ba88;
  int local_b97c;
  undefined1 (*local_b978) [64];
  undefined1 (*local_b970) [64];
  int local_b964;
  undefined8 local_b960;
  undefined8 uStack_b958;
  undefined8 local_b940;
  undefined8 uStack_b938;
  undefined8 uStack_b930;
  undefined8 uStack_b928;
  undefined8 local_b900;
  undefined8 uStack_b8f8;
  undefined8 uStack_b8f0;
  undefined8 uStack_b8e8;
  undefined8 uStack_b8e0;
  undefined8 uStack_b8d8;
  undefined8 uStack_b8d0;
  undefined8 uStack_b8c8;
  int local_b86c;
  undefined1 (*local_b868) [64];
  undefined8 local_b840;
  undefined8 uStack_b838;
  undefined8 local_b780;
  undefined8 uStack_b778;
  undefined8 uStack_b770;
  undefined8 uStack_b768;
  undefined1 local_b740 [8];
  float fStack_b738;
  float fStack_b734;
  float fStack_b730;
  float fStack_b72c;
  float fStack_b728;
  float fStack_b724;
  undefined1 local_b720 [8];
  float fStack_b718;
  float fStack_b714;
  float fStack_b710;
  float fStack_b70c;
  float fStack_b708;
  float fStack_b704;
  undefined8 local_b600;
  undefined8 uStack_b5f8;
  undefined8 uStack_b5f0;
  undefined8 uStack_b5e8;
  undefined8 uStack_b5e0;
  undefined8 uStack_b5d8;
  undefined8 uStack_b5d0;
  undefined8 uStack_b5c8;
  int local_b074;
  undefined1 (*local_b070) [64];
  undefined1 (*local_b068) [64];
  undefined1 (*local_b060) [64];
  int local_b058;
  float local_b054;
  undefined8 local_b050;
  undefined8 uStack_b048;
  undefined1 local_b040 [16];
  undefined1 local_b030 [16];
  undefined1 local_b020 [16];
  undefined1 local_b010 [16];
  undefined1 local_b000 [16];
  undefined1 local_aff0 [16];
  undefined1 local_afe0 [16];
  undefined1 local_afd0 [16];
  undefined1 local_afc0 [16];
  undefined1 local_afb0 [16];
  undefined1 local_afa0 [16];
  undefined1 local_af90 [16];
  undefined1 local_af80 [32];
  undefined1 local_af60 [32];
  undefined1 local_af40 [32];
  undefined1 local_af20 [32];
  undefined1 local_af00 [32];
  undefined1 local_aee0 [32];
  undefined1 local_aec0 [32];
  undefined1 local_aea0 [32];
  undefined8 local_ae80;
  undefined8 uStack_ae78;
  undefined8 uStack_ae70;
  undefined8 uStack_ae68;
  undefined8 local_ae60;
  undefined8 uStack_ae58;
  undefined8 uStack_ae50;
  undefined8 uStack_ae48;
  undefined8 local_ae40;
  undefined8 uStack_ae38;
  undefined8 uStack_ae30;
  undefined8 uStack_ae28;
  undefined8 local_ae20;
  undefined8 uStack_ae18;
  undefined8 uStack_ae10;
  undefined8 uStack_ae08;
  undefined1 local_ae00 [64];
  undefined1 local_adc0 [64];
  undefined1 local_ad80 [64];
  undefined1 local_ad40 [64];
  undefined1 local_ad00 [64];
  undefined1 local_acc0 [64];
  undefined1 local_ac80 [64];
  undefined1 local_ac40 [64];
  undefined8 local_ac00;
  undefined8 uStack_abf8;
  undefined8 uStack_abf0;
  undefined8 uStack_abe8;
  undefined8 uStack_abe0;
  undefined8 uStack_abd8;
  undefined8 uStack_abd0;
  undefined8 uStack_abc8;
  undefined8 local_abc0;
  undefined8 uStack_abb8;
  undefined8 uStack_abb0;
  undefined8 uStack_aba8;
  undefined8 uStack_aba0;
  undefined8 uStack_ab98;
  undefined8 uStack_ab90;
  undefined8 uStack_ab88;
  undefined8 local_ab80;
  undefined8 uStack_ab78;
  undefined8 uStack_ab70;
  undefined8 uStack_ab68;
  undefined8 uStack_ab60;
  undefined8 uStack_ab58;
  undefined8 uStack_ab50;
  undefined8 uStack_ab48;
  undefined8 local_ab40;
  undefined8 uStack_ab38;
  undefined8 uStack_ab30;
  undefined8 uStack_ab28;
  undefined8 uStack_ab20;
  undefined8 uStack_ab18;
  undefined8 uStack_ab10;
  undefined8 uStack_ab08;
  undefined1 local_ab00 [64];
  int local_aa84;
  undefined1 (*local_aa80) [64];
  undefined1 (*local_aa78) [64];
  int local_aa6c;
  undefined1 (*local_aa68) [64];
  undefined1 (*local_aa60) [64];
  int local_aa54;
  int local_aa50;
  int local_aa4c;
  long local_aa48;
  undefined1 (*local_a628) [64];
  undefined1 (*local_a620) [64];
  undefined1 (*local_a618) [64];
  undefined1 (*local_a610) [64];
  undefined1 (*local_a608) [64];
  undefined8 local_a600;
  undefined8 uStack_a5f8;
  undefined8 uStack_a5f0;
  undefined8 uStack_a5e8;
  undefined8 uStack_a5e0;
  undefined8 uStack_a5d8;
  undefined8 uStack_a5d0;
  undefined8 uStack_a5c8;
  undefined8 local_a5c0;
  undefined8 uStack_a5b8;
  undefined8 uStack_a5b0;
  undefined8 uStack_a5a8;
  undefined8 uStack_a5a0;
  undefined8 uStack_a598;
  undefined8 uStack_a590;
  undefined8 uStack_a588;
  undefined8 local_a580;
  undefined8 uStack_a578;
  undefined8 uStack_a570;
  undefined8 uStack_a568;
  undefined8 uStack_a560;
  undefined8 uStack_a558;
  undefined8 uStack_a550;
  undefined8 uStack_a548;
  undefined8 local_a540;
  undefined8 uStack_a538;
  undefined8 uStack_a530;
  undefined8 uStack_a528;
  undefined8 uStack_a520;
  undefined8 uStack_a518;
  undefined8 uStack_a510;
  undefined8 uStack_a508;
  undefined8 local_a500;
  undefined8 uStack_a4f8;
  undefined8 uStack_a4f0;
  undefined8 uStack_a4e8;
  undefined8 uStack_a4e0;
  undefined8 uStack_a4d8;
  undefined8 uStack_a4d0;
  undefined8 uStack_a4c8;
  undefined8 local_a4c0;
  undefined8 uStack_a4b8;
  undefined8 uStack_a4b0;
  undefined8 uStack_a4a8;
  undefined8 uStack_a4a0;
  undefined8 uStack_a498;
  undefined8 uStack_a490;
  undefined8 uStack_a488;
  undefined8 local_a480;
  undefined8 uStack_a478;
  undefined8 uStack_a470;
  undefined8 uStack_a468;
  undefined8 uStack_a460;
  undefined8 uStack_a458;
  undefined8 uStack_a450;
  undefined8 uStack_a448;
  undefined8 local_a440;
  undefined8 uStack_a438;
  undefined8 uStack_a430;
  undefined8 uStack_a428;
  undefined8 uStack_a420;
  undefined8 uStack_a418;
  undefined8 uStack_a410;
  undefined8 uStack_a408;
  undefined1 (*local_a388) [64];
  undefined1 (*local_a380) [32];
  undefined1 (*local_a378) [64];
  undefined1 (*local_a370) [32];
  undefined1 (*local_a368) [64];
  undefined8 local_a360;
  undefined8 uStack_a358;
  undefined8 uStack_a350;
  undefined8 uStack_a348;
  undefined8 local_a340;
  undefined8 uStack_a338;
  undefined8 uStack_a330;
  undefined8 uStack_a328;
  undefined8 local_a320;
  undefined8 uStack_a318;
  undefined8 uStack_a310;
  undefined8 uStack_a308;
  undefined8 local_a300;
  undefined8 uStack_a2f8;
  undefined8 uStack_a2f0;
  undefined8 uStack_a2e8;
  undefined8 local_a2e0;
  undefined8 uStack_a2d8;
  undefined8 uStack_a2d0;
  undefined8 uStack_a2c8;
  undefined8 local_a2c0;
  undefined8 uStack_a2b8;
  undefined8 uStack_a2b0;
  undefined8 uStack_a2a8;
  undefined8 local_a2a0;
  undefined8 uStack_a298;
  undefined8 uStack_a290;
  undefined8 uStack_a288;
  undefined8 local_a280;
  undefined8 uStack_a278;
  undefined8 uStack_a270;
  undefined8 uStack_a268;
  undefined1 (*local_a200) [64];
  undefined1 (*local_a1f8) [64];
  undefined1 (*local_a1f0) [16];
  undefined1 (*local_a1e8) [16];
  undefined1 (*local_a1e0) [16];
  undefined1 (*local_a1d8) [64];
  undefined8 local_a1d0;
  undefined8 uStack_a1c8;
  undefined8 local_a1c0;
  undefined8 uStack_a1b8;
  undefined8 local_a1b0;
  undefined8 uStack_a1a8;
  undefined8 local_a1a0;
  undefined8 uStack_a198;
  undefined8 local_a190;
  undefined8 uStack_a188;
  undefined8 local_a180;
  undefined8 uStack_a178;
  undefined8 local_a170;
  undefined8 uStack_a168;
  undefined8 local_a160;
  undefined8 uStack_a158;
  undefined1 local_a050 [16];
  undefined1 local_a040 [16];
  undefined8 local_a030;
  undefined8 uStack_a028;
  undefined1 local_a020 [16];
  undefined8 local_a010;
  undefined8 uStack_a008;
  undefined1 local_9dc0 [8];
  undefined8 uStack_9db8;
  undefined8 uStack_9db0;
  undefined8 uStack_9da8;
  undefined8 uStack_9da0;
  undefined8 uStack_9d98;
  undefined8 uStack_9d90;
  undefined8 uStack_9d88;
  undefined1 local_9cc0 [16];
  undefined8 uStack_9cb0;
  undefined8 uStack_9ca8;
  undefined8 uStack_9ca0;
  undefined8 uStack_9c98;
  undefined8 uStack_9c90;
  undefined8 uStack_9c88;
  undefined1 local_9b40 [8];
  undefined8 uStack_9b38;
  undefined8 uStack_9b30;
  undefined8 uStack_9b28;
  undefined8 uStack_9b20;
  undefined8 uStack_9b18;
  undefined8 uStack_9b10;
  undefined8 uStack_9b08;
  undefined1 local_9a40 [16];
  undefined8 uStack_9a30;
  undefined8 uStack_9a28;
  undefined8 uStack_9a20;
  undefined8 uStack_9a18;
  undefined8 uStack_9a10;
  undefined8 uStack_9a08;
  undefined1 local_98c0 [8];
  undefined8 uStack_98b8;
  undefined8 uStack_98b0;
  undefined8 uStack_98a8;
  undefined8 uStack_98a0;
  undefined8 uStack_9898;
  undefined8 uStack_9890;
  undefined8 uStack_9888;
  undefined1 local_97c0 [16];
  undefined8 uStack_97b0;
  undefined8 uStack_97a8;
  undefined8 uStack_97a0;
  undefined8 uStack_9798;
  undefined8 uStack_9790;
  undefined8 uStack_9788;
  undefined1 local_9640 [8];
  undefined8 uStack_9638;
  undefined8 uStack_9630;
  undefined8 uStack_9628;
  undefined8 uStack_9620;
  undefined8 uStack_9618;
  undefined8 uStack_9610;
  undefined8 uStack_9608;
  undefined1 local_9540 [16];
  undefined8 uStack_9530;
  undefined8 uStack_9528;
  undefined8 uStack_9520;
  undefined8 uStack_9518;
  undefined8 uStack_9510;
  undefined8 uStack_9508;
  undefined8 local_8f00;
  undefined8 uStack_8ef8;
  undefined8 uStack_8ef0;
  undefined8 uStack_8ee8;
  undefined8 uStack_8ee0;
  undefined8 uStack_8ed8;
  undefined8 uStack_8ed0;
  undefined8 uStack_8ec8;
  undefined1 (*local_8e88) [64];
  undefined1 local_8960 [8];
  undefined8 uStack_8958;
  undefined8 uStack_8950;
  undefined8 uStack_8948;
  undefined1 local_8900 [16];
  undefined8 uStack_88f0;
  undefined8 uStack_88e8;
  undefined1 local_88c0 [8];
  float fStack_88b8;
  float fStack_88b4;
  undefined1 local_87e0 [8];
  undefined8 uStack_87d8;
  undefined8 uStack_87d0;
  undefined8 uStack_87c8;
  undefined1 local_8780 [16];
  undefined8 uStack_8770;
  undefined8 uStack_8768;
  undefined1 local_8740 [8];
  float fStack_8738;
  float fStack_8734;
  undefined1 local_8660 [8];
  undefined8 uStack_8658;
  undefined8 uStack_8650;
  undefined8 uStack_8648;
  undefined1 local_8600 [16];
  undefined8 uStack_85f0;
  undefined8 uStack_85e8;
  undefined1 local_85c0 [8];
  float fStack_85b8;
  float fStack_85b4;
  undefined1 local_84e0 [8];
  undefined8 uStack_84d8;
  undefined8 uStack_84d0;
  undefined8 uStack_84c8;
  undefined1 local_8480 [16];
  undefined8 uStack_8470;
  undefined8 uStack_8468;
  undefined1 local_8440 [8];
  float fStack_8438;
  float fStack_8434;
  undefined8 local_8100;
  undefined8 uStack_80f8;
  undefined8 uStack_80f0;
  undefined8 uStack_80e8;
  undefined1 (*local_80c8) [64];
  float local_80a0;
  float fStack_809c;
  float fStack_8098;
  float fStack_8094;
  float local_8060;
  float fStack_805c;
  float fStack_8058;
  float fStack_8054;
  float local_8020;
  float fStack_801c;
  float fStack_8018;
  float fStack_8014;
  float local_7fe0;
  float fStack_7fdc;
  float fStack_7fd8;
  float fStack_7fd4;
  float local_7fa0;
  float fStack_7f9c;
  float fStack_7f98;
  float fStack_7f94;
  float fStack_7f90;
  float fStack_7f8c;
  float fStack_7f88;
  float fStack_7f84;
  float local_7f80;
  float fStack_7f7c;
  float fStack_7f78;
  float fStack_7f74;
  float fStack_7f70;
  float fStack_7f6c;
  float fStack_7f68;
  float fStack_7f64;
  float local_7f60;
  float fStack_7f5c;
  float fStack_7f58;
  float fStack_7f54;
  float fStack_7f50;
  float fStack_7f4c;
  float fStack_7f48;
  float fStack_7f44;
  float local_7f40;
  float fStack_7f3c;
  float fStack_7f38;
  float fStack_7f34;
  float fStack_7f30;
  float fStack_7f2c;
  float fStack_7f28;
  float fStack_7f24;
  float local_7f20;
  float fStack_7f1c;
  float fStack_7f18;
  float fStack_7f14;
  float fStack_7f10;
  float fStack_7f0c;
  float fStack_7f08;
  float fStack_7f04;
  float local_7f00;
  float fStack_7efc;
  float fStack_7ef8;
  float fStack_7ef4;
  float fStack_7ef0;
  float fStack_7eec;
  float fStack_7ee8;
  float fStack_7ee4;
  float local_7ee0;
  float fStack_7edc;
  float fStack_7ed8;
  float fStack_7ed4;
  float fStack_7ed0;
  float fStack_7ecc;
  float fStack_7ec8;
  float fStack_7ec4;
  undefined1 local_7e10 [8];
  undefined8 uStack_7e08;
  undefined8 local_7de0;
  undefined8 uStack_7dd8;
  undefined8 local_7dd0;
  undefined8 uStack_7dc8;
  undefined1 local_7dc0 [8];
  float fStack_7db8;
  float fStack_7db4;
  undefined1 local_7d50 [8];
  undefined8 uStack_7d48;
  undefined8 local_7d20;
  undefined8 uStack_7d18;
  undefined8 local_7d10;
  undefined8 uStack_7d08;
  undefined1 local_7d00 [8];
  float fStack_7cf8;
  float fStack_7cf4;
  undefined1 local_7c90 [8];
  undefined8 uStack_7c88;
  undefined8 local_7c60;
  undefined8 uStack_7c58;
  undefined8 local_7c50;
  undefined8 uStack_7c48;
  undefined1 local_7c40 [8];
  float fStack_7c38;
  float fStack_7c34;
  undefined1 local_7bd0 [8];
  undefined8 uStack_7bc8;
  undefined8 local_7ba0;
  undefined8 uStack_7b98;
  undefined8 local_7b90;
  undefined8 uStack_7b88;
  undefined1 local_7b80 [8];
  float fStack_7b78;
  float fStack_7b74;
  undefined1 local_7b10 [8];
  undefined8 uStack_7b08;
  undefined8 local_7ae0;
  undefined8 uStack_7ad8;
  undefined8 local_7ad0;
  undefined8 uStack_7ac8;
  undefined1 local_7ac0 [8];
  float fStack_7ab8;
  float fStack_7ab4;
  undefined8 local_78e0;
  undefined8 uStack_78d8;
  undefined1 (*local_78c8) [64];
  float local_78b0;
  float fStack_78ac;
  float fStack_78a8;
  float fStack_78a4;
  float local_7870;
  float fStack_786c;
  float fStack_7868;
  float fStack_7864;
  float local_7830;
  float fStack_782c;
  float fStack_7828;
  float fStack_7824;
  float local_77f0;
  float fStack_77ec;
  float fStack_77e8;
  float fStack_77e4;
  float local_77b0;
  float fStack_77ac;
  float fStack_77a8;
  float fStack_77a4;
  float local_7770;
  float fStack_776c;
  float fStack_7768;
  float fStack_7764;
  float local_7740;
  float fStack_773c;
  float fStack_7738;
  float fStack_7734;
  float local_7730;
  float fStack_772c;
  float fStack_7728;
  float fStack_7724;
  float local_7720;
  float fStack_771c;
  float fStack_7718;
  float fStack_7714;
  float local_7710;
  float fStack_770c;
  float fStack_7708;
  float fStack_7704;
  float local_75e0;
  float fStack_75dc;
  float local_6fc0;
  float fStack_6fbc;
  float fStack_6fb8;
  float fStack_6fb4;
  float fStack_6fb0;
  float fStack_6fac;
  float fStack_6fa8;
  float local_6f60;
  float fStack_6f5c;
  float fStack_6f58;
  float fStack_6f54;
  float local_6f40;
  float fStack_6f3c;
  float fStack_6f38;
  float fStack_6f34;
  float fStack_6f30;
  float fStack_6f2c;
  float fStack_6f28;
  float local_6ee0;
  float fStack_6edc;
  float fStack_6ed8;
  float fStack_6ed4;
  float local_6ec0;
  float fStack_6ebc;
  float fStack_6eb8;
  float fStack_6eb4;
  float fStack_6eb0;
  float fStack_6eac;
  float fStack_6ea8;
  float local_6e60;
  float fStack_6e5c;
  float fStack_6e58;
  float fStack_6e54;
  float local_6e40;
  float fStack_6e3c;
  float fStack_6e38;
  float fStack_6e34;
  float fStack_6e30;
  float fStack_6e2c;
  float fStack_6e28;
  float local_6de0;
  float fStack_6ddc;
  float fStack_6dd8;
  float fStack_6dd4;
  float local_6da0;
  float fStack_6d9c;
  float fStack_6d98;
  float fStack_6d94;
  float fStack_6d90;
  float fStack_6d8c;
  float fStack_6d88;
  undefined4 uStack_6d84;
  float local_6d60;
  float fStack_6d5c;
  float fStack_6d58;
  float fStack_6d54;
  float fStack_6d50;
  float fStack_6d4c;
  float fStack_6d48;
  undefined4 uStack_6d44;
  float local_6d20;
  float fStack_6d1c;
  float fStack_6d18;
  float fStack_6d14;
  float fStack_6d10;
  float fStack_6d0c;
  float fStack_6d08;
  undefined4 uStack_6d04;
  float local_6ce0;
  float fStack_6cdc;
  float fStack_6cd8;
  float fStack_6cd4;
  float fStack_6cd0;
  float fStack_6ccc;
  float fStack_6cc8;
  undefined4 uStack_6cc4;
  float local_6cc0;
  float fStack_6cbc;
  float fStack_6cb8;
  float fStack_6cb4;
  float local_6c90;
  float fStack_6c8c;
  float fStack_6c88;
  float fStack_6c84;
  float local_6c70;
  float fStack_6c6c;
  float fStack_6c68;
  float fStack_6c64;
  float local_6c60;
  float fStack_6c5c;
  float fStack_6c58;
  float fStack_6c54;
  float local_6c30;
  float fStack_6c2c;
  float fStack_6c28;
  float fStack_6c24;
  float local_6c10;
  float fStack_6c0c;
  float fStack_6c08;
  float fStack_6c04;
  float local_6c00;
  float fStack_6bfc;
  float fStack_6bf8;
  float fStack_6bf4;
  float local_6bd0;
  float fStack_6bcc;
  float fStack_6bc8;
  float fStack_6bc4;
  float local_6bb0;
  float fStack_6bac;
  float fStack_6ba8;
  float fStack_6ba4;
  float local_6ba0;
  float fStack_6b9c;
  float fStack_6b98;
  float fStack_6b94;
  float local_6b70;
  float fStack_6b6c;
  float fStack_6b68;
  float fStack_6b64;
  float local_6b50;
  float fStack_6b4c;
  float fStack_6b48;
  float fStack_6b44;
  float local_6b40;
  float fStack_6b3c;
  float fStack_6b38;
  float fStack_6b34;
  float local_6b10;
  float fStack_6b0c;
  float fStack_6b08;
  float fStack_6b04;
  float local_6af0;
  float fStack_6aec;
  float fStack_6ae8;
  float fStack_6ae4;
  float local_6ad0;
  float fStack_6acc;
  float fStack_6ac8;
  float fStack_6ac4;
  float local_6ab0;
  float fStack_6aac;
  float fStack_6aa8;
  float fStack_6aa4;
  float local_6a90;
  float fStack_6a8c;
  float fStack_6a88;
  float fStack_6a84;
  float local_6a70;
  float fStack_6a6c;
  float fStack_6a68;
  float fStack_6a64;
  float local_6a50;
  float fStack_6a4c;
  float fStack_6a48;
  float fStack_6a44;
  undefined8 uStack_6a30;
  undefined8 uStack_6a28;
  undefined8 local_6960;
  undefined8 uStack_6958;
  undefined8 local_6950;
  undefined8 uStack_6948;
  undefined8 local_6900;
  undefined8 uStack_68f8;
  undefined8 local_68f0;
  undefined8 uStack_68e8;
  undefined8 local_68e0;
  undefined8 uStack_68d8;
  undefined8 local_68d0;
  undefined8 uStack_68c8;
  undefined4 local_68c0;
  undefined4 uStack_68bc;
  undefined4 uStack_68b8;
  undefined4 uStack_68b4;
  undefined8 local_68b0;
  undefined8 uStack_68a8;
  undefined8 local_6890;
  undefined8 uStack_6888;
  int local_4fc0;
  int iStack_4fbc;
  int iStack_4fb8;
  int iStack_4fb4;
  int iStack_4fb0;
  int iStack_4fac;
  int iStack_4fa8;
  int iStack_4fa4;
  int iStack_4fa0;
  int iStack_4f9c;
  int iStack_4f98;
  int iStack_4f94;
  int iStack_4f90;
  int iStack_4f8c;
  int iStack_4f88;
  int iStack_4f84;
  int local_4e40;
  int iStack_4e3c;
  int iStack_4e38;
  int iStack_4e34;
  int iStack_4e30;
  int iStack_4e2c;
  int iStack_4e28;
  int iStack_4e24;
  int iStack_4e20;
  int iStack_4e1c;
  int iStack_4e18;
  int iStack_4e14;
  int iStack_4e10;
  int iStack_4e0c;
  int iStack_4e08;
  int iStack_4e04;
  int local_4cc0;
  int iStack_4cbc;
  int iStack_4cb8;
  int iStack_4cb4;
  int iStack_4cb0;
  int iStack_4cac;
  int iStack_4ca8;
  int iStack_4ca4;
  int iStack_4ca0;
  int iStack_4c9c;
  int iStack_4c98;
  int iStack_4c94;
  int iStack_4c90;
  int iStack_4c8c;
  int iStack_4c88;
  int iStack_4c84;
  int local_4b40;
  int iStack_4b3c;
  int iStack_4b38;
  int iStack_4b34;
  int iStack_4b30;
  int iStack_4b2c;
  int iStack_4b28;
  int iStack_4b24;
  int iStack_4b20;
  int iStack_4b1c;
  int iStack_4b18;
  int iStack_4b14;
  int iStack_4b10;
  int iStack_4b0c;
  int iStack_4b08;
  int iStack_4b04;
  float local_37a0;
  float fStack_379c;
  float fStack_3798;
  float fStack_3794;
  float fStack_3790;
  float fStack_378c;
  float fStack_3788;
  float fStack_3784;
  float local_3780;
  float fStack_377c;
  float fStack_3778;
  float fStack_3774;
  float fStack_3770;
  float fStack_376c;
  float fStack_3768;
  float fStack_3764;
  float local_3760;
  float fStack_375c;
  float fStack_3758;
  float fStack_3754;
  float fStack_3750;
  float fStack_374c;
  float fStack_3748;
  float fStack_3744;
  float local_3740;
  float fStack_373c;
  float fStack_3738;
  float fStack_3734;
  float fStack_3730;
  float fStack_372c;
  float fStack_3728;
  float fStack_3724;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float local_23a0;
  float fStack_239c;
  float fStack_2398;
  float fStack_2394;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined1 local_a80 [64];
  undefined4 local_a40;
  undefined4 local_a3c;
  undefined4 local_a38;
  undefined4 local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined4 local_a0c;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [64];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  
  local_aa68 = in_R9;
  local_aa60 = in_R8;
  local_aa54 = in_ECX;
  local_aa50 = in_EDX;
  local_aa4c = in_ESI;
  local_aa48 = in_RDI;
  for (local_aa6c = 0; local_aa6c < local_aa4c; local_aa6c = local_aa6c + 1) {
    local_aa78 = (undefined1 (*) [64])(local_aa48 + (long)(local_aa6c * local_aa50) * 4);
    local_aa80 = local_aa60;
    local_aa84 = 0;
    local_a04 = 0xf;
    local_a08 = 0xb;
    local_a0c = 7;
    local_a10 = 3;
    local_a14 = 0xd;
    local_a18 = 9;
    local_a1c = 5;
    local_a20 = 1;
    local_a24 = 0xe;
    local_a28 = 10;
    local_a2c = 6;
    local_a30 = 2;
    local_a34 = 0xc;
    local_a38 = 8;
    local_a3c = 4;
    local_a40 = 0;
    auVar18 = vpinsrd_avx(ZEXT416(3),7,1);
    auVar18 = vpinsrd_avx(auVar18,0xb,2);
    auVar18 = vpinsrd_avx(auVar18,0xf,3);
    auVar19 = vpinsrd_avx(ZEXT416(1),5,1);
    auVar19 = vpinsrd_avx(auVar19,9,2);
    auVar19 = vpinsrd_avx(auVar19,0xd,3);
    auVar257._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
    auVar257._16_16_ = ZEXT116(1) * auVar18;
    auVar18 = vpinsrd_avx(ZEXT416(2),6,1);
    auVar18 = vpinsrd_avx(auVar18,10,2);
    auVar18 = vpinsrd_avx(auVar18,0xe,3);
    auVar19 = vpinsrd_avx(ZEXT416(0),4,1);
    auVar19 = vpinsrd_avx(auVar19,8,2);
    auVar19 = vpinsrd_avx(auVar19,0xc,3);
    auVar239 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar18,
                                              ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19)),auVar257
                          ,1);
    local_a80 = vmovdqa64_avx512f(auVar239);
    auVar239 = vmovdqa64_avx512f(local_a80);
    local_ab00 = vmovdqa64_avx512f(auVar239);
    for (; local_aa84 + 0xf < local_aa54; local_aa84 = local_aa84 + 0x10) {
      local_a608 = local_aa78;
      local_ab40 = *(undefined8 *)*local_aa78;
      uStack_ab38 = *(undefined8 *)(*local_aa78 + 8);
      uStack_ab30 = *(undefined8 *)(*local_aa78 + 0x10);
      uStack_ab28 = *(undefined8 *)(*local_aa78 + 0x18);
      uStack_ab20 = *(undefined8 *)(*local_aa78 + 0x20);
      uStack_ab18 = *(undefined8 *)(*local_aa78 + 0x28);
      uStack_ab10 = *(undefined8 *)(*local_aa78 + 0x30);
      uStack_ab08 = *(undefined8 *)(*local_aa78 + 0x38);
      local_a610 = local_aa78 + 1;
      local_ab80 = *(undefined8 *)*local_a610;
      uStack_ab78 = *(undefined8 *)(local_aa78[1] + 8);
      uStack_ab70 = *(undefined8 *)(local_aa78[1] + 0x10);
      uStack_ab68 = *(undefined8 *)(local_aa78[1] + 0x18);
      uStack_ab60 = *(undefined8 *)(local_aa78[1] + 0x20);
      uStack_ab58 = *(undefined8 *)(local_aa78[1] + 0x28);
      uStack_ab50 = *(undefined8 *)(local_aa78[1] + 0x30);
      uStack_ab48 = *(undefined8 *)(local_aa78[1] + 0x38);
      local_a618 = local_aa78 + 2;
      local_abc0 = *(undefined8 *)*local_a618;
      uStack_abb8 = *(undefined8 *)(local_aa78[2] + 8);
      uStack_abb0 = *(undefined8 *)(local_aa78[2] + 0x10);
      uStack_aba8 = *(undefined8 *)(local_aa78[2] + 0x18);
      uStack_aba0 = *(undefined8 *)(local_aa78[2] + 0x20);
      uStack_ab98 = *(undefined8 *)(local_aa78[2] + 0x28);
      uStack_ab90 = *(undefined8 *)(local_aa78[2] + 0x30);
      uStack_ab88 = *(undefined8 *)(local_aa78[2] + 0x38);
      local_a620 = local_aa78 + 3;
      local_ac00 = *(undefined8 *)*local_a620;
      uStack_abf8 = *(undefined8 *)(local_aa78[3] + 8);
      uStack_abf0 = *(undefined8 *)(local_aa78[3] + 0x10);
      uStack_abe8 = *(undefined8 *)(local_aa78[3] + 0x18);
      uStack_abe0 = *(undefined8 *)(local_aa78[3] + 0x20);
      uStack_abd8 = *(undefined8 *)(local_aa78[3] + 0x28);
      uStack_abd0 = *(undefined8 *)(local_aa78[3] + 0x30);
      uStack_abc8 = *(undefined8 *)(local_aa78[3] + 0x38);
      auVar239 = vunpcklps_avx512f(*local_aa78,*local_a610);
      auVar240 = vunpckhps_avx512f(*local_aa78,*local_a610);
      local_acc0 = vunpcklps_avx512f(*local_a618,*local_a620);
      local_ad00 = vunpckhps_avx512f(*local_a618,*local_a620);
      local_ac40._0_8_ = auVar239._0_8_;
      local_a440 = local_ac40._0_8_;
      local_ac40._8_8_ = auVar239._8_8_;
      uStack_a438 = local_ac40._8_8_;
      local_ac40._16_8_ = auVar239._16_8_;
      uStack_a430 = local_ac40._16_8_;
      local_ac40._24_8_ = auVar239._24_8_;
      uStack_a428 = local_ac40._24_8_;
      local_ac40._32_8_ = auVar239._32_8_;
      uStack_a420 = local_ac40._32_8_;
      local_ac40._40_8_ = auVar239._40_8_;
      uStack_a418 = local_ac40._40_8_;
      local_ac40._48_8_ = auVar239._48_8_;
      uStack_a410 = local_ac40._48_8_;
      local_ac40._56_8_ = auVar239._56_8_;
      uStack_a408 = local_ac40._56_8_;
      local_ac80._0_8_ = auVar240._0_8_;
      local_a480 = local_ac80._0_8_;
      local_ac80._8_8_ = auVar240._8_8_;
      uStack_a478 = local_ac80._8_8_;
      local_ac80._16_8_ = auVar240._16_8_;
      uStack_a470 = local_ac80._16_8_;
      local_ac80._24_8_ = auVar240._24_8_;
      uStack_a468 = local_ac80._24_8_;
      local_ac80._32_8_ = auVar240._32_8_;
      uStack_a460 = local_ac80._32_8_;
      local_ac80._40_8_ = auVar240._40_8_;
      uStack_a458 = local_ac80._40_8_;
      local_ac80._48_8_ = auVar240._48_8_;
      uStack_a450 = local_ac80._48_8_;
      local_ac80._56_8_ = auVar240._56_8_;
      uStack_a448 = local_ac80._56_8_;
      local_ad40 = vmaxps_avx512f(auVar239,auVar240);
      local_a4c0 = local_acc0._0_8_;
      uStack_a4b8 = local_acc0._8_8_;
      uStack_a4b0 = local_acc0._16_8_;
      uStack_a4a8 = local_acc0._24_8_;
      uStack_a4a0 = local_acc0._32_8_;
      uStack_a498 = local_acc0._40_8_;
      uStack_a490 = local_acc0._48_8_;
      uStack_a488 = local_acc0._56_8_;
      local_a500 = local_ad00._0_8_;
      uStack_a4f8 = local_ad00._8_8_;
      uStack_a4f0 = local_ad00._16_8_;
      uStack_a4e8 = local_ad00._24_8_;
      uStack_a4e0 = local_ad00._32_8_;
      uStack_a4d8 = local_ad00._40_8_;
      uStack_a4d0 = local_ad00._48_8_;
      uStack_a4c8 = local_ad00._56_8_;
      local_ad80 = vmaxps_avx512f(local_acc0,local_ad00);
      local_1340 = local_ad40._0_8_;
      uStack_1338 = local_ad40._8_8_;
      uStack_1330 = local_ad40._16_8_;
      uStack_1328 = local_ad40._24_8_;
      uStack_1320 = local_ad40._32_8_;
      uStack_1318 = local_ad40._40_8_;
      uStack_1310 = local_ad40._48_8_;
      uStack_1308 = local_ad40._56_8_;
      local_1380 = local_ad80._0_8_;
      uStack_1378 = local_ad80._8_8_;
      uStack_1370 = local_ad80._16_8_;
      uStack_1368 = local_ad80._24_8_;
      uStack_1360 = local_ad80._32_8_;
      uStack_1358 = local_ad80._40_8_;
      uStack_1350 = local_ad80._48_8_;
      uStack_1348 = local_ad80._56_8_;
      local_ac40 = vunpcklps_avx512f(local_ad40,local_ad80);
      local_1040 = local_ad40._0_8_;
      uStack_1038 = local_ad40._8_8_;
      uStack_1030 = local_ad40._16_8_;
      uStack_1028 = local_ad40._24_8_;
      uStack_1020 = local_ad40._32_8_;
      uStack_1018 = local_ad40._40_8_;
      uStack_1010 = local_ad40._48_8_;
      uStack_1008 = local_ad40._56_8_;
      local_1080 = local_ad80._0_8_;
      uStack_1078 = local_ad80._8_8_;
      uStack_1070 = local_ad80._16_8_;
      uStack_1068 = local_ad80._24_8_;
      uStack_1060 = local_ad80._32_8_;
      uStack_1058 = local_ad80._40_8_;
      uStack_1050 = local_ad80._48_8_;
      uStack_1048 = local_ad80._56_8_;
      local_ac80 = vunpckhps_avx512f(local_ad40,local_ad80);
      local_a540 = local_ac40._0_8_;
      uStack_a538 = local_ac40._8_8_;
      uStack_a530 = local_ac40._16_8_;
      uStack_a528 = local_ac40._24_8_;
      uStack_a520 = local_ac40._32_8_;
      uStack_a518 = local_ac40._40_8_;
      uStack_a510 = local_ac40._48_8_;
      uStack_a508 = local_ac40._56_8_;
      local_a580 = local_ac80._0_8_;
      uStack_a578 = local_ac80._8_8_;
      uStack_a570 = local_ac80._16_8_;
      uStack_a568 = local_ac80._24_8_;
      uStack_a560 = local_ac80._32_8_;
      uStack_a558 = local_ac80._40_8_;
      uStack_a550 = local_ac80._48_8_;
      uStack_a548 = local_ac80._56_8_;
      auVar239 = vmaxps_avx512f(local_ac40,local_ac80);
      auVar240 = vmovdqa64_avx512f(local_ab00);
      local_adc0._0_8_ = auVar239._0_8_;
      local_580 = local_adc0._0_8_;
      local_adc0._8_8_ = auVar239._8_8_;
      uStack_578 = local_adc0._8_8_;
      local_adc0._16_8_ = auVar239._16_8_;
      uStack_570 = local_adc0._16_8_;
      local_adc0._24_8_ = auVar239._24_8_;
      uStack_568 = local_adc0._24_8_;
      local_adc0._32_8_ = auVar239._32_8_;
      uStack_560 = local_adc0._32_8_;
      local_adc0._40_8_ = auVar239._40_8_;
      uStack_558 = local_adc0._40_8_;
      local_adc0._48_8_ = auVar239._48_8_;
      uStack_550 = local_adc0._48_8_;
      local_adc0._56_8_ = auVar239._56_8_;
      uStack_548 = local_adc0._56_8_;
      local_540 = vmovdqa64_avx512f(auVar240);
      auVar240 = vmovdqa64_avx512f(local_540);
      local_adc0 = vpermps_avx512f(auVar240,auVar239);
      local_a628 = local_aa80;
      auVar234 = *(undefined1 (*) [56])*local_aa80;
      uStack_a588 = *(undefined8 *)(*local_aa80 + 0x38);
      local_ae00._0_8_ = auVar234._0_8_;
      local_a5c0 = local_ae00._0_8_;
      local_ae00._8_8_ = auVar234._8_8_;
      uStack_a5b8 = local_ae00._8_8_;
      local_ae00._16_8_ = auVar234._16_8_;
      uStack_a5b0 = local_ae00._16_8_;
      local_ae00._24_8_ = auVar234._24_8_;
      uStack_a5a8 = local_ae00._24_8_;
      local_ae00._32_8_ = auVar234._32_8_;
      uStack_a5a0 = local_ae00._32_8_;
      local_ae00._40_8_ = auVar234._40_8_;
      uStack_a598 = local_ae00._40_8_;
      local_ae00._48_8_ = auVar234._48_8_;
      uStack_a590 = local_ae00._48_8_;
      local_a600 = local_adc0._0_8_;
      uStack_a5f8 = local_adc0._8_8_;
      uStack_a5f0 = local_adc0._16_8_;
      uStack_a5e8 = local_adc0._24_8_;
      uStack_a5e0 = local_adc0._32_8_;
      uStack_a5d8 = local_adc0._40_8_;
      uStack_a5d0 = local_adc0._48_8_;
      uStack_a5c8 = local_adc0._56_8_;
      local_ae00 = vmaxps_avx512f(*local_aa80,local_adc0);
      local_8e88 = local_aa80;
      local_8f00 = local_ae00._0_8_;
      uStack_8ef8 = local_ae00._8_8_;
      uStack_8ef0 = local_ae00._16_8_;
      uStack_8ee8 = local_ae00._24_8_;
      uStack_8ee0 = local_ae00._32_8_;
      uStack_8ed8 = local_ae00._40_8_;
      uStack_8ed0 = local_ae00._48_8_;
      uStack_8ec8 = local_ae00._56_8_;
      *(undefined8 *)*local_aa80 = local_ae00._0_8_;
      *(undefined8 *)(*local_aa80 + 8) = local_ae00._8_8_;
      *(undefined8 *)(*local_aa80 + 0x10) = local_ae00._16_8_;
      *(undefined8 *)(*local_aa80 + 0x18) = local_ae00._24_8_;
      *(undefined8 *)(*local_aa80 + 0x20) = local_ae00._32_8_;
      *(undefined8 *)(*local_aa80 + 0x28) = local_ae00._40_8_;
      *(undefined8 *)(*local_aa80 + 0x30) = local_ae00._48_8_;
      *(undefined8 *)(*local_aa80 + 0x38) = local_ae00._56_8_;
      local_aa78 = local_aa78 + 4;
      local_aa80 = local_aa80 + 1;
      local_1300 = local_ac00;
      uStack_12f8 = uStack_abf8;
      uStack_12f0 = uStack_abf0;
      uStack_12e8 = uStack_abe8;
      uStack_12e0 = uStack_abe0;
      uStack_12d8 = uStack_abd8;
      uStack_12d0 = uStack_abd0;
      uStack_12c8 = uStack_abc8;
      local_12c0 = local_abc0;
      uStack_12b8 = uStack_abb8;
      uStack_12b0 = uStack_abb0;
      uStack_12a8 = uStack_aba8;
      uStack_12a0 = uStack_aba0;
      uStack_1298 = uStack_ab98;
      uStack_1290 = uStack_ab90;
      uStack_1288 = uStack_ab88;
      local_1280 = local_ab80;
      uStack_1278 = uStack_ab78;
      uStack_1270 = uStack_ab70;
      uStack_1268 = uStack_ab68;
      uStack_1260 = uStack_ab60;
      uStack_1258 = uStack_ab58;
      uStack_1250 = uStack_ab50;
      uStack_1248 = uStack_ab48;
      local_1240 = local_ab40;
      uStack_1238 = uStack_ab38;
      uStack_1230 = uStack_ab30;
      uStack_1228 = uStack_ab28;
      uStack_1220 = uStack_ab20;
      uStack_1218 = uStack_ab18;
      uStack_1210 = uStack_ab10;
      uStack_1208 = uStack_ab08;
      local_1000 = local_ac00;
      uStack_ff8 = uStack_abf8;
      uStack_ff0 = uStack_abf0;
      uStack_fe8 = uStack_abe8;
      uStack_fe0 = uStack_abe0;
      uStack_fd8 = uStack_abd8;
      uStack_fd0 = uStack_abd0;
      uStack_fc8 = uStack_abc8;
      local_fc0 = local_abc0;
      uStack_fb8 = uStack_abb8;
      uStack_fb0 = uStack_abb0;
      uStack_fa8 = uStack_aba8;
      uStack_fa0 = uStack_aba0;
      uStack_f98 = uStack_ab98;
      uStack_f90 = uStack_ab90;
      uStack_f88 = uStack_ab88;
      local_f80 = local_ab80;
      uStack_f78 = uStack_ab78;
      uStack_f70 = uStack_ab70;
      uStack_f68 = uStack_ab68;
      uStack_f60 = uStack_ab60;
      uStack_f58 = uStack_ab58;
      uStack_f50 = uStack_ab50;
      uStack_f48 = uStack_ab48;
      local_f40 = local_ab40;
      uStack_f38 = uStack_ab38;
      uStack_f30 = uStack_ab30;
      uStack_f28 = uStack_ab28;
      uStack_f20 = uStack_ab20;
      uStack_f18 = uStack_ab18;
      uStack_f10 = uStack_ab10;
      uStack_f08 = uStack_ab08;
    }
    for (; local_aa84 + 7 < local_aa54; local_aa84 = local_aa84 + 8) {
      local_a368 = local_aa78;
      local_ae20 = *(undefined8 *)*local_aa78;
      uStack_ae18 = *(undefined8 *)(*local_aa78 + 8);
      uStack_ae10 = *(undefined8 *)(*local_aa78 + 0x10);
      uStack_ae08 = *(undefined8 *)(*local_aa78 + 0x18);
      local_a370 = (undefined1 (*) [32])(*local_aa78 + 0x20);
      local_ae40 = *(undefined8 *)*local_a370;
      uStack_ae38 = *(undefined8 *)(*local_aa78 + 0x28);
      uStack_ae30 = *(undefined8 *)(*local_aa78 + 0x30);
      uStack_ae28 = *(undefined8 *)(*local_aa78 + 0x38);
      local_a378 = local_aa78 + 1;
      local_ae60 = *(undefined8 *)*local_a378;
      uStack_ae58 = *(undefined8 *)(local_aa78[1] + 8);
      uStack_ae50 = *(undefined8 *)(local_aa78[1] + 0x10);
      uStack_ae48 = *(undefined8 *)(local_aa78[1] + 0x18);
      local_a380 = (undefined1 (*) [32])(local_aa78[1] + 0x20);
      local_ae80 = *(undefined8 *)*local_a380;
      uStack_ae78 = *(undefined8 *)(local_aa78[1] + 0x28);
      uStack_ae70 = *(undefined8 *)(local_aa78[1] + 0x30);
      uStack_ae68 = *(undefined8 *)(local_aa78[1] + 0x38);
      auVar253 = vunpcklps_avx(*(undefined1 (*) [32])*local_aa78,*local_a370);
      auVar257 = vunpckhps_avx(*(undefined1 (*) [32])*local_aa78,*local_a370);
      local_aee0 = vunpcklps_avx(*(undefined1 (*) [32])*local_a378,*local_a380);
      local_af00 = vunpckhps_avx(*(undefined1 (*) [32])*local_a378,*local_a380);
      local_aea0._0_8_ = auVar253._0_8_;
      local_a280 = local_aea0._0_8_;
      local_aea0._8_8_ = auVar253._8_8_;
      uStack_a278 = local_aea0._8_8_;
      local_aea0._16_8_ = auVar253._16_8_;
      uStack_a270 = local_aea0._16_8_;
      local_aea0._24_8_ = auVar253._24_8_;
      uStack_a268 = local_aea0._24_8_;
      local_aec0._0_8_ = auVar257._0_8_;
      local_a2a0 = local_aec0._0_8_;
      local_aec0._8_8_ = auVar257._8_8_;
      uStack_a298 = local_aec0._8_8_;
      local_aec0._16_8_ = auVar257._16_8_;
      uStack_a290 = local_aec0._16_8_;
      local_aec0._24_8_ = auVar257._24_8_;
      uStack_a288 = local_aec0._24_8_;
      auVar257 = vmaxps_avx(auVar253,auVar257);
      local_a2c0 = local_aee0._0_8_;
      uStack_a2b8 = local_aee0._8_8_;
      uStack_a2b0 = local_aee0._16_8_;
      uStack_a2a8 = local_aee0._24_8_;
      local_a2e0 = local_af00._0_8_;
      uStack_a2d8 = local_af00._8_8_;
      uStack_a2d0 = local_af00._16_8_;
      uStack_a2c8 = local_af00._24_8_;
      auVar253 = vmaxps_avx(local_aee0,local_af00);
      local_aea0 = vperm2f128_avx(auVar257,auVar253,0x20);
      local_aec0 = vperm2f128_avx(auVar257,auVar253,0x31);
      local_420 = local_aea0._0_8_;
      uStack_418 = local_aea0._8_8_;
      uStack_410 = local_aea0._16_8_;
      uStack_408 = local_aea0._24_8_;
      local_440 = local_aec0._0_8_;
      uStack_438 = local_aec0._8_8_;
      uStack_430 = local_aec0._16_8_;
      uStack_428 = local_aec0._24_8_;
      local_af20 = vunpcklps_avx(local_aea0,local_aec0);
      local_2a0 = local_aea0._0_8_;
      uStack_298 = local_aea0._8_8_;
      uStack_290 = local_aea0._16_8_;
      uStack_288 = local_aea0._24_8_;
      local_2c0 = local_aec0._0_8_;
      uStack_2b8 = local_aec0._8_8_;
      uStack_2b0 = local_aec0._16_8_;
      uStack_2a8 = local_aec0._24_8_;
      local_af40 = vunpckhps_avx(local_aea0,local_aec0);
      local_a300 = local_af20._0_8_;
      uStack_a2f8 = local_af20._8_8_;
      uStack_a2f0 = local_af20._16_8_;
      uStack_a2e8 = local_af20._24_8_;
      local_a320 = local_af40._0_8_;
      uStack_a318 = local_af40._8_8_;
      uStack_a310 = local_af40._16_8_;
      uStack_a308 = local_af40._24_8_;
      local_af60 = vmaxps_avx(local_af20,local_af40);
      local_a388 = local_aa80;
      auVar235 = *(undefined1 (*) [24])*local_aa80;
      uStack_a328 = *(undefined8 *)(*local_aa80 + 0x18);
      local_af80._0_8_ = auVar235._0_8_;
      local_a340 = local_af80._0_8_;
      local_af80._8_8_ = auVar235._8_8_;
      uStack_a338 = local_af80._8_8_;
      local_af80._16_8_ = auVar235._16_8_;
      uStack_a330 = local_af80._16_8_;
      local_a360 = local_af60._0_8_;
      uStack_a358 = local_af60._8_8_;
      uStack_a350 = local_af60._16_8_;
      uStack_a348 = local_af60._24_8_;
      local_af80 = vmaxps_avx(*(undefined1 (*) [32])*local_aa80,local_af60);
      local_80c8 = local_aa80;
      local_8100 = local_af80._0_8_;
      uStack_80f8 = local_af80._8_8_;
      uStack_80f0 = local_af80._16_8_;
      uStack_80e8 = local_af80._24_8_;
      *(undefined8 *)*local_aa80 = local_af80._0_8_;
      *(undefined8 *)(*local_aa80 + 8) = local_af80._8_8_;
      *(undefined8 *)(*local_aa80 + 0x10) = local_af80._16_8_;
      *(undefined8 *)(*local_aa80 + 0x18) = local_af80._24_8_;
      local_aa78 = local_aa78 + 2;
      local_aa80 = (undefined1 (*) [64])(*local_aa80 + 0x20);
      local_400 = local_ae80;
      uStack_3f8 = uStack_ae78;
      uStack_3f0 = uStack_ae70;
      uStack_3e8 = uStack_ae68;
      local_3e0 = local_ae60;
      uStack_3d8 = uStack_ae58;
      uStack_3d0 = uStack_ae50;
      uStack_3c8 = uStack_ae48;
      local_3c0 = local_ae40;
      uStack_3b8 = uStack_ae38;
      uStack_3b0 = uStack_ae30;
      uStack_3a8 = uStack_ae28;
      local_3a0 = local_ae20;
      uStack_398 = uStack_ae18;
      uStack_390 = uStack_ae10;
      uStack_388 = uStack_ae08;
      local_280 = local_ae80;
      uStack_278 = uStack_ae78;
      uStack_270 = uStack_ae70;
      uStack_268 = uStack_ae68;
      local_260 = local_ae60;
      uStack_258 = uStack_ae58;
      uStack_250 = uStack_ae50;
      uStack_248 = uStack_ae48;
      local_240 = local_ae40;
      uStack_238 = uStack_ae38;
      uStack_230 = uStack_ae30;
      uStack_228 = uStack_ae28;
      local_220 = local_ae20;
      uStack_218 = uStack_ae18;
      uStack_210 = uStack_ae10;
      uStack_208 = uStack_ae08;
    }
    for (; local_aa84 + 3 < local_aa54; local_aa84 = local_aa84 + 4) {
      local_a1d8 = local_aa78;
      local_180 = *(undefined8 *)*local_aa78;
      uStack_178 = *(undefined8 *)(*local_aa78 + 8);
      local_a1e0 = (undefined1 (*) [16])(*local_aa78 + 0x10);
      local_190 = *(undefined8 *)*local_a1e0;
      uStack_188 = *(undefined8 *)(*local_aa78 + 0x18);
      local_a1e8 = (undefined1 (*) [16])(*local_aa78 + 0x20);
      local_1a0 = *(undefined8 *)*local_a1e8;
      uStack_198 = *(undefined8 *)(*local_aa78 + 0x28);
      local_a1f0 = (undefined1 (*) [16])(*local_aa78 + 0x30);
      local_1b0 = *(undefined8 *)*local_a1f0;
      uStack_1a8 = *(undefined8 *)(*local_aa78 + 0x38);
      local_b000 = vunpcklps_avx(*(undefined1 (*) [16])*local_aa78,*local_a1e0);
      local_afe0 = vunpcklps_avx(*local_a1e8,*local_a1f0);
      local_aff0 = vunpckhps_avx(*(undefined1 (*) [16])*local_aa78,*local_a1e0);
      local_afd0 = vunpckhps_avx(*local_a1e8,*local_a1f0);
      local_80 = local_b000._0_8_;
      uStack_78 = local_b000._8_8_;
      local_90 = local_afe0._0_8_;
      uStack_88 = local_afe0._8_8_;
      local_af90 = vunpcklpd_avx(local_b000,local_afe0);
      local_68d0 = local_afe0._0_8_;
      uStack_68c8 = local_afe0._8_8_;
      local_68e0 = local_b000._0_8_;
      uStack_68d8 = local_b000._8_8_;
      local_afa0 = vunpckhpd_avx(local_b000,local_afe0);
      local_a0 = local_aff0._0_8_;
      uStack_98 = local_aff0._8_8_;
      local_b0 = local_afd0._0_8_;
      uStack_a8 = local_afd0._8_8_;
      local_afb0 = vunpcklpd_avx(local_aff0,local_afd0);
      local_68f0 = local_afd0._0_8_;
      uStack_68e8 = local_afd0._8_8_;
      local_6900 = local_aff0._0_8_;
      uStack_68f8 = local_aff0._8_8_;
      local_afc0 = vunpckhpd_avx(local_aff0,local_afd0);
      local_a160 = local_af90._0_8_;
      uStack_a158 = local_af90._8_8_;
      local_a170 = local_afa0._0_8_;
      uStack_a168 = local_afa0._8_8_;
      local_b010 = vmaxps_avx(local_af90,local_afa0);
      local_a180 = local_afb0._0_8_;
      uStack_a178 = local_afb0._8_8_;
      local_a190 = local_afc0._0_8_;
      uStack_a188 = local_afc0._8_8_;
      local_b020 = vmaxps_avx(local_afb0,local_afc0);
      local_a1a0 = local_b010._0_8_;
      uStack_a198 = local_b010._8_8_;
      local_a1b0 = local_b020._0_8_;
      uStack_a1a8 = local_b020._8_8_;
      local_b030 = vmaxps_avx(local_b010,local_b020);
      local_a1f8 = local_aa80;
      local_a1c0 = *(undefined8 *)*local_aa80;
      uStack_a1b8 = *(undefined8 *)(*local_aa80 + 8);
      local_a1d0 = local_b030._0_8_;
      uStack_a1c8 = local_b030._8_8_;
      local_b040 = vmaxps_avx(*(undefined1 (*) [16])*local_aa80,local_b030);
      local_78c8 = local_aa80;
      local_78e0 = local_b040._0_8_;
      uStack_78d8 = local_b040._8_8_;
      *(undefined8 *)*local_aa80 = local_b040._0_8_;
      *(undefined8 *)(*local_aa80 + 8) = local_b040._8_8_;
      local_aa78 = local_aa78 + 1;
      local_aa80 = (undefined1 (*) [64])(*local_aa80 + 0x10);
      local_130 = local_1b0;
      uStack_128 = uStack_1a8;
      local_120 = local_1a0;
      uStack_118 = uStack_198;
      local_110 = local_190;
      uStack_108 = uStack_188;
      local_100 = local_180;
      uStack_f8 = uStack_178;
    }
    for (; local_aa84 < local_aa54; local_aa84 = local_aa84 + 1) {
      local_a200 = local_aa78;
      local_b050 = *(undefined8 *)*local_aa78;
      uStack_b048 = *(undefined8 *)(*local_aa78 + 8);
      local_a020 = vunpckhpd_avx(*(undefined1 (*) [16])*local_aa78,*(undefined1 (*) [16])*local_aa78
                                );
      local_a040 = vmaxps_avx(*(undefined1 (*) [16])*local_aa78,local_a020);
      local_68b0 = local_a040._0_8_;
      uStack_68a8 = local_a040._8_8_;
      local_68c0 = local_a040._4_4_;
      uStack_68bc = local_a040._4_4_;
      uStack_68b8 = local_a040._4_4_;
      uStack_68b4 = local_a040._4_4_;
      auVar18._4_4_ = local_a040._4_4_;
      auVar18._0_4_ = local_a040._4_4_;
      auVar18._8_4_ = local_a040._4_4_;
      auVar18._12_4_ = local_a040._4_4_;
      local_a050 = vmaxss_avx(local_a040,auVar18);
      local_6890 = local_a050._0_8_;
      uVar22 = local_6890;
      uStack_6888 = local_a050._8_8_;
      local_6890._0_4_ = local_a050._0_4_;
      local_b054 = (float)local_6890;
      local_a030 = local_b050;
      uStack_a028 = uStack_b048;
      local_a010 = local_b050;
      uStack_a008 = uStack_b048;
      local_6960 = local_b050;
      uStack_6958 = uStack_b048;
      local_6950 = local_b050;
      uStack_6948 = uStack_b048;
      local_6890 = uVar22;
      pfVar238 = std::max<float>((float *)local_aa80,&local_b054);
      *(float *)*local_aa80 = *pfVar238;
      local_aa78 = (undefined1 (*) [64])(*local_aa78 + 0x10);
      local_aa80 = (undefined1 (*) [64])(*local_aa80 + 4);
    }
  }
  for (local_b058 = 0; local_b058 < local_aa4c; local_b058 = local_b058 + 1) {
    local_b060 = (undefined1 (*) [64])(local_aa48 + (long)(local_b058 * local_aa50) * 4);
    local_b068 = local_aa60;
    local_b070 = local_aa68;
    local_b074 = 0;
    auVar18 = vpinsrd_avx(ZEXT416(3),3,1);
    auVar18 = vpinsrd_avx(auVar18,3,2);
    auVar18 = vpinsrd_avx(auVar18,3,3);
    auVar19 = vpinsrd_avx(ZEXT416(2),2,1);
    auVar19 = vpinsrd_avx(auVar19,2,2);
    auVar19 = vpinsrd_avx(auVar19,2,3);
    auVar253._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
    auVar253._16_16_ = ZEXT116(1) * auVar18;
    auVar18 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar18 = vpinsrd_avx(auVar18,1,2);
    auVar18 = vpinsrd_avx(auVar18,1,3);
    auVar19 = vpinsrd_avx(ZEXT416(0),0,1);
    auVar19 = vpinsrd_avx(auVar19,0,2);
    auVar19 = vpinsrd_avx(auVar19,0,3);
    auVar239 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar18,
                                              ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19)),auVar253
                          ,1);
    auVar239 = vmovdqa64_avx512f(auVar239);
    auVar239 = vmovdqa64_avx512f(auVar239);
    auVar239 = vmovdqa64_avx512f(auVar239);
    auVar18 = vpinsrd_avx(ZEXT416(7),7,1);
    auVar18 = vpinsrd_avx(auVar18,7,2);
    auVar18 = vpinsrd_avx(auVar18,7,3);
    auVar19 = vpinsrd_avx(ZEXT416(6),6,1);
    auVar19 = vpinsrd_avx(auVar19,6,2);
    auVar19 = vpinsrd_avx(auVar19,6,3);
    auVar258._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
    auVar258._16_16_ = ZEXT116(1) * auVar18;
    auVar18 = vpinsrd_avx(ZEXT416(5),5,1);
    auVar18 = vpinsrd_avx(auVar18,5,2);
    auVar18 = vpinsrd_avx(auVar18,5,3);
    auVar19 = vpinsrd_avx(ZEXT416(4),4,1);
    auVar19 = vpinsrd_avx(auVar19,4,2);
    auVar19 = vpinsrd_avx(auVar19,4,3);
    auVar240 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar18,
                                              ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19)),auVar258
                          ,1);
    auVar240 = vmovdqa64_avx512f(auVar240);
    auVar240 = vmovdqa64_avx512f(auVar240);
    auVar240 = vmovdqa64_avx512f(auVar240);
    auVar18 = vpinsrd_avx(ZEXT416(0xb),0xb,1);
    auVar18 = vpinsrd_avx(auVar18,0xb,2);
    auVar18 = vpinsrd_avx(auVar18,0xb,3);
    auVar19 = vpinsrd_avx(ZEXT416(10),10,1);
    auVar19 = vpinsrd_avx(auVar19,10,2);
    auVar19 = vpinsrd_avx(auVar19,10,3);
    auVar259._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
    auVar259._16_16_ = ZEXT116(1) * auVar18;
    auVar18 = vpinsrd_avx(ZEXT416(9),9,1);
    auVar18 = vpinsrd_avx(auVar18,9,2);
    auVar18 = vpinsrd_avx(auVar18,9,3);
    auVar19 = vpinsrd_avx(ZEXT416(8),8,1);
    auVar19 = vpinsrd_avx(auVar19,8,2);
    auVar19 = vpinsrd_avx(auVar19,8,3);
    auVar241 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar18,
                                              ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19)),auVar259
                          ,1);
    auVar241 = vmovdqa64_avx512f(auVar241);
    auVar241 = vmovdqa64_avx512f(auVar241);
    auVar241 = vmovdqa64_avx512f(auVar241);
    auVar18 = vpinsrd_avx(ZEXT416(0xf),0xf,1);
    auVar18 = vpinsrd_avx(auVar18,0xf,2);
    auVar18 = vpinsrd_avx(auVar18,0xf,3);
    auVar19 = vpinsrd_avx(ZEXT416(0xe),0xe,1);
    auVar19 = vpinsrd_avx(auVar19,0xe,2);
    auVar19 = vpinsrd_avx(auVar19,0xe,3);
    auVar260._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
    auVar260._16_16_ = ZEXT116(1) * auVar18;
    auVar18 = vpinsrd_avx(ZEXT416(0xd),0xd,1);
    auVar18 = vpinsrd_avx(auVar18,0xd,2);
    auVar18 = vpinsrd_avx(auVar18,0xd,3);
    auVar19 = vpinsrd_avx(ZEXT416(0xc),0xc,1);
    auVar19 = vpinsrd_avx(auVar19,0xc,2);
    auVar19 = vpinsrd_avx(auVar19,0xc,3);
    auVar242 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar18,
                                              ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19)),auVar260
                          ,1);
    auVar242 = vmovdqa64_avx512f(auVar242);
    auVar242 = vmovdqa64_avx512f(auVar242);
    auVar242 = vmovdqa64_avx512f(auVar242);
    auVar18 = vpinsrd_avx(ZEXT416(3),7,1);
    auVar18 = vpinsrd_avx(auVar18,0xb,2);
    auVar18 = vpinsrd_avx(auVar18,0xf,3);
    auVar19 = vpinsrd_avx(ZEXT416(1),5,1);
    auVar19 = vpinsrd_avx(auVar19,9,2);
    auVar19 = vpinsrd_avx(auVar19,0xd,3);
    auVar261._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
    auVar261._16_16_ = ZEXT116(1) * auVar18;
    auVar18 = vpinsrd_avx(ZEXT416(2),6,1);
    auVar18 = vpinsrd_avx(auVar18,10,2);
    auVar18 = vpinsrd_avx(auVar18,0xe,3);
    auVar19 = vpinsrd_avx(ZEXT416(0),4,1);
    auVar19 = vpinsrd_avx(auVar19,8,2);
    auVar19 = vpinsrd_avx(auVar19,0xc,3);
    auVar243 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar18,
                                              ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19)),auVar261
                          ,1);
    auVar243 = vmovdqa64_avx512f(auVar243);
    auVar243 = vmovdqa64_avx512f(auVar243);
    auVar243 = vmovdqa64_avx512f(auVar243);
    for (; local_b074 + 0xf < local_aa54; local_b074 = local_b074 + 0x10) {
      auVar244 = vmovdqa64_avx512f(auVar239);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vpermps_avx512f(auVar244,*local_b068);
      auVar244 = vmovdqa64_avx512f(auVar240);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar246 = vpermps_avx512f(auVar244,*local_b068);
      auVar244 = vmovdqa64_avx512f(auVar241);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar247 = vpermps_avx512f(auVar244,*local_b068);
      auVar244 = vmovdqa64_avx512f(auVar242);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar248 = vpermps_avx512f(auVar244,*local_b068);
      auVar244 = vsubps_avx512f(*local_b060,auVar245);
      auVar266._8_4_ = 88.37626;
      auVar266._12_4_ = 88.37626;
      auVar266._0_4_ = 88.37626;
      auVar266._4_4_ = 88.37626;
      auVar266._16_4_ = 88.37626;
      auVar266._20_4_ = 88.37626;
      auVar266._24_4_ = 88.37626;
      auVar266._28_4_ = 88.37626;
      auVar266._32_4_ = 88.37626;
      auVar266._36_4_ = 88.37626;
      auVar266._40_4_ = 88.37626;
      auVar266._44_4_ = 88.37626;
      auVar266._48_4_ = 88.37626;
      auVar266._52_4_ = 88.37626;
      auVar266._56_4_ = 88.37626;
      auVar266._60_4_ = 88.37626;
      auVar244 = vminps_avx512f(auVar244,auVar266);
      auVar249._8_4_ = -88.37626;
      auVar249._12_4_ = -88.37626;
      auVar249._0_4_ = -88.37626;
      auVar249._4_4_ = -88.37626;
      auVar249._16_4_ = -88.37626;
      auVar249._20_4_ = -88.37626;
      auVar249._24_4_ = -88.37626;
      auVar249._28_4_ = -88.37626;
      auVar249._32_4_ = -88.37626;
      auVar249._36_4_ = -88.37626;
      auVar249._40_4_ = -88.37626;
      auVar249._44_4_ = -88.37626;
      auVar249._48_4_ = -88.37626;
      auVar249._52_4_ = -88.37626;
      auVar249._56_4_ = -88.37626;
      auVar249._60_4_ = -88.37626;
      auVar245 = vmaxps_avx512f(auVar244,auVar249);
      auVar52._8_4_ = 1.442695;
      auVar52._12_4_ = 1.442695;
      auVar52._0_4_ = 1.442695;
      auVar52._4_4_ = 1.442695;
      auVar52._16_4_ = 1.442695;
      auVar52._20_4_ = 1.442695;
      auVar52._24_4_ = 1.442695;
      auVar52._28_4_ = 1.442695;
      auVar52._32_4_ = 1.442695;
      auVar52._36_4_ = 1.442695;
      auVar52._40_4_ = 1.442695;
      auVar52._44_4_ = 1.442695;
      auVar52._48_4_ = 1.442695;
      auVar52._52_4_ = 1.442695;
      auVar52._56_4_ = 1.442695;
      auVar52._60_4_ = 1.442695;
      auVar51._8_4_ = 0.5;
      auVar51._12_4_ = 0.5;
      auVar51._0_4_ = 0.5;
      auVar51._4_4_ = 0.5;
      auVar51._16_4_ = 0.5;
      auVar51._20_4_ = 0.5;
      auVar51._24_4_ = 0.5;
      auVar51._28_4_ = 0.5;
      auVar51._32_4_ = 0.5;
      auVar51._36_4_ = 0.5;
      auVar51._40_4_ = 0.5;
      auVar51._44_4_ = 0.5;
      auVar51._48_4_ = 0.5;
      auVar51._52_4_ = 0.5;
      auVar51._56_4_ = 0.5;
      auVar51._60_4_ = 0.5;
      auVar244 = vfmadd213ps_avx512f(auVar52,auVar245,auVar51);
      auVar249 = vrndscaleps_avx512f(auVar244,1);
      uVar22 = vcmpps_avx512f(auVar244,auVar249,1);
      uVar23 = (ushort)uVar22;
      auVar77._8_4_ = 1.0;
      auVar77._12_4_ = 1.0;
      auVar77._0_4_ = 1.0;
      auVar77._4_4_ = 1.0;
      auVar77._16_4_ = 1.0;
      auVar77._20_4_ = 1.0;
      auVar77._24_4_ = 1.0;
      auVar77._28_4_ = 1.0;
      auVar77._32_4_ = 1.0;
      auVar77._36_4_ = 1.0;
      auVar77._40_4_ = 1.0;
      auVar77._44_4_ = 1.0;
      auVar77._48_4_ = 1.0;
      auVar77._52_4_ = 1.0;
      auVar77._56_4_ = 1.0;
      auVar77._60_4_ = 1.0;
      local_4fc0 = auVar249._0_4_;
      iStack_4fbc = auVar249._4_4_;
      iStack_4fb8 = auVar249._8_4_;
      iStack_4fb4 = auVar249._12_4_;
      iStack_4fb0 = auVar249._16_4_;
      iStack_4fac = auVar249._20_4_;
      iStack_4fa8 = auVar249._24_4_;
      iStack_4fa4 = auVar249._28_4_;
      iStack_4fa0 = auVar249._32_4_;
      iStack_4f9c = auVar249._36_4_;
      iStack_4f98 = auVar249._40_4_;
      iStack_4f94 = auVar249._44_4_;
      iStack_4f90 = auVar249._48_4_;
      iStack_4f8c = auVar249._52_4_;
      iStack_4f88 = auVar249._56_4_;
      iStack_4f84 = auVar249._60_4_;
      auVar244 = vsubps_avx512f(auVar249,auVar77);
      bVar2 = (bool)((byte)uVar22 & 1);
      bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
      bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
      bVar7 = (bool)((byte)(uVar23 >> 5) & 1);
      bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
      bVar9 = (bool)((byte)(uVar23 >> 7) & 1);
      bVar10 = (byte)((ulong)uVar22 >> 8);
      bVar11 = (bool)(bVar10 >> 1 & 1);
      bVar12 = (bool)(bVar10 >> 2 & 1);
      bVar13 = (bool)(bVar10 >> 3 & 1);
      bVar14 = (bool)(bVar10 >> 4 & 1);
      bVar15 = (bool)(bVar10 >> 5 & 1);
      bVar16 = (bool)(bVar10 >> 6 & 1);
      local_9540._4_4_ = (uint)bVar3 * auVar244._4_4_ | (uint)!bVar3 * iStack_4fbc;
      local_9540._0_4_ = (uint)bVar2 * auVar244._0_4_ | (uint)!bVar2 * local_4fc0;
      local_9540._8_4_ = (uint)bVar4 * auVar244._8_4_ | (uint)!bVar4 * iStack_4fb8;
      local_9540._12_4_ = (uint)bVar5 * auVar244._12_4_ | (uint)!bVar5 * iStack_4fb4;
      uStack_9530._0_4_ = (uint)bVar6 * auVar244._16_4_ | (uint)!bVar6 * iStack_4fb0;
      uStack_9530._4_4_ = (uint)bVar7 * auVar244._20_4_ | (uint)!bVar7 * iStack_4fac;
      uStack_9528._0_4_ = (uint)bVar8 * auVar244._24_4_ | (uint)!bVar8 * iStack_4fa8;
      uStack_9528._4_4_ = (uint)bVar9 * auVar244._28_4_ | (uint)!bVar9 * iStack_4fa4;
      auVar257 = _local_9540;
      uStack_9520._0_4_ =
           (uint)(bVar10 & 1) * auVar244._32_4_ | (uint)!(bool)(bVar10 & 1) * iStack_4fa0;
      uStack_9520._4_4_ = (uint)bVar11 * auVar244._36_4_ | (uint)!bVar11 * iStack_4f9c;
      auVar236 = _local_9540;
      uStack_9518._0_4_ = (uint)bVar12 * auVar244._40_4_ | (uint)!bVar12 * iStack_4f98;
      uStack_9518._4_4_ = (uint)bVar13 * auVar244._44_4_ | (uint)!bVar13 * iStack_4f94;
      auVar237 = _local_9540;
      uStack_9510._0_4_ = (uint)bVar14 * auVar244._48_4_ | (uint)!bVar14 * iStack_4f90;
      uStack_9510._4_4_ = (uint)bVar15 * auVar244._52_4_ | (uint)!bVar15 * iStack_4f8c;
      auVar234 = _local_9540;
      uStack_9508._0_4_ = (uint)bVar16 * auVar244._56_4_ | (uint)!bVar16 * iStack_4f88;
      uStack_9508._4_4_ =
           (uint)(bVar10 >> 7) * auVar244._60_4_ | (uint)!(bool)(bVar10 >> 7) * iStack_4f84;
      auVar244 = _local_9540;
      uStack_9528 = auVar257._24_8_;
      uStack_9520 = auVar236._32_8_;
      uStack_9518 = auVar237._40_8_;
      uStack_9510 = auVar234._48_8_;
      uStack_9508 = auVar244._56_8_;
      auVar84._16_8_ = uStack_9530;
      auVar84._0_16_ = local_9540;
      auVar84._24_8_ = uStack_9528;
      auVar84._32_8_ = uStack_9520;
      auVar84._40_8_ = uStack_9518;
      auVar84._48_8_ = uStack_9510;
      auVar84._56_8_ = uStack_9508;
      auVar83._8_4_ = 0.6933594;
      auVar83._12_4_ = 0.6933594;
      auVar83._0_4_ = 0.6933594;
      auVar83._4_4_ = 0.6933594;
      auVar83._16_4_ = 0.6933594;
      auVar83._20_4_ = 0.6933594;
      auVar83._24_4_ = 0.6933594;
      auVar83._28_4_ = 0.6933594;
      auVar83._32_4_ = 0.6933594;
      auVar83._36_4_ = 0.6933594;
      auVar83._40_4_ = 0.6933594;
      auVar83._44_4_ = 0.6933594;
      auVar83._48_4_ = 0.6933594;
      auVar83._52_4_ = 0.6933594;
      auVar83._56_4_ = 0.6933594;
      auVar83._60_4_ = 0.6933594;
      auVar244 = vfnmadd213ps_avx512f(auVar83,auVar84,auVar245);
      auVar82._16_8_ = uStack_9530;
      auVar82._0_16_ = local_9540;
      auVar82._24_8_ = uStack_9528;
      auVar82._32_8_ = uStack_9520;
      auVar82._40_8_ = uStack_9518;
      auVar82._48_8_ = uStack_9510;
      auVar82._56_8_ = uStack_9508;
      auVar81._8_4_ = -0.00021219444;
      auVar81._12_4_ = -0.00021219444;
      auVar81._0_4_ = -0.00021219444;
      auVar81._4_4_ = -0.00021219444;
      auVar81._16_4_ = -0.00021219444;
      auVar81._20_4_ = -0.00021219444;
      auVar81._24_4_ = -0.00021219444;
      auVar81._28_4_ = -0.00021219444;
      auVar81._32_4_ = -0.00021219444;
      auVar81._36_4_ = -0.00021219444;
      auVar81._40_4_ = -0.00021219444;
      auVar81._44_4_ = -0.00021219444;
      auVar81._48_4_ = -0.00021219444;
      auVar81._52_4_ = -0.00021219444;
      auVar81._56_4_ = -0.00021219444;
      auVar81._60_4_ = -0.00021219444;
      auVar244 = vfnmadd213ps_avx512f(auVar81,auVar82,auVar244);
      auVar245 = vmulps_avx512f(auVar244,auVar244);
      uStack_9638._0_4_ = 0.00019875691;
      uStack_9638._4_4_ = 0.00019875691;
      local_9640._0_4_ = 0.00019875691;
      local_9640._4_4_ = 0.00019875691;
      auVar50._16_4_ = 0.00019875691;
      auVar50._20_4_ = 0.00019875691;
      auVar50._0_16_ = _local_9640;
      auVar50._24_4_ = 0.00019875691;
      auVar50._28_4_ = 0.00019875691;
      auVar50._32_4_ = 0.00019875691;
      auVar50._36_4_ = 0.00019875691;
      auVar50._40_4_ = 0.00019875691;
      auVar50._44_4_ = 0.00019875691;
      auVar50._48_4_ = 0.00019875691;
      auVar50._52_4_ = 0.00019875691;
      auVar50._56_4_ = 0.00019875691;
      auVar50._60_4_ = 0.00019875691;
      auVar49._8_4_ = 0.0013981999;
      auVar49._12_4_ = 0.0013981999;
      auVar49._0_4_ = 0.0013981999;
      auVar49._4_4_ = 0.0013981999;
      auVar49._16_4_ = 0.0013981999;
      auVar49._20_4_ = 0.0013981999;
      auVar49._24_4_ = 0.0013981999;
      auVar49._28_4_ = 0.0013981999;
      auVar49._32_4_ = 0.0013981999;
      auVar49._36_4_ = 0.0013981999;
      auVar49._40_4_ = 0.0013981999;
      auVar49._44_4_ = 0.0013981999;
      auVar49._48_4_ = 0.0013981999;
      auVar49._52_4_ = 0.0013981999;
      auVar49._56_4_ = 0.0013981999;
      auVar49._60_4_ = 0.0013981999;
      auVar249 = vfmadd213ps_avx512f(auVar244,auVar50,auVar49);
      auVar48._8_4_ = 0.008333452;
      auVar48._12_4_ = 0.008333452;
      auVar48._0_4_ = 0.008333452;
      auVar48._4_4_ = 0.008333452;
      auVar48._16_4_ = 0.008333452;
      auVar48._20_4_ = 0.008333452;
      auVar48._24_4_ = 0.008333452;
      auVar48._28_4_ = 0.008333452;
      auVar48._32_4_ = 0.008333452;
      auVar48._36_4_ = 0.008333452;
      auVar48._40_4_ = 0.008333452;
      auVar48._44_4_ = 0.008333452;
      auVar48._48_4_ = 0.008333452;
      auVar48._52_4_ = 0.008333452;
      auVar48._56_4_ = 0.008333452;
      auVar48._60_4_ = 0.008333452;
      auVar249 = vfmadd213ps_avx512f(auVar244,auVar249,auVar48);
      auVar47._8_4_ = 0.041665796;
      auVar47._12_4_ = 0.041665796;
      auVar47._0_4_ = 0.041665796;
      auVar47._4_4_ = 0.041665796;
      auVar47._16_4_ = 0.041665796;
      auVar47._20_4_ = 0.041665796;
      auVar47._24_4_ = 0.041665796;
      auVar47._28_4_ = 0.041665796;
      auVar47._32_4_ = 0.041665796;
      auVar47._36_4_ = 0.041665796;
      auVar47._40_4_ = 0.041665796;
      auVar47._44_4_ = 0.041665796;
      auVar47._48_4_ = 0.041665796;
      auVar47._52_4_ = 0.041665796;
      auVar47._56_4_ = 0.041665796;
      auVar47._60_4_ = 0.041665796;
      auVar249 = vfmadd213ps_avx512f(auVar244,auVar249,auVar47);
      auVar46._8_4_ = 0.16666666;
      auVar46._12_4_ = 0.16666666;
      auVar46._0_4_ = 0.16666666;
      auVar46._4_4_ = 0.16666666;
      auVar46._16_4_ = 0.16666666;
      auVar46._20_4_ = 0.16666666;
      auVar46._24_4_ = 0.16666666;
      auVar46._28_4_ = 0.16666666;
      auVar46._32_4_ = 0.16666666;
      auVar46._36_4_ = 0.16666666;
      auVar46._40_4_ = 0.16666666;
      auVar46._44_4_ = 0.16666666;
      auVar46._48_4_ = 0.16666666;
      auVar46._52_4_ = 0.16666666;
      auVar46._56_4_ = 0.16666666;
      auVar46._60_4_ = 0.16666666;
      auVar249 = vfmadd213ps_avx512f(auVar244,auVar249,auVar46);
      auVar45._8_4_ = 0.5;
      auVar45._12_4_ = 0.5;
      auVar45._0_4_ = 0.5;
      auVar45._4_4_ = 0.5;
      auVar45._16_4_ = 0.5;
      auVar45._20_4_ = 0.5;
      auVar45._24_4_ = 0.5;
      auVar45._28_4_ = 0.5;
      auVar45._32_4_ = 0.5;
      auVar45._36_4_ = 0.5;
      auVar45._40_4_ = 0.5;
      auVar45._44_4_ = 0.5;
      auVar45._48_4_ = 0.5;
      auVar45._52_4_ = 0.5;
      auVar45._56_4_ = 0.5;
      auVar45._60_4_ = 0.5;
      auVar249 = vfmadd213ps_avx512f(auVar244,auVar249,auVar45);
      auVar244 = vfmadd213ps_avx512f(auVar245,auVar249,auVar244);
      auVar250._8_4_ = 1.0;
      auVar250._12_4_ = 1.0;
      auVar250._0_4_ = 1.0;
      auVar250._4_4_ = 1.0;
      auVar250._16_4_ = 1.0;
      auVar250._20_4_ = 1.0;
      auVar250._24_4_ = 1.0;
      auVar250._28_4_ = 1.0;
      auVar250._32_4_ = 1.0;
      auVar250._36_4_ = 1.0;
      auVar250._40_4_ = 1.0;
      auVar250._44_4_ = 1.0;
      auVar250._48_4_ = 1.0;
      auVar250._52_4_ = 1.0;
      auVar250._56_4_ = 1.0;
      auVar250._60_4_ = 1.0;
      auVar249 = vaddps_avx512f(auVar244,auVar250);
      auVar266 = ZEXT1664((undefined1  [16])0x0);
      auVar97._16_8_ = uStack_9530;
      auVar97._0_16_ = local_9540;
      auVar97._24_8_ = uStack_9528;
      auVar97._32_8_ = uStack_9520;
      auVar97._40_8_ = uStack_9518;
      auVar97._48_8_ = uStack_9510;
      auVar97._56_8_ = uStack_9508;
      auVar244 = vcvttps2dq_avx512f(auVar97);
      vmovdqa64_avx512f(auVar266);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vmovdqa64_avx512f(auVar245);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vmovdqa64_avx512f(auVar245);
      auVar244 = vpaddd_avx512f(auVar244,auVar245);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vpslld_avx512f(auVar244,ZEXT416(0x17));
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar249 = vmulps_avx512f(auVar249,auVar244);
      local_9640 = auVar249._0_8_;
      uStack_9638 = auVar249._8_8_;
      uStack_9630 = auVar249._16_8_;
      uStack_9628 = auVar249._24_8_;
      uStack_9620 = auVar249._32_8_;
      uStack_9618 = auVar249._40_8_;
      uStack_9610 = auVar249._48_8_;
      uStack_9608 = auVar249._56_8_;
      auVar244 = vsubps_avx512f(local_b060[1],auVar246);
      auVar42._8_4_ = 88.37626;
      auVar42._12_4_ = 88.37626;
      auVar42._0_4_ = 88.37626;
      auVar42._4_4_ = 88.37626;
      auVar42._16_4_ = 88.37626;
      auVar42._20_4_ = 88.37626;
      auVar42._24_4_ = 88.37626;
      auVar42._28_4_ = 88.37626;
      auVar42._32_4_ = 88.37626;
      auVar42._36_4_ = 88.37626;
      auVar42._40_4_ = 88.37626;
      auVar42._44_4_ = 88.37626;
      auVar42._48_4_ = 88.37626;
      auVar42._52_4_ = 88.37626;
      auVar42._56_4_ = 88.37626;
      auVar42._60_4_ = 88.37626;
      auVar244 = vminps_avx512f(auVar244,auVar42);
      auVar246._8_4_ = -88.37626;
      auVar246._12_4_ = -88.37626;
      auVar246._0_4_ = -88.37626;
      auVar246._4_4_ = -88.37626;
      auVar246._16_4_ = -88.37626;
      auVar246._20_4_ = -88.37626;
      auVar246._24_4_ = -88.37626;
      auVar246._28_4_ = -88.37626;
      auVar246._32_4_ = -88.37626;
      auVar246._36_4_ = -88.37626;
      auVar246._40_4_ = -88.37626;
      auVar246._44_4_ = -88.37626;
      auVar246._48_4_ = -88.37626;
      auVar246._52_4_ = -88.37626;
      auVar246._56_4_ = -88.37626;
      auVar246._60_4_ = -88.37626;
      auVar245 = vmaxps_avx512f(auVar244,auVar246);
      auVar60._8_4_ = 1.442695;
      auVar60._12_4_ = 1.442695;
      auVar60._0_4_ = 1.442695;
      auVar60._4_4_ = 1.442695;
      auVar60._16_4_ = 1.442695;
      auVar60._20_4_ = 1.442695;
      auVar60._24_4_ = 1.442695;
      auVar60._28_4_ = 1.442695;
      auVar60._32_4_ = 1.442695;
      auVar60._36_4_ = 1.442695;
      auVar60._40_4_ = 1.442695;
      auVar60._44_4_ = 1.442695;
      auVar60._48_4_ = 1.442695;
      auVar60._52_4_ = 1.442695;
      auVar60._56_4_ = 1.442695;
      auVar60._60_4_ = 1.442695;
      auVar59._8_4_ = 0.5;
      auVar59._12_4_ = 0.5;
      auVar59._0_4_ = 0.5;
      auVar59._4_4_ = 0.5;
      auVar59._16_4_ = 0.5;
      auVar59._20_4_ = 0.5;
      auVar59._24_4_ = 0.5;
      auVar59._28_4_ = 0.5;
      auVar59._32_4_ = 0.5;
      auVar59._36_4_ = 0.5;
      auVar59._40_4_ = 0.5;
      auVar59._44_4_ = 0.5;
      auVar59._48_4_ = 0.5;
      auVar59._52_4_ = 0.5;
      auVar59._56_4_ = 0.5;
      auVar59._60_4_ = 0.5;
      auVar244 = vfmadd213ps_avx512f(auVar60,auVar245,auVar59);
      auVar246 = vrndscaleps_avx512f(auVar244,1);
      uVar22 = vcmpps_avx512f(auVar244,auVar246,1);
      uVar23 = (ushort)uVar22;
      auVar78._8_4_ = 1.0;
      auVar78._12_4_ = 1.0;
      auVar78._0_4_ = 1.0;
      auVar78._4_4_ = 1.0;
      auVar78._16_4_ = 1.0;
      auVar78._20_4_ = 1.0;
      auVar78._24_4_ = 1.0;
      auVar78._28_4_ = 1.0;
      auVar78._32_4_ = 1.0;
      auVar78._36_4_ = 1.0;
      auVar78._40_4_ = 1.0;
      auVar78._44_4_ = 1.0;
      auVar78._48_4_ = 1.0;
      auVar78._52_4_ = 1.0;
      auVar78._56_4_ = 1.0;
      auVar78._60_4_ = 1.0;
      local_4e40 = auVar246._0_4_;
      iStack_4e3c = auVar246._4_4_;
      iStack_4e38 = auVar246._8_4_;
      iStack_4e34 = auVar246._12_4_;
      iStack_4e30 = auVar246._16_4_;
      iStack_4e2c = auVar246._20_4_;
      iStack_4e28 = auVar246._24_4_;
      iStack_4e24 = auVar246._28_4_;
      iStack_4e20 = auVar246._32_4_;
      iStack_4e1c = auVar246._36_4_;
      iStack_4e18 = auVar246._40_4_;
      iStack_4e14 = auVar246._44_4_;
      iStack_4e10 = auVar246._48_4_;
      iStack_4e0c = auVar246._52_4_;
      iStack_4e08 = auVar246._56_4_;
      iStack_4e04 = auVar246._60_4_;
      auVar244 = vsubps_avx512f(auVar246,auVar78);
      bVar2 = (bool)((byte)uVar22 & 1);
      bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
      bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
      bVar7 = (bool)((byte)(uVar23 >> 5) & 1);
      bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
      bVar9 = (bool)((byte)(uVar23 >> 7) & 1);
      bVar10 = (byte)((ulong)uVar22 >> 8);
      bVar11 = (bool)(bVar10 >> 1 & 1);
      bVar12 = (bool)(bVar10 >> 2 & 1);
      bVar13 = (bool)(bVar10 >> 3 & 1);
      bVar14 = (bool)(bVar10 >> 4 & 1);
      bVar15 = (bool)(bVar10 >> 5 & 1);
      bVar16 = (bool)(bVar10 >> 6 & 1);
      local_97c0._4_4_ = (uint)bVar3 * auVar244._4_4_ | (uint)!bVar3 * iStack_4e3c;
      local_97c0._0_4_ = (uint)bVar2 * auVar244._0_4_ | (uint)!bVar2 * local_4e40;
      local_97c0._8_4_ = (uint)bVar4 * auVar244._8_4_ | (uint)!bVar4 * iStack_4e38;
      local_97c0._12_4_ = (uint)bVar5 * auVar244._12_4_ | (uint)!bVar5 * iStack_4e34;
      uStack_97b0._0_4_ = (uint)bVar6 * auVar244._16_4_ | (uint)!bVar6 * iStack_4e30;
      uStack_97b0._4_4_ = (uint)bVar7 * auVar244._20_4_ | (uint)!bVar7 * iStack_4e2c;
      uStack_97a8._0_4_ = (uint)bVar8 * auVar244._24_4_ | (uint)!bVar8 * iStack_4e28;
      uStack_97a8._4_4_ = (uint)bVar9 * auVar244._28_4_ | (uint)!bVar9 * iStack_4e24;
      auVar257 = _local_97c0;
      uStack_97a0._0_4_ =
           (uint)(bVar10 & 1) * auVar244._32_4_ | (uint)!(bool)(bVar10 & 1) * iStack_4e20;
      uStack_97a0._4_4_ = (uint)bVar11 * auVar244._36_4_ | (uint)!bVar11 * iStack_4e1c;
      auVar236 = _local_97c0;
      uStack_9798._0_4_ = (uint)bVar12 * auVar244._40_4_ | (uint)!bVar12 * iStack_4e18;
      uStack_9798._4_4_ = (uint)bVar13 * auVar244._44_4_ | (uint)!bVar13 * iStack_4e14;
      auVar237 = _local_97c0;
      uStack_9790._0_4_ = (uint)bVar14 * auVar244._48_4_ | (uint)!bVar14 * iStack_4e10;
      uStack_9790._4_4_ = (uint)bVar15 * auVar244._52_4_ | (uint)!bVar15 * iStack_4e0c;
      auVar234 = _local_97c0;
      uStack_9788._0_4_ = (uint)bVar16 * auVar244._56_4_ | (uint)!bVar16 * iStack_4e08;
      uStack_9788._4_4_ =
           (uint)(bVar10 >> 7) * auVar244._60_4_ | (uint)!(bool)(bVar10 >> 7) * iStack_4e04;
      auVar244 = _local_97c0;
      uStack_97a8 = auVar257._24_8_;
      uStack_97a0 = auVar236._32_8_;
      uStack_9798 = auVar237._40_8_;
      uStack_9790 = auVar234._48_8_;
      uStack_9788 = auVar244._56_8_;
      auVar88._16_8_ = uStack_97b0;
      auVar88._0_16_ = local_97c0;
      auVar88._24_8_ = uStack_97a8;
      auVar88._32_8_ = uStack_97a0;
      auVar88._40_8_ = uStack_9798;
      auVar88._48_8_ = uStack_9790;
      auVar88._56_8_ = uStack_9788;
      auVar87._8_4_ = 0.6933594;
      auVar87._12_4_ = 0.6933594;
      auVar87._0_4_ = 0.6933594;
      auVar87._4_4_ = 0.6933594;
      auVar87._16_4_ = 0.6933594;
      auVar87._20_4_ = 0.6933594;
      auVar87._24_4_ = 0.6933594;
      auVar87._28_4_ = 0.6933594;
      auVar87._32_4_ = 0.6933594;
      auVar87._36_4_ = 0.6933594;
      auVar87._40_4_ = 0.6933594;
      auVar87._44_4_ = 0.6933594;
      auVar87._48_4_ = 0.6933594;
      auVar87._52_4_ = 0.6933594;
      auVar87._56_4_ = 0.6933594;
      auVar87._60_4_ = 0.6933594;
      auVar244 = vfnmadd213ps_avx512f(auVar87,auVar88,auVar245);
      auVar86._16_8_ = uStack_97b0;
      auVar86._0_16_ = local_97c0;
      auVar86._24_8_ = uStack_97a8;
      auVar86._32_8_ = uStack_97a0;
      auVar86._40_8_ = uStack_9798;
      auVar86._48_8_ = uStack_9790;
      auVar86._56_8_ = uStack_9788;
      auVar85._8_4_ = -0.00021219444;
      auVar85._12_4_ = -0.00021219444;
      auVar85._0_4_ = -0.00021219444;
      auVar85._4_4_ = -0.00021219444;
      auVar85._16_4_ = -0.00021219444;
      auVar85._20_4_ = -0.00021219444;
      auVar85._24_4_ = -0.00021219444;
      auVar85._28_4_ = -0.00021219444;
      auVar85._32_4_ = -0.00021219444;
      auVar85._36_4_ = -0.00021219444;
      auVar85._40_4_ = -0.00021219444;
      auVar85._44_4_ = -0.00021219444;
      auVar85._48_4_ = -0.00021219444;
      auVar85._52_4_ = -0.00021219444;
      auVar85._56_4_ = -0.00021219444;
      auVar85._60_4_ = -0.00021219444;
      auVar244 = vfnmadd213ps_avx512f(auVar85,auVar86,auVar244);
      auVar245 = vmulps_avx512f(auVar244,auVar244);
      uStack_98b8._0_4_ = 0.00019875691;
      uStack_98b8._4_4_ = 0.00019875691;
      local_98c0._0_4_ = 0.00019875691;
      local_98c0._4_4_ = 0.00019875691;
      auVar58._16_4_ = 0.00019875691;
      auVar58._20_4_ = 0.00019875691;
      auVar58._0_16_ = _local_98c0;
      auVar58._24_4_ = 0.00019875691;
      auVar58._28_4_ = 0.00019875691;
      auVar58._32_4_ = 0.00019875691;
      auVar58._36_4_ = 0.00019875691;
      auVar58._40_4_ = 0.00019875691;
      auVar58._44_4_ = 0.00019875691;
      auVar58._48_4_ = 0.00019875691;
      auVar58._52_4_ = 0.00019875691;
      auVar58._56_4_ = 0.00019875691;
      auVar58._60_4_ = 0.00019875691;
      auVar57._8_4_ = 0.0013981999;
      auVar57._12_4_ = 0.0013981999;
      auVar57._0_4_ = 0.0013981999;
      auVar57._4_4_ = 0.0013981999;
      auVar57._16_4_ = 0.0013981999;
      auVar57._20_4_ = 0.0013981999;
      auVar57._24_4_ = 0.0013981999;
      auVar57._28_4_ = 0.0013981999;
      auVar57._32_4_ = 0.0013981999;
      auVar57._36_4_ = 0.0013981999;
      auVar57._40_4_ = 0.0013981999;
      auVar57._44_4_ = 0.0013981999;
      auVar57._48_4_ = 0.0013981999;
      auVar57._52_4_ = 0.0013981999;
      auVar57._56_4_ = 0.0013981999;
      auVar57._60_4_ = 0.0013981999;
      auVar246 = vfmadd213ps_avx512f(auVar244,auVar58,auVar57);
      auVar56._8_4_ = 0.008333452;
      auVar56._12_4_ = 0.008333452;
      auVar56._0_4_ = 0.008333452;
      auVar56._4_4_ = 0.008333452;
      auVar56._16_4_ = 0.008333452;
      auVar56._20_4_ = 0.008333452;
      auVar56._24_4_ = 0.008333452;
      auVar56._28_4_ = 0.008333452;
      auVar56._32_4_ = 0.008333452;
      auVar56._36_4_ = 0.008333452;
      auVar56._40_4_ = 0.008333452;
      auVar56._44_4_ = 0.008333452;
      auVar56._48_4_ = 0.008333452;
      auVar56._52_4_ = 0.008333452;
      auVar56._56_4_ = 0.008333452;
      auVar56._60_4_ = 0.008333452;
      auVar246 = vfmadd213ps_avx512f(auVar244,auVar246,auVar56);
      auVar55._8_4_ = 0.041665796;
      auVar55._12_4_ = 0.041665796;
      auVar55._0_4_ = 0.041665796;
      auVar55._4_4_ = 0.041665796;
      auVar55._16_4_ = 0.041665796;
      auVar55._20_4_ = 0.041665796;
      auVar55._24_4_ = 0.041665796;
      auVar55._28_4_ = 0.041665796;
      auVar55._32_4_ = 0.041665796;
      auVar55._36_4_ = 0.041665796;
      auVar55._40_4_ = 0.041665796;
      auVar55._44_4_ = 0.041665796;
      auVar55._48_4_ = 0.041665796;
      auVar55._52_4_ = 0.041665796;
      auVar55._56_4_ = 0.041665796;
      auVar55._60_4_ = 0.041665796;
      auVar246 = vfmadd213ps_avx512f(auVar244,auVar246,auVar55);
      auVar54._8_4_ = 0.16666666;
      auVar54._12_4_ = 0.16666666;
      auVar54._0_4_ = 0.16666666;
      auVar54._4_4_ = 0.16666666;
      auVar54._16_4_ = 0.16666666;
      auVar54._20_4_ = 0.16666666;
      auVar54._24_4_ = 0.16666666;
      auVar54._28_4_ = 0.16666666;
      auVar54._32_4_ = 0.16666666;
      auVar54._36_4_ = 0.16666666;
      auVar54._40_4_ = 0.16666666;
      auVar54._44_4_ = 0.16666666;
      auVar54._48_4_ = 0.16666666;
      auVar54._52_4_ = 0.16666666;
      auVar54._56_4_ = 0.16666666;
      auVar54._60_4_ = 0.16666666;
      auVar246 = vfmadd213ps_avx512f(auVar244,auVar246,auVar54);
      auVar53._8_4_ = 0.5;
      auVar53._12_4_ = 0.5;
      auVar53._0_4_ = 0.5;
      auVar53._4_4_ = 0.5;
      auVar53._16_4_ = 0.5;
      auVar53._20_4_ = 0.5;
      auVar53._24_4_ = 0.5;
      auVar53._28_4_ = 0.5;
      auVar53._32_4_ = 0.5;
      auVar53._36_4_ = 0.5;
      auVar53._40_4_ = 0.5;
      auVar53._44_4_ = 0.5;
      auVar53._48_4_ = 0.5;
      auVar53._52_4_ = 0.5;
      auVar53._56_4_ = 0.5;
      auVar53._60_4_ = 0.5;
      auVar246 = vfmadd213ps_avx512f(auVar244,auVar246,auVar53);
      auVar244 = vfmadd213ps_avx512f(auVar245,auVar246,auVar244);
      auVar251._8_4_ = 1.0;
      auVar251._12_4_ = 1.0;
      auVar251._0_4_ = 1.0;
      auVar251._4_4_ = 1.0;
      auVar251._16_4_ = 1.0;
      auVar251._20_4_ = 1.0;
      auVar251._24_4_ = 1.0;
      auVar251._28_4_ = 1.0;
      auVar251._32_4_ = 1.0;
      auVar251._36_4_ = 1.0;
      auVar251._40_4_ = 1.0;
      auVar251._44_4_ = 1.0;
      auVar251._48_4_ = 1.0;
      auVar251._52_4_ = 1.0;
      auVar251._56_4_ = 1.0;
      auVar251._60_4_ = 1.0;
      auVar246 = vaddps_avx512f(auVar244,auVar251);
      auVar98._16_8_ = uStack_97b0;
      auVar98._0_16_ = local_97c0;
      auVar98._24_8_ = uStack_97a8;
      auVar98._32_8_ = uStack_97a0;
      auVar98._40_8_ = uStack_9798;
      auVar98._48_8_ = uStack_9790;
      auVar98._56_8_ = uStack_9788;
      auVar244 = vcvttps2dq_avx512f(auVar98);
      vmovdqa64_avx512f(auVar266);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vmovdqa64_avx512f(auVar245);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vmovdqa64_avx512f(auVar245);
      auVar244 = vpaddd_avx512f(auVar244,auVar245);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vpslld_avx512f(auVar244,ZEXT416(0x17));
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar246 = vmulps_avx512f(auVar246,auVar244);
      local_98c0 = auVar246._0_8_;
      uStack_98b8 = auVar246._8_8_;
      uStack_98b0 = auVar246._16_8_;
      uStack_98a8 = auVar246._24_8_;
      uStack_98a0 = auVar246._32_8_;
      uStack_9898 = auVar246._40_8_;
      uStack_9890 = auVar246._48_8_;
      uStack_9888 = auVar246._56_8_;
      auVar244 = vsubps_avx512f(local_b060[2],auVar247);
      auVar43._8_4_ = 88.37626;
      auVar43._12_4_ = 88.37626;
      auVar43._0_4_ = 88.37626;
      auVar43._4_4_ = 88.37626;
      auVar43._16_4_ = 88.37626;
      auVar43._20_4_ = 88.37626;
      auVar43._24_4_ = 88.37626;
      auVar43._28_4_ = 88.37626;
      auVar43._32_4_ = 88.37626;
      auVar43._36_4_ = 88.37626;
      auVar43._40_4_ = 88.37626;
      auVar43._44_4_ = 88.37626;
      auVar43._48_4_ = 88.37626;
      auVar43._52_4_ = 88.37626;
      auVar43._56_4_ = 88.37626;
      auVar43._60_4_ = 88.37626;
      auVar244 = vminps_avx512f(auVar244,auVar43);
      auVar245._8_4_ = -88.37626;
      auVar245._12_4_ = -88.37626;
      auVar245._0_4_ = -88.37626;
      auVar245._4_4_ = -88.37626;
      auVar245._16_4_ = -88.37626;
      auVar245._20_4_ = -88.37626;
      auVar245._24_4_ = -88.37626;
      auVar245._28_4_ = -88.37626;
      auVar245._32_4_ = -88.37626;
      auVar245._36_4_ = -88.37626;
      auVar245._40_4_ = -88.37626;
      auVar245._44_4_ = -88.37626;
      auVar245._48_4_ = -88.37626;
      auVar245._52_4_ = -88.37626;
      auVar245._56_4_ = -88.37626;
      auVar245._60_4_ = -88.37626;
      auVar245 = vmaxps_avx512f(auVar244,auVar245);
      auVar68._8_4_ = 1.442695;
      auVar68._12_4_ = 1.442695;
      auVar68._0_4_ = 1.442695;
      auVar68._4_4_ = 1.442695;
      auVar68._16_4_ = 1.442695;
      auVar68._20_4_ = 1.442695;
      auVar68._24_4_ = 1.442695;
      auVar68._28_4_ = 1.442695;
      auVar68._32_4_ = 1.442695;
      auVar68._36_4_ = 1.442695;
      auVar68._40_4_ = 1.442695;
      auVar68._44_4_ = 1.442695;
      auVar68._48_4_ = 1.442695;
      auVar68._52_4_ = 1.442695;
      auVar68._56_4_ = 1.442695;
      auVar68._60_4_ = 1.442695;
      auVar67._8_4_ = 0.5;
      auVar67._12_4_ = 0.5;
      auVar67._0_4_ = 0.5;
      auVar67._4_4_ = 0.5;
      auVar67._16_4_ = 0.5;
      auVar67._20_4_ = 0.5;
      auVar67._24_4_ = 0.5;
      auVar67._28_4_ = 0.5;
      auVar67._32_4_ = 0.5;
      auVar67._36_4_ = 0.5;
      auVar67._40_4_ = 0.5;
      auVar67._44_4_ = 0.5;
      auVar67._48_4_ = 0.5;
      auVar67._52_4_ = 0.5;
      auVar67._56_4_ = 0.5;
      auVar67._60_4_ = 0.5;
      auVar244 = vfmadd213ps_avx512f(auVar68,auVar245,auVar67);
      auVar250 = vrndscaleps_avx512f(auVar244,1);
      uVar22 = vcmpps_avx512f(auVar244,auVar250,1);
      uVar23 = (ushort)uVar22;
      auVar79._8_4_ = 1.0;
      auVar79._12_4_ = 1.0;
      auVar79._0_4_ = 1.0;
      auVar79._4_4_ = 1.0;
      auVar79._16_4_ = 1.0;
      auVar79._20_4_ = 1.0;
      auVar79._24_4_ = 1.0;
      auVar79._28_4_ = 1.0;
      auVar79._32_4_ = 1.0;
      auVar79._36_4_ = 1.0;
      auVar79._40_4_ = 1.0;
      auVar79._44_4_ = 1.0;
      auVar79._48_4_ = 1.0;
      auVar79._52_4_ = 1.0;
      auVar79._56_4_ = 1.0;
      auVar79._60_4_ = 1.0;
      local_4cc0 = auVar250._0_4_;
      iStack_4cbc = auVar250._4_4_;
      iStack_4cb8 = auVar250._8_4_;
      iStack_4cb4 = auVar250._12_4_;
      iStack_4cb0 = auVar250._16_4_;
      iStack_4cac = auVar250._20_4_;
      iStack_4ca8 = auVar250._24_4_;
      iStack_4ca4 = auVar250._28_4_;
      iStack_4ca0 = auVar250._32_4_;
      iStack_4c9c = auVar250._36_4_;
      iStack_4c98 = auVar250._40_4_;
      iStack_4c94 = auVar250._44_4_;
      iStack_4c90 = auVar250._48_4_;
      iStack_4c8c = auVar250._52_4_;
      iStack_4c88 = auVar250._56_4_;
      iStack_4c84 = auVar250._60_4_;
      auVar244 = vsubps_avx512f(auVar250,auVar79);
      bVar2 = (bool)((byte)uVar22 & 1);
      bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
      bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
      bVar7 = (bool)((byte)(uVar23 >> 5) & 1);
      bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
      bVar9 = (bool)((byte)(uVar23 >> 7) & 1);
      bVar10 = (byte)((ulong)uVar22 >> 8);
      bVar11 = (bool)(bVar10 >> 1 & 1);
      bVar12 = (bool)(bVar10 >> 2 & 1);
      bVar13 = (bool)(bVar10 >> 3 & 1);
      bVar14 = (bool)(bVar10 >> 4 & 1);
      bVar15 = (bool)(bVar10 >> 5 & 1);
      bVar16 = (bool)(bVar10 >> 6 & 1);
      local_9a40._4_4_ = (uint)bVar3 * auVar244._4_4_ | (uint)!bVar3 * iStack_4cbc;
      local_9a40._0_4_ = (uint)bVar2 * auVar244._0_4_ | (uint)!bVar2 * local_4cc0;
      local_9a40._8_4_ = (uint)bVar4 * auVar244._8_4_ | (uint)!bVar4 * iStack_4cb8;
      local_9a40._12_4_ = (uint)bVar5 * auVar244._12_4_ | (uint)!bVar5 * iStack_4cb4;
      uStack_9a30._0_4_ = (uint)bVar6 * auVar244._16_4_ | (uint)!bVar6 * iStack_4cb0;
      uStack_9a30._4_4_ = (uint)bVar7 * auVar244._20_4_ | (uint)!bVar7 * iStack_4cac;
      uStack_9a28._0_4_ = (uint)bVar8 * auVar244._24_4_ | (uint)!bVar8 * iStack_4ca8;
      uStack_9a28._4_4_ = (uint)bVar9 * auVar244._28_4_ | (uint)!bVar9 * iStack_4ca4;
      auVar257 = _local_9a40;
      uStack_9a20._0_4_ =
           (uint)(bVar10 & 1) * auVar244._32_4_ | (uint)!(bool)(bVar10 & 1) * iStack_4ca0;
      uStack_9a20._4_4_ = (uint)bVar11 * auVar244._36_4_ | (uint)!bVar11 * iStack_4c9c;
      auVar236 = _local_9a40;
      uStack_9a18._0_4_ = (uint)bVar12 * auVar244._40_4_ | (uint)!bVar12 * iStack_4c98;
      uStack_9a18._4_4_ = (uint)bVar13 * auVar244._44_4_ | (uint)!bVar13 * iStack_4c94;
      auVar237 = _local_9a40;
      uStack_9a10._0_4_ = (uint)bVar14 * auVar244._48_4_ | (uint)!bVar14 * iStack_4c90;
      uStack_9a10._4_4_ = (uint)bVar15 * auVar244._52_4_ | (uint)!bVar15 * iStack_4c8c;
      auVar234 = _local_9a40;
      uStack_9a08._0_4_ = (uint)bVar16 * auVar244._56_4_ | (uint)!bVar16 * iStack_4c88;
      uStack_9a08._4_4_ =
           (uint)(bVar10 >> 7) * auVar244._60_4_ | (uint)!(bool)(bVar10 >> 7) * iStack_4c84;
      auVar244 = _local_9a40;
      uStack_9a28 = auVar257._24_8_;
      uStack_9a20 = auVar236._32_8_;
      uStack_9a18 = auVar237._40_8_;
      uStack_9a10 = auVar234._48_8_;
      uStack_9a08 = auVar244._56_8_;
      auVar92._16_8_ = uStack_9a30;
      auVar92._0_16_ = local_9a40;
      auVar92._24_8_ = uStack_9a28;
      auVar92._32_8_ = uStack_9a20;
      auVar92._40_8_ = uStack_9a18;
      auVar92._48_8_ = uStack_9a10;
      auVar92._56_8_ = uStack_9a08;
      auVar91._8_4_ = 0.6933594;
      auVar91._12_4_ = 0.6933594;
      auVar91._0_4_ = 0.6933594;
      auVar91._4_4_ = 0.6933594;
      auVar91._16_4_ = 0.6933594;
      auVar91._20_4_ = 0.6933594;
      auVar91._24_4_ = 0.6933594;
      auVar91._28_4_ = 0.6933594;
      auVar91._32_4_ = 0.6933594;
      auVar91._36_4_ = 0.6933594;
      auVar91._40_4_ = 0.6933594;
      auVar91._44_4_ = 0.6933594;
      auVar91._48_4_ = 0.6933594;
      auVar91._52_4_ = 0.6933594;
      auVar91._56_4_ = 0.6933594;
      auVar91._60_4_ = 0.6933594;
      auVar244 = vfnmadd213ps_avx512f(auVar91,auVar92,auVar245);
      auVar90._16_8_ = uStack_9a30;
      auVar90._0_16_ = local_9a40;
      auVar90._24_8_ = uStack_9a28;
      auVar90._32_8_ = uStack_9a20;
      auVar90._40_8_ = uStack_9a18;
      auVar90._48_8_ = uStack_9a10;
      auVar90._56_8_ = uStack_9a08;
      auVar89._8_4_ = -0.00021219444;
      auVar89._12_4_ = -0.00021219444;
      auVar89._0_4_ = -0.00021219444;
      auVar89._4_4_ = -0.00021219444;
      auVar89._16_4_ = -0.00021219444;
      auVar89._20_4_ = -0.00021219444;
      auVar89._24_4_ = -0.00021219444;
      auVar89._28_4_ = -0.00021219444;
      auVar89._32_4_ = -0.00021219444;
      auVar89._36_4_ = -0.00021219444;
      auVar89._40_4_ = -0.00021219444;
      auVar89._44_4_ = -0.00021219444;
      auVar89._48_4_ = -0.00021219444;
      auVar89._52_4_ = -0.00021219444;
      auVar89._56_4_ = -0.00021219444;
      auVar89._60_4_ = -0.00021219444;
      auVar244 = vfnmadd213ps_avx512f(auVar89,auVar90,auVar244);
      auVar245 = vmulps_avx512f(auVar244,auVar244);
      uStack_9b38._0_4_ = 0.00019875691;
      uStack_9b38._4_4_ = 0.00019875691;
      local_9b40._0_4_ = 0.00019875691;
      local_9b40._4_4_ = 0.00019875691;
      auVar66._16_4_ = 0.00019875691;
      auVar66._20_4_ = 0.00019875691;
      auVar66._0_16_ = _local_9b40;
      auVar66._24_4_ = 0.00019875691;
      auVar66._28_4_ = 0.00019875691;
      auVar66._32_4_ = 0.00019875691;
      auVar66._36_4_ = 0.00019875691;
      auVar66._40_4_ = 0.00019875691;
      auVar66._44_4_ = 0.00019875691;
      auVar66._48_4_ = 0.00019875691;
      auVar66._52_4_ = 0.00019875691;
      auVar66._56_4_ = 0.00019875691;
      auVar66._60_4_ = 0.00019875691;
      auVar65._8_4_ = 0.0013981999;
      auVar65._12_4_ = 0.0013981999;
      auVar65._0_4_ = 0.0013981999;
      auVar65._4_4_ = 0.0013981999;
      auVar65._16_4_ = 0.0013981999;
      auVar65._20_4_ = 0.0013981999;
      auVar65._24_4_ = 0.0013981999;
      auVar65._28_4_ = 0.0013981999;
      auVar65._32_4_ = 0.0013981999;
      auVar65._36_4_ = 0.0013981999;
      auVar65._40_4_ = 0.0013981999;
      auVar65._44_4_ = 0.0013981999;
      auVar65._48_4_ = 0.0013981999;
      auVar65._52_4_ = 0.0013981999;
      auVar65._56_4_ = 0.0013981999;
      auVar65._60_4_ = 0.0013981999;
      auVar250 = vfmadd213ps_avx512f(auVar244,auVar66,auVar65);
      auVar64._8_4_ = 0.008333452;
      auVar64._12_4_ = 0.008333452;
      auVar64._0_4_ = 0.008333452;
      auVar64._4_4_ = 0.008333452;
      auVar64._16_4_ = 0.008333452;
      auVar64._20_4_ = 0.008333452;
      auVar64._24_4_ = 0.008333452;
      auVar64._28_4_ = 0.008333452;
      auVar64._32_4_ = 0.008333452;
      auVar64._36_4_ = 0.008333452;
      auVar64._40_4_ = 0.008333452;
      auVar64._44_4_ = 0.008333452;
      auVar64._48_4_ = 0.008333452;
      auVar64._52_4_ = 0.008333452;
      auVar64._56_4_ = 0.008333452;
      auVar64._60_4_ = 0.008333452;
      auVar250 = vfmadd213ps_avx512f(auVar244,auVar250,auVar64);
      auVar63._8_4_ = 0.041665796;
      auVar63._12_4_ = 0.041665796;
      auVar63._0_4_ = 0.041665796;
      auVar63._4_4_ = 0.041665796;
      auVar63._16_4_ = 0.041665796;
      auVar63._20_4_ = 0.041665796;
      auVar63._24_4_ = 0.041665796;
      auVar63._28_4_ = 0.041665796;
      auVar63._32_4_ = 0.041665796;
      auVar63._36_4_ = 0.041665796;
      auVar63._40_4_ = 0.041665796;
      auVar63._44_4_ = 0.041665796;
      auVar63._48_4_ = 0.041665796;
      auVar63._52_4_ = 0.041665796;
      auVar63._56_4_ = 0.041665796;
      auVar63._60_4_ = 0.041665796;
      auVar250 = vfmadd213ps_avx512f(auVar244,auVar250,auVar63);
      auVar62._8_4_ = 0.16666666;
      auVar62._12_4_ = 0.16666666;
      auVar62._0_4_ = 0.16666666;
      auVar62._4_4_ = 0.16666666;
      auVar62._16_4_ = 0.16666666;
      auVar62._20_4_ = 0.16666666;
      auVar62._24_4_ = 0.16666666;
      auVar62._28_4_ = 0.16666666;
      auVar62._32_4_ = 0.16666666;
      auVar62._36_4_ = 0.16666666;
      auVar62._40_4_ = 0.16666666;
      auVar62._44_4_ = 0.16666666;
      auVar62._48_4_ = 0.16666666;
      auVar62._52_4_ = 0.16666666;
      auVar62._56_4_ = 0.16666666;
      auVar62._60_4_ = 0.16666666;
      auVar250 = vfmadd213ps_avx512f(auVar244,auVar250,auVar62);
      auVar61._8_4_ = 0.5;
      auVar61._12_4_ = 0.5;
      auVar61._0_4_ = 0.5;
      auVar61._4_4_ = 0.5;
      auVar61._16_4_ = 0.5;
      auVar61._20_4_ = 0.5;
      auVar61._24_4_ = 0.5;
      auVar61._28_4_ = 0.5;
      auVar61._32_4_ = 0.5;
      auVar61._36_4_ = 0.5;
      auVar61._40_4_ = 0.5;
      auVar61._44_4_ = 0.5;
      auVar61._48_4_ = 0.5;
      auVar61._52_4_ = 0.5;
      auVar61._56_4_ = 0.5;
      auVar61._60_4_ = 0.5;
      auVar250 = vfmadd213ps_avx512f(auVar244,auVar250,auVar61);
      auVar244 = vfmadd213ps_avx512f(auVar245,auVar250,auVar244);
      auVar247._8_4_ = 1.0;
      auVar247._12_4_ = 1.0;
      auVar247._0_4_ = 1.0;
      auVar247._4_4_ = 1.0;
      auVar247._16_4_ = 1.0;
      auVar247._20_4_ = 1.0;
      auVar247._24_4_ = 1.0;
      auVar247._28_4_ = 1.0;
      auVar247._32_4_ = 1.0;
      auVar247._36_4_ = 1.0;
      auVar247._40_4_ = 1.0;
      auVar247._44_4_ = 1.0;
      auVar247._48_4_ = 1.0;
      auVar247._52_4_ = 1.0;
      auVar247._56_4_ = 1.0;
      auVar247._60_4_ = 1.0;
      auVar250 = vaddps_avx512f(auVar244,auVar247);
      auVar99._16_8_ = uStack_9a30;
      auVar99._0_16_ = local_9a40;
      auVar99._24_8_ = uStack_9a28;
      auVar99._32_8_ = uStack_9a20;
      auVar99._40_8_ = uStack_9a18;
      auVar99._48_8_ = uStack_9a10;
      auVar99._56_8_ = uStack_9a08;
      auVar244 = vcvttps2dq_avx512f(auVar99);
      vmovdqa64_avx512f(auVar266);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vmovdqa64_avx512f(auVar245);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vmovdqa64_avx512f(auVar245);
      auVar244 = vpaddd_avx512f(auVar244,auVar245);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vpslld_avx512f(auVar244,ZEXT416(0x17));
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar250 = vmulps_avx512f(auVar250,auVar244);
      local_9b40 = auVar250._0_8_;
      uStack_9b38 = auVar250._8_8_;
      uStack_9b30 = auVar250._16_8_;
      uStack_9b28 = auVar250._24_8_;
      uStack_9b20 = auVar250._32_8_;
      uStack_9b18 = auVar250._40_8_;
      uStack_9b10 = auVar250._48_8_;
      uStack_9b08 = auVar250._56_8_;
      auVar244 = vsubps_avx512f(local_b060[3],auVar248);
      auVar44._8_4_ = 88.37626;
      auVar44._12_4_ = 88.37626;
      auVar44._0_4_ = 88.37626;
      auVar44._4_4_ = 88.37626;
      auVar44._16_4_ = 88.37626;
      auVar44._20_4_ = 88.37626;
      auVar44._24_4_ = 88.37626;
      auVar44._28_4_ = 88.37626;
      auVar44._32_4_ = 88.37626;
      auVar44._36_4_ = 88.37626;
      auVar44._40_4_ = 88.37626;
      auVar44._44_4_ = 88.37626;
      auVar44._48_4_ = 88.37626;
      auVar44._52_4_ = 88.37626;
      auVar44._56_4_ = 88.37626;
      auVar44._60_4_ = 88.37626;
      auVar245 = vminps_avx512f(auVar244,auVar44);
      auVar244._8_4_ = -88.37626;
      auVar244._12_4_ = -88.37626;
      auVar244._0_4_ = -88.37626;
      auVar244._4_4_ = -88.37626;
      auVar244._16_4_ = -88.37626;
      auVar244._20_4_ = -88.37626;
      auVar244._24_4_ = -88.37626;
      auVar244._28_4_ = -88.37626;
      auVar244._32_4_ = -88.37626;
      auVar244._36_4_ = -88.37626;
      auVar244._40_4_ = -88.37626;
      auVar244._44_4_ = -88.37626;
      auVar244._48_4_ = -88.37626;
      auVar244._52_4_ = -88.37626;
      auVar244._56_4_ = -88.37626;
      auVar244._60_4_ = -88.37626;
      auVar245 = vmaxps_avx512f(auVar245,auVar244);
      auVar76._8_4_ = 1.442695;
      auVar76._12_4_ = 1.442695;
      auVar76._0_4_ = 1.442695;
      auVar76._4_4_ = 1.442695;
      auVar76._16_4_ = 1.442695;
      auVar76._20_4_ = 1.442695;
      auVar76._24_4_ = 1.442695;
      auVar76._28_4_ = 1.442695;
      auVar76._32_4_ = 1.442695;
      auVar76._36_4_ = 1.442695;
      auVar76._40_4_ = 1.442695;
      auVar76._44_4_ = 1.442695;
      auVar76._48_4_ = 1.442695;
      auVar76._52_4_ = 1.442695;
      auVar76._56_4_ = 1.442695;
      auVar76._60_4_ = 1.442695;
      auVar75._8_4_ = 0.5;
      auVar75._12_4_ = 0.5;
      auVar75._0_4_ = 0.5;
      auVar75._4_4_ = 0.5;
      auVar75._16_4_ = 0.5;
      auVar75._20_4_ = 0.5;
      auVar75._24_4_ = 0.5;
      auVar75._28_4_ = 0.5;
      auVar75._32_4_ = 0.5;
      auVar75._36_4_ = 0.5;
      auVar75._40_4_ = 0.5;
      auVar75._44_4_ = 0.5;
      auVar75._48_4_ = 0.5;
      auVar75._52_4_ = 0.5;
      auVar75._56_4_ = 0.5;
      auVar75._60_4_ = 0.5;
      auVar244 = vfmadd213ps_avx512f(auVar76,auVar245,auVar75);
      auVar251 = vrndscaleps_avx512f(auVar244,1);
      uVar22 = vcmpps_avx512f(auVar244,auVar251,1);
      uVar23 = (ushort)uVar22;
      auVar80._8_4_ = 1.0;
      auVar80._12_4_ = 1.0;
      auVar80._0_4_ = 1.0;
      auVar80._4_4_ = 1.0;
      auVar80._16_4_ = 1.0;
      auVar80._20_4_ = 1.0;
      auVar80._24_4_ = 1.0;
      auVar80._28_4_ = 1.0;
      auVar80._32_4_ = 1.0;
      auVar80._36_4_ = 1.0;
      auVar80._40_4_ = 1.0;
      auVar80._44_4_ = 1.0;
      auVar80._48_4_ = 1.0;
      auVar80._52_4_ = 1.0;
      auVar80._56_4_ = 1.0;
      auVar80._60_4_ = 1.0;
      local_4b40 = auVar251._0_4_;
      iStack_4b3c = auVar251._4_4_;
      iStack_4b38 = auVar251._8_4_;
      iStack_4b34 = auVar251._12_4_;
      iStack_4b30 = auVar251._16_4_;
      iStack_4b2c = auVar251._20_4_;
      iStack_4b28 = auVar251._24_4_;
      iStack_4b24 = auVar251._28_4_;
      iStack_4b20 = auVar251._32_4_;
      iStack_4b1c = auVar251._36_4_;
      iStack_4b18 = auVar251._40_4_;
      iStack_4b14 = auVar251._44_4_;
      iStack_4b10 = auVar251._48_4_;
      iStack_4b0c = auVar251._52_4_;
      iStack_4b08 = auVar251._56_4_;
      iStack_4b04 = auVar251._60_4_;
      auVar244 = vsubps_avx512f(auVar251,auVar80);
      bVar2 = (bool)((byte)uVar22 & 1);
      bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar23 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar23 >> 3) & 1);
      bVar6 = (bool)((byte)(uVar23 >> 4) & 1);
      bVar7 = (bool)((byte)(uVar23 >> 5) & 1);
      bVar8 = (bool)((byte)(uVar23 >> 6) & 1);
      bVar9 = (bool)((byte)(uVar23 >> 7) & 1);
      bVar10 = (byte)((ulong)uVar22 >> 8);
      bVar11 = (bool)(bVar10 >> 1 & 1);
      bVar12 = (bool)(bVar10 >> 2 & 1);
      bVar13 = (bool)(bVar10 >> 3 & 1);
      bVar14 = (bool)(bVar10 >> 4 & 1);
      bVar15 = (bool)(bVar10 >> 5 & 1);
      bVar16 = (bool)(bVar10 >> 6 & 1);
      local_9cc0._4_4_ = (uint)bVar3 * auVar244._4_4_ | (uint)!bVar3 * iStack_4b3c;
      local_9cc0._0_4_ = (uint)bVar2 * auVar244._0_4_ | (uint)!bVar2 * local_4b40;
      local_9cc0._8_4_ = (uint)bVar4 * auVar244._8_4_ | (uint)!bVar4 * iStack_4b38;
      local_9cc0._12_4_ = (uint)bVar5 * auVar244._12_4_ | (uint)!bVar5 * iStack_4b34;
      uStack_9cb0._0_4_ = (uint)bVar6 * auVar244._16_4_ | (uint)!bVar6 * iStack_4b30;
      uStack_9cb0._4_4_ = (uint)bVar7 * auVar244._20_4_ | (uint)!bVar7 * iStack_4b2c;
      uStack_9ca8._0_4_ = (uint)bVar8 * auVar244._24_4_ | (uint)!bVar8 * iStack_4b28;
      uStack_9ca8._4_4_ = (uint)bVar9 * auVar244._28_4_ | (uint)!bVar9 * iStack_4b24;
      auVar257 = _local_9cc0;
      uStack_9ca0._0_4_ =
           (uint)(bVar10 & 1) * auVar244._32_4_ | (uint)!(bool)(bVar10 & 1) * iStack_4b20;
      uStack_9ca0._4_4_ = (uint)bVar11 * auVar244._36_4_ | (uint)!bVar11 * iStack_4b1c;
      auVar236 = _local_9cc0;
      uStack_9c98._0_4_ = (uint)bVar12 * auVar244._40_4_ | (uint)!bVar12 * iStack_4b18;
      uStack_9c98._4_4_ = (uint)bVar13 * auVar244._44_4_ | (uint)!bVar13 * iStack_4b14;
      auVar237 = _local_9cc0;
      uStack_9c90._0_4_ = (uint)bVar14 * auVar244._48_4_ | (uint)!bVar14 * iStack_4b10;
      uStack_9c90._4_4_ = (uint)bVar15 * auVar244._52_4_ | (uint)!bVar15 * iStack_4b0c;
      auVar234 = _local_9cc0;
      uStack_9c88._0_4_ = (uint)bVar16 * auVar244._56_4_ | (uint)!bVar16 * iStack_4b08;
      uStack_9c88._4_4_ =
           (uint)(bVar10 >> 7) * auVar244._60_4_ | (uint)!(bool)(bVar10 >> 7) * iStack_4b04;
      auVar244 = _local_9cc0;
      uStack_9ca8 = auVar257._24_8_;
      uStack_9ca0 = auVar236._32_8_;
      uStack_9c98 = auVar237._40_8_;
      uStack_9c90 = auVar234._48_8_;
      uStack_9c88 = auVar244._56_8_;
      auVar96._16_8_ = uStack_9cb0;
      auVar96._0_16_ = local_9cc0;
      auVar96._24_8_ = uStack_9ca8;
      auVar96._32_8_ = uStack_9ca0;
      auVar96._40_8_ = uStack_9c98;
      auVar96._48_8_ = uStack_9c90;
      auVar96._56_8_ = uStack_9c88;
      auVar95._8_4_ = 0.6933594;
      auVar95._12_4_ = 0.6933594;
      auVar95._0_4_ = 0.6933594;
      auVar95._4_4_ = 0.6933594;
      auVar95._16_4_ = 0.6933594;
      auVar95._20_4_ = 0.6933594;
      auVar95._24_4_ = 0.6933594;
      auVar95._28_4_ = 0.6933594;
      auVar95._32_4_ = 0.6933594;
      auVar95._36_4_ = 0.6933594;
      auVar95._40_4_ = 0.6933594;
      auVar95._44_4_ = 0.6933594;
      auVar95._48_4_ = 0.6933594;
      auVar95._52_4_ = 0.6933594;
      auVar95._56_4_ = 0.6933594;
      auVar95._60_4_ = 0.6933594;
      auVar244 = vfnmadd213ps_avx512f(auVar95,auVar96,auVar245);
      auVar94._16_8_ = uStack_9cb0;
      auVar94._0_16_ = local_9cc0;
      auVar94._24_8_ = uStack_9ca8;
      auVar94._32_8_ = uStack_9ca0;
      auVar94._40_8_ = uStack_9c98;
      auVar94._48_8_ = uStack_9c90;
      auVar94._56_8_ = uStack_9c88;
      auVar93._8_4_ = -0.00021219444;
      auVar93._12_4_ = -0.00021219444;
      auVar93._0_4_ = -0.00021219444;
      auVar93._4_4_ = -0.00021219444;
      auVar93._16_4_ = -0.00021219444;
      auVar93._20_4_ = -0.00021219444;
      auVar93._24_4_ = -0.00021219444;
      auVar93._28_4_ = -0.00021219444;
      auVar93._32_4_ = -0.00021219444;
      auVar93._36_4_ = -0.00021219444;
      auVar93._40_4_ = -0.00021219444;
      auVar93._44_4_ = -0.00021219444;
      auVar93._48_4_ = -0.00021219444;
      auVar93._52_4_ = -0.00021219444;
      auVar93._56_4_ = -0.00021219444;
      auVar93._60_4_ = -0.00021219444;
      auVar244 = vfnmadd213ps_avx512f(auVar93,auVar94,auVar244);
      auVar245 = vmulps_avx512f(auVar244,auVar244);
      uStack_9db8._0_4_ = 0.00019875691;
      uStack_9db8._4_4_ = 0.00019875691;
      local_9dc0._0_4_ = 0.00019875691;
      local_9dc0._4_4_ = 0.00019875691;
      auVar74._16_4_ = 0.00019875691;
      auVar74._20_4_ = 0.00019875691;
      auVar74._0_16_ = _local_9dc0;
      auVar74._24_4_ = 0.00019875691;
      auVar74._28_4_ = 0.00019875691;
      auVar74._32_4_ = 0.00019875691;
      auVar74._36_4_ = 0.00019875691;
      auVar74._40_4_ = 0.00019875691;
      auVar74._44_4_ = 0.00019875691;
      auVar74._48_4_ = 0.00019875691;
      auVar74._52_4_ = 0.00019875691;
      auVar74._56_4_ = 0.00019875691;
      auVar74._60_4_ = 0.00019875691;
      auVar73._8_4_ = 0.0013981999;
      auVar73._12_4_ = 0.0013981999;
      auVar73._0_4_ = 0.0013981999;
      auVar73._4_4_ = 0.0013981999;
      auVar73._16_4_ = 0.0013981999;
      auVar73._20_4_ = 0.0013981999;
      auVar73._24_4_ = 0.0013981999;
      auVar73._28_4_ = 0.0013981999;
      auVar73._32_4_ = 0.0013981999;
      auVar73._36_4_ = 0.0013981999;
      auVar73._40_4_ = 0.0013981999;
      auVar73._44_4_ = 0.0013981999;
      auVar73._48_4_ = 0.0013981999;
      auVar73._52_4_ = 0.0013981999;
      auVar73._56_4_ = 0.0013981999;
      auVar73._60_4_ = 0.0013981999;
      auVar251 = vfmadd213ps_avx512f(auVar244,auVar74,auVar73);
      auVar72._8_4_ = 0.008333452;
      auVar72._12_4_ = 0.008333452;
      auVar72._0_4_ = 0.008333452;
      auVar72._4_4_ = 0.008333452;
      auVar72._16_4_ = 0.008333452;
      auVar72._20_4_ = 0.008333452;
      auVar72._24_4_ = 0.008333452;
      auVar72._28_4_ = 0.008333452;
      auVar72._32_4_ = 0.008333452;
      auVar72._36_4_ = 0.008333452;
      auVar72._40_4_ = 0.008333452;
      auVar72._44_4_ = 0.008333452;
      auVar72._48_4_ = 0.008333452;
      auVar72._52_4_ = 0.008333452;
      auVar72._56_4_ = 0.008333452;
      auVar72._60_4_ = 0.008333452;
      auVar251 = vfmadd213ps_avx512f(auVar244,auVar251,auVar72);
      auVar71._8_4_ = 0.041665796;
      auVar71._12_4_ = 0.041665796;
      auVar71._0_4_ = 0.041665796;
      auVar71._4_4_ = 0.041665796;
      auVar71._16_4_ = 0.041665796;
      auVar71._20_4_ = 0.041665796;
      auVar71._24_4_ = 0.041665796;
      auVar71._28_4_ = 0.041665796;
      auVar71._32_4_ = 0.041665796;
      auVar71._36_4_ = 0.041665796;
      auVar71._40_4_ = 0.041665796;
      auVar71._44_4_ = 0.041665796;
      auVar71._48_4_ = 0.041665796;
      auVar71._52_4_ = 0.041665796;
      auVar71._56_4_ = 0.041665796;
      auVar71._60_4_ = 0.041665796;
      auVar251 = vfmadd213ps_avx512f(auVar244,auVar251,auVar71);
      auVar70._8_4_ = 0.16666666;
      auVar70._12_4_ = 0.16666666;
      auVar70._0_4_ = 0.16666666;
      auVar70._4_4_ = 0.16666666;
      auVar70._16_4_ = 0.16666666;
      auVar70._20_4_ = 0.16666666;
      auVar70._24_4_ = 0.16666666;
      auVar70._28_4_ = 0.16666666;
      auVar70._32_4_ = 0.16666666;
      auVar70._36_4_ = 0.16666666;
      auVar70._40_4_ = 0.16666666;
      auVar70._44_4_ = 0.16666666;
      auVar70._48_4_ = 0.16666666;
      auVar70._52_4_ = 0.16666666;
      auVar70._56_4_ = 0.16666666;
      auVar70._60_4_ = 0.16666666;
      auVar251 = vfmadd213ps_avx512f(auVar244,auVar251,auVar70);
      auVar69._8_4_ = 0.5;
      auVar69._12_4_ = 0.5;
      auVar69._0_4_ = 0.5;
      auVar69._4_4_ = 0.5;
      auVar69._16_4_ = 0.5;
      auVar69._20_4_ = 0.5;
      auVar69._24_4_ = 0.5;
      auVar69._28_4_ = 0.5;
      auVar69._32_4_ = 0.5;
      auVar69._36_4_ = 0.5;
      auVar69._40_4_ = 0.5;
      auVar69._44_4_ = 0.5;
      auVar69._48_4_ = 0.5;
      auVar69._52_4_ = 0.5;
      auVar69._56_4_ = 0.5;
      auVar69._60_4_ = 0.5;
      auVar251 = vfmadd213ps_avx512f(auVar244,auVar251,auVar69);
      auVar244 = vfmadd213ps_avx512f(auVar245,auVar251,auVar244);
      auVar248._8_4_ = 1.0;
      auVar248._12_4_ = 1.0;
      auVar248._0_4_ = 1.0;
      auVar248._4_4_ = 1.0;
      auVar248._16_4_ = 1.0;
      auVar248._20_4_ = 1.0;
      auVar248._24_4_ = 1.0;
      auVar248._28_4_ = 1.0;
      auVar248._32_4_ = 1.0;
      auVar248._36_4_ = 1.0;
      auVar248._40_4_ = 1.0;
      auVar248._44_4_ = 1.0;
      auVar248._48_4_ = 1.0;
      auVar248._52_4_ = 1.0;
      auVar248._56_4_ = 1.0;
      auVar248._60_4_ = 1.0;
      auVar251 = vaddps_avx512f(auVar244,auVar248);
      auVar100._16_8_ = uStack_9cb0;
      auVar100._0_16_ = local_9cc0;
      auVar100._24_8_ = uStack_9ca8;
      auVar100._32_8_ = uStack_9ca0;
      auVar100._40_8_ = uStack_9c98;
      auVar100._48_8_ = uStack_9c90;
      auVar100._56_8_ = uStack_9c88;
      auVar244 = vcvttps2dq_avx512f(auVar100);
      vmovdqa64_avx512f(auVar266);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vmovdqa64_avx512f(auVar245);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar245 = vmovdqa64_avx512f(auVar245);
      auVar244 = vpaddd_avx512f(auVar244,auVar245);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vpslld_avx512f(auVar244,ZEXT416(0x17));
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmulps_avx512f(auVar251,auVar244);
      local_9dc0 = auVar244._0_8_;
      uStack_9db8 = auVar244._8_8_;
      uStack_9db0 = auVar244._16_8_;
      uStack_9da8 = auVar244._24_8_;
      uStack_9da0 = auVar244._32_8_;
      uStack_9d98 = auVar244._40_8_;
      uStack_9d90 = auVar244._48_8_;
      uStack_9d88 = auVar244._56_8_;
      *(undefined1 (*) [8])*local_b060 = local_9640;
      *(undefined8 *)(*local_b060 + 8) = uStack_9638;
      *(undefined8 *)(*local_b060 + 0x10) = uStack_9630;
      *(undefined8 *)(*local_b060 + 0x18) = uStack_9628;
      *(undefined8 *)(*local_b060 + 0x20) = uStack_9620;
      *(undefined8 *)(*local_b060 + 0x28) = uStack_9618;
      *(undefined8 *)(*local_b060 + 0x30) = uStack_9610;
      *(undefined8 *)(*local_b060 + 0x38) = uStack_9608;
      *(undefined1 (*) [8])local_b060[1] = local_98c0;
      *(undefined8 *)(local_b060[1] + 8) = uStack_98b8;
      *(undefined8 *)(local_b060[1] + 0x10) = uStack_98b0;
      *(undefined8 *)(local_b060[1] + 0x18) = uStack_98a8;
      *(undefined8 *)(local_b060[1] + 0x20) = uStack_98a0;
      *(undefined8 *)(local_b060[1] + 0x28) = uStack_9898;
      *(undefined8 *)(local_b060[1] + 0x30) = uStack_9890;
      *(undefined8 *)(local_b060[1] + 0x38) = uStack_9888;
      *(undefined1 (*) [8])local_b060[2] = local_9b40;
      *(undefined8 *)(local_b060[2] + 8) = uStack_9b38;
      *(undefined8 *)(local_b060[2] + 0x10) = uStack_9b30;
      *(undefined8 *)(local_b060[2] + 0x18) = uStack_9b28;
      *(undefined8 *)(local_b060[2] + 0x20) = uStack_9b20;
      *(undefined8 *)(local_b060[2] + 0x28) = uStack_9b18;
      *(undefined8 *)(local_b060[2] + 0x30) = uStack_9b10;
      *(undefined8 *)(local_b060[2] + 0x38) = uStack_9b08;
      *(undefined1 (*) [8])local_b060[3] = local_9dc0;
      *(undefined8 *)(local_b060[3] + 8) = uStack_9db8;
      *(undefined8 *)(local_b060[3] + 0x10) = uStack_9db0;
      *(undefined8 *)(local_b060[3] + 0x18) = uStack_9da8;
      *(undefined8 *)(local_b060[3] + 0x20) = uStack_9da0;
      *(undefined8 *)(local_b060[3] + 0x28) = uStack_9d98;
      *(undefined8 *)(local_b060[3] + 0x30) = uStack_9d90;
      *(undefined8 *)(local_b060[3] + 0x38) = uStack_9d88;
      auVar245 = vunpcklps_avx512f(auVar249,auVar246);
      auVar246 = vunpckhps_avx512f(auVar249,auVar246);
      auVar249 = vunpcklps_avx512f(auVar250,auVar244);
      auVar244 = vunpckhps_avx512f(auVar250,auVar244);
      auVar245 = vaddps_avx512f(auVar245,auVar246);
      auVar244 = vaddps_avx512f(auVar249,auVar244);
      auVar246 = vunpcklps_avx512f(auVar245,auVar244);
      auVar244 = vunpckhps_avx512f(auVar245,auVar244);
      auVar245 = vaddps_avx512f(auVar246,auVar244);
      auVar244 = vmovdqa64_avx512f(auVar243);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vmovdqa64_avx512f(auVar244);
      auVar244 = vpermps_avx512f(auVar244,auVar245);
      auVar244 = vaddps_avx512f(*local_b070,auVar244);
      local_b600 = auVar244._0_8_;
      uStack_b5f8 = auVar244._8_8_;
      uStack_b5f0 = auVar244._16_8_;
      uStack_b5e8 = auVar244._24_8_;
      uStack_b5e0 = auVar244._32_8_;
      uStack_b5d8 = auVar244._40_8_;
      uStack_b5d0 = auVar244._48_8_;
      uStack_b5c8 = auVar244._56_8_;
      *(undefined8 *)*local_b070 = local_b600;
      *(undefined8 *)(*local_b070 + 8) = uStack_b5f8;
      *(undefined8 *)(*local_b070 + 0x10) = uStack_b5f0;
      *(undefined8 *)(*local_b070 + 0x18) = uStack_b5e8;
      *(undefined8 *)(*local_b070 + 0x20) = uStack_b5e0;
      *(undefined8 *)(*local_b070 + 0x28) = uStack_b5d8;
      *(undefined8 *)(*local_b070 + 0x30) = uStack_b5d0;
      *(undefined8 *)(*local_b070 + 0x38) = uStack_b5c8;
      local_b060 = local_b060 + 4;
      local_b068 = local_b068 + 1;
      local_b070 = local_b070 + 1;
    }
    for (; local_b074 + 7 < local_aa54; local_b074 = local_b074 + 8) {
      uVar1 = *(undefined4 *)*local_b068;
      auVar27._4_4_ = uVar1;
      auVar27._0_4_ = uVar1;
      auVar27._12_4_ = uVar1;
      auVar27._8_4_ = uVar1;
      uVar1 = *(undefined4 *)(*local_b068 + 4);
      auVar27._20_4_ = uVar1;
      auVar27._16_4_ = uVar1;
      auVar27._28_4_ = uVar1;
      auVar27._24_4_ = uVar1;
      auVar257 = vsubps_avx(*(undefined1 (*) [32])*local_b060,auVar27);
      auVar101._8_4_ = 0x42b0c0a5;
      auVar101._0_8_ = 0x42b0c0a542b0c0a5;
      auVar101._12_4_ = 0x42b0c0a5;
      auVar101._16_4_ = 0x42b0c0a5;
      auVar101._20_4_ = 0x42b0c0a5;
      auVar101._24_4_ = 0x42b0c0a5;
      auVar101._28_4_ = 0x42b0c0a5;
      auVar257 = vminps_avx(auVar257,auVar101);
      auVar31._8_4_ = 0xc2b0c0a5;
      auVar31._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar31._12_4_ = 0xc2b0c0a5;
      auVar31._16_4_ = 0xc2b0c0a5;
      auVar31._20_4_ = 0xc2b0c0a5;
      auVar31._24_4_ = 0xc2b0c0a5;
      auVar31._28_4_ = 0xc2b0c0a5;
      auVar253 = vmaxps_avx(auVar257,auVar31);
      auVar131._8_4_ = 1.442695;
      auVar131._12_4_ = 1.442695;
      auVar131._0_4_ = 1.442695;
      auVar131._4_4_ = 1.442695;
      auVar131._16_4_ = 1.442695;
      auVar131._20_4_ = 1.442695;
      auVar131._24_4_ = 1.442695;
      auVar131._28_4_ = 1.442695;
      auVar130._8_4_ = 0.5;
      auVar130._12_4_ = 0.5;
      auVar130._0_4_ = 0.5;
      auVar130._4_4_ = 0.5;
      auVar130._16_4_ = 0.5;
      auVar130._20_4_ = 0.5;
      auVar130._24_4_ = 0.5;
      auVar130._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar131,auVar253,auVar130);
      auVar258 = vroundps_avx(ZEXT1632(auVar18),1);
      auVar257 = vcmpps_avx(ZEXT1632(auVar18),auVar258,1);
      auVar105._8_8_ = 0x3f8000003f800000;
      auVar105._0_8_ = 0x3f8000003f800000;
      auVar105._16_8_ = 0x3f8000003f800000;
      auVar105._24_8_ = 0x3f8000003f800000;
      auVar257 = vpand_avx2(auVar257,auVar105);
      auVar257 = vsubps_avx(auVar258,auVar257);
      auVar143._8_4_ = 0.6933594;
      auVar143._12_4_ = 0.6933594;
      auVar143._0_4_ = 0.6933594;
      auVar143._4_4_ = 0.6933594;
      auVar143._16_4_ = 0.6933594;
      auVar143._20_4_ = 0.6933594;
      auVar143._24_4_ = 0.6933594;
      auVar143._28_4_ = 0.6933594;
      auVar18 = vfnmadd213ps_fma(auVar143,auVar257,auVar253);
      auVar144._8_4_ = -0.00021219444;
      auVar144._12_4_ = -0.00021219444;
      auVar144._0_4_ = -0.00021219444;
      auVar144._4_4_ = -0.00021219444;
      auVar144._16_4_ = -0.00021219444;
      auVar144._20_4_ = -0.00021219444;
      auVar144._24_4_ = -0.00021219444;
      auVar144._28_4_ = -0.00021219444;
      auVar18 = vfnmadd213ps_fma(auVar144,auVar257,ZEXT1632(auVar18));
      auVar253 = ZEXT1632(auVar18);
      local_6f60 = auVar18._0_4_;
      fStack_6f5c = auVar18._4_4_;
      fStack_6f58 = auVar18._8_4_;
      fStack_6f54 = auVar18._12_4_;
      _local_8440 = ZEXT1632(CONCAT412(fStack_6f54 * fStack_6f54,
                                       CONCAT48(fStack_6f58 * fStack_6f58,
                                                CONCAT44(fStack_6f5c * fStack_6f5c,
                                                         local_6f60 * local_6f60))));
      uStack_84d8._0_4_ = 0x39506967;
      local_84e0 = (undefined1  [8])0x3950696739506967;
      uStack_84d8._4_4_ = 0x39506967;
      uStack_84d0._0_4_ = 0x39506967;
      uStack_84d0._4_4_ = 0x39506967;
      uStack_84c8._0_4_ = 0x39506967;
      uStack_84c8._4_4_ = 0x39506967;
      auVar132._8_4_ = 0.0013981999;
      auVar132._12_4_ = 0.0013981999;
      auVar132._0_4_ = 0.0013981999;
      auVar132._4_4_ = 0.0013981999;
      auVar132._16_4_ = 0.0013981999;
      auVar132._20_4_ = 0.0013981999;
      auVar132._24_4_ = 0.0013981999;
      auVar132._28_4_ = 0.0013981999;
      auVar18 = vfmadd213ps_fma(auVar253,_local_84e0,auVar132);
      auVar133._8_4_ = 0.008333452;
      auVar133._12_4_ = 0.008333452;
      auVar133._0_4_ = 0.008333452;
      auVar133._4_4_ = 0.008333452;
      auVar133._16_4_ = 0.008333452;
      auVar133._20_4_ = 0.008333452;
      auVar133._24_4_ = 0.008333452;
      auVar133._28_4_ = 0.008333452;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar133);
      auVar134._8_4_ = 0.041665796;
      auVar134._12_4_ = 0.041665796;
      auVar134._0_4_ = 0.041665796;
      auVar134._4_4_ = 0.041665796;
      auVar134._16_4_ = 0.041665796;
      auVar134._20_4_ = 0.041665796;
      auVar134._24_4_ = 0.041665796;
      auVar134._28_4_ = 0.041665796;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar134);
      auVar135._8_4_ = 0.16666666;
      auVar135._12_4_ = 0.16666666;
      auVar135._0_4_ = 0.16666666;
      auVar135._4_4_ = 0.16666666;
      auVar135._16_4_ = 0.16666666;
      auVar135._20_4_ = 0.16666666;
      auVar135._24_4_ = 0.16666666;
      auVar135._28_4_ = 0.16666666;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar135);
      auVar136._8_4_ = 0.5;
      auVar136._12_4_ = 0.5;
      auVar136._0_4_ = 0.5;
      auVar136._4_4_ = 0.5;
      auVar136._16_4_ = 0.5;
      auVar136._20_4_ = 0.5;
      auVar136._24_4_ = 0.5;
      auVar136._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar136);
      auVar18 = vfmadd213ps_fma(_local_8440,ZEXT1632(auVar18),auVar253);
      local_80a0 = auVar18._0_4_;
      fStack_809c = auVar18._4_4_;
      fStack_8098 = auVar18._8_4_;
      fStack_8094 = auVar18._12_4_;
      local_37a0 = auVar257._0_4_;
      fStack_379c = auVar257._4_4_;
      fStack_3798 = auVar257._8_4_;
      fStack_3794 = auVar257._12_4_;
      fStack_3790 = auVar257._16_4_;
      fStack_378c = auVar257._20_4_;
      fStack_3788 = auVar257._24_4_;
      fStack_3784 = auVar257._28_4_;
      local_8480._4_4_ = (int)fStack_379c;
      local_8480._0_4_ = (int)local_37a0;
      local_8480._8_4_ = (int)fStack_3798;
      local_8480._12_4_ = (int)fStack_3794;
      uStack_8470._0_4_ = (int)fStack_3790;
      uStack_8470._4_4_ = (int)fStack_378c;
      uStack_8468._0_4_ = (int)fStack_3788;
      uStack_8468._4_4_ = (int)fStack_3784;
      auVar257 = _local_8480;
      uStack_8468 = auVar257._24_8_;
      auVar152._16_8_ = uStack_8470;
      auVar152._0_16_ = local_8480;
      auVar152._24_8_ = uStack_8468;
      auVar151._8_8_ = 0x7f0000007f;
      auVar151._0_8_ = 0x7f0000007f;
      auVar151._16_8_ = 0x7f0000007f;
      auVar151._24_8_ = 0x7f0000007f;
      auVar257 = vpaddd_avx2(auVar152,auVar151);
      auVar257 = vpslld_avx2(auVar257,ZEXT416(0x17));
      local_6fc0 = auVar257._0_4_;
      fStack_6fbc = auVar257._4_4_;
      fStack_6fb8 = auVar257._8_4_;
      fStack_6fb4 = auVar257._12_4_;
      fStack_6fb0 = auVar257._16_4_;
      fStack_6fac = auVar257._20_4_;
      fStack_6fa8 = auVar257._24_4_;
      local_84e0._4_4_ = (fStack_809c + 1.0) * fStack_6fbc;
      local_84e0._0_4_ = (local_80a0 + 1.0) * local_6fc0;
      uStack_84d8._0_4_ = (fStack_8098 + 1.0) * fStack_6fb8;
      uStack_84d8._4_4_ = (fStack_8094 + 1.0) * fStack_6fb4;
      uStack_84d0._0_4_ = fStack_6fb0 * 1.0;
      uStack_84d0._4_4_ = fStack_6fac * 1.0;
      auVar235 = _local_84e0;
      uStack_84c8._0_4_ = fStack_6fa8 * 1.0;
      uStack_84c8._4_4_ = 0x3f800000;
      auVar257 = _local_84e0;
      uStack_84d0 = auVar235._16_8_;
      uStack_84c8 = auVar257._24_8_;
      uVar1 = *(undefined4 *)(*local_b068 + 8);
      auVar26._4_4_ = uVar1;
      auVar26._0_4_ = uVar1;
      auVar26._12_4_ = uVar1;
      auVar26._8_4_ = uVar1;
      uVar1 = *(undefined4 *)(*local_b068 + 0xc);
      auVar26._20_4_ = uVar1;
      auVar26._16_4_ = uVar1;
      auVar26._28_4_ = uVar1;
      auVar26._24_4_ = uVar1;
      auVar257 = vsubps_avx(*(undefined1 (*) [32])(*local_b060 + 0x20),auVar26);
      auVar102._8_4_ = 0x42b0c0a5;
      auVar102._0_8_ = 0x42b0c0a542b0c0a5;
      auVar102._12_4_ = 0x42b0c0a5;
      auVar102._16_4_ = 0x42b0c0a5;
      auVar102._20_4_ = 0x42b0c0a5;
      auVar102._24_4_ = 0x42b0c0a5;
      auVar102._28_4_ = 0x42b0c0a5;
      auVar257 = vminps_avx(auVar257,auVar102);
      auVar30._8_4_ = 0xc2b0c0a5;
      auVar30._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar30._12_4_ = 0xc2b0c0a5;
      auVar30._16_4_ = 0xc2b0c0a5;
      auVar30._20_4_ = 0xc2b0c0a5;
      auVar30._24_4_ = 0xc2b0c0a5;
      auVar30._28_4_ = 0xc2b0c0a5;
      auVar253 = vmaxps_avx(auVar257,auVar30);
      auVar124._8_4_ = 1.442695;
      auVar124._12_4_ = 1.442695;
      auVar124._0_4_ = 1.442695;
      auVar124._4_4_ = 1.442695;
      auVar124._16_4_ = 1.442695;
      auVar124._20_4_ = 1.442695;
      auVar124._24_4_ = 1.442695;
      auVar124._28_4_ = 1.442695;
      auVar123._8_4_ = 0.5;
      auVar123._12_4_ = 0.5;
      auVar123._0_4_ = 0.5;
      auVar123._4_4_ = 0.5;
      auVar123._16_4_ = 0.5;
      auVar123._20_4_ = 0.5;
      auVar123._24_4_ = 0.5;
      auVar123._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar124,auVar253,auVar123);
      auVar258 = vroundps_avx(ZEXT1632(auVar18),1);
      auVar257 = vcmpps_avx(ZEXT1632(auVar18),auVar258,1);
      auVar106._8_8_ = 0x3f8000003f800000;
      auVar106._0_8_ = 0x3f8000003f800000;
      auVar106._16_8_ = 0x3f8000003f800000;
      auVar106._24_8_ = 0x3f8000003f800000;
      auVar257 = vpand_avx2(auVar257,auVar106);
      auVar257 = vsubps_avx(auVar258,auVar257);
      auVar141._8_4_ = 0.6933594;
      auVar141._12_4_ = 0.6933594;
      auVar141._0_4_ = 0.6933594;
      auVar141._4_4_ = 0.6933594;
      auVar141._16_4_ = 0.6933594;
      auVar141._20_4_ = 0.6933594;
      auVar141._24_4_ = 0.6933594;
      auVar141._28_4_ = 0.6933594;
      auVar18 = vfnmadd213ps_fma(auVar141,auVar257,auVar253);
      auVar142._8_4_ = -0.00021219444;
      auVar142._12_4_ = -0.00021219444;
      auVar142._0_4_ = -0.00021219444;
      auVar142._4_4_ = -0.00021219444;
      auVar142._16_4_ = -0.00021219444;
      auVar142._20_4_ = -0.00021219444;
      auVar142._24_4_ = -0.00021219444;
      auVar142._28_4_ = -0.00021219444;
      auVar18 = vfnmadd213ps_fma(auVar142,auVar257,ZEXT1632(auVar18));
      auVar253 = ZEXT1632(auVar18);
      local_6ee0 = auVar18._0_4_;
      fStack_6edc = auVar18._4_4_;
      fStack_6ed8 = auVar18._8_4_;
      fStack_6ed4 = auVar18._12_4_;
      _local_85c0 = ZEXT1632(CONCAT412(fStack_6ed4 * fStack_6ed4,
                                       CONCAT48(fStack_6ed8 * fStack_6ed8,
                                                CONCAT44(fStack_6edc * fStack_6edc,
                                                         local_6ee0 * local_6ee0))));
      uStack_8658._0_4_ = 0x39506967;
      local_8660 = (undefined1  [8])0x3950696739506967;
      uStack_8658._4_4_ = 0x39506967;
      uStack_8650._0_4_ = 0x39506967;
      uStack_8650._4_4_ = 0x39506967;
      uStack_8648._0_4_ = 0x39506967;
      uStack_8648._4_4_ = 0x39506967;
      auVar125._8_4_ = 0.0013981999;
      auVar125._12_4_ = 0.0013981999;
      auVar125._0_4_ = 0.0013981999;
      auVar125._4_4_ = 0.0013981999;
      auVar125._16_4_ = 0.0013981999;
      auVar125._20_4_ = 0.0013981999;
      auVar125._24_4_ = 0.0013981999;
      auVar125._28_4_ = 0.0013981999;
      auVar18 = vfmadd213ps_fma(auVar253,_local_8660,auVar125);
      auVar126._8_4_ = 0.008333452;
      auVar126._12_4_ = 0.008333452;
      auVar126._0_4_ = 0.008333452;
      auVar126._4_4_ = 0.008333452;
      auVar126._16_4_ = 0.008333452;
      auVar126._20_4_ = 0.008333452;
      auVar126._24_4_ = 0.008333452;
      auVar126._28_4_ = 0.008333452;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar126);
      auVar127._8_4_ = 0.041665796;
      auVar127._12_4_ = 0.041665796;
      auVar127._0_4_ = 0.041665796;
      auVar127._4_4_ = 0.041665796;
      auVar127._16_4_ = 0.041665796;
      auVar127._20_4_ = 0.041665796;
      auVar127._24_4_ = 0.041665796;
      auVar127._28_4_ = 0.041665796;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar127);
      auVar128._8_4_ = 0.16666666;
      auVar128._12_4_ = 0.16666666;
      auVar128._0_4_ = 0.16666666;
      auVar128._4_4_ = 0.16666666;
      auVar128._16_4_ = 0.16666666;
      auVar128._20_4_ = 0.16666666;
      auVar128._24_4_ = 0.16666666;
      auVar128._28_4_ = 0.16666666;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar128);
      auVar129._8_4_ = 0.5;
      auVar129._12_4_ = 0.5;
      auVar129._0_4_ = 0.5;
      auVar129._4_4_ = 0.5;
      auVar129._16_4_ = 0.5;
      auVar129._20_4_ = 0.5;
      auVar129._24_4_ = 0.5;
      auVar129._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar129);
      auVar18 = vfmadd213ps_fma(_local_85c0,ZEXT1632(auVar18),auVar253);
      local_8060 = auVar18._0_4_;
      fStack_805c = auVar18._4_4_;
      fStack_8058 = auVar18._8_4_;
      fStack_8054 = auVar18._12_4_;
      local_3780 = auVar257._0_4_;
      fStack_377c = auVar257._4_4_;
      fStack_3778 = auVar257._8_4_;
      fStack_3774 = auVar257._12_4_;
      fStack_3770 = auVar257._16_4_;
      fStack_376c = auVar257._20_4_;
      fStack_3768 = auVar257._24_4_;
      fStack_3764 = auVar257._28_4_;
      local_8600._4_4_ = (int)fStack_377c;
      local_8600._0_4_ = (int)local_3780;
      local_8600._8_4_ = (int)fStack_3778;
      local_8600._12_4_ = (int)fStack_3774;
      uStack_85f0._0_4_ = (int)fStack_3770;
      uStack_85f0._4_4_ = (int)fStack_376c;
      uStack_85e8._0_4_ = (int)fStack_3768;
      uStack_85e8._4_4_ = (int)fStack_3764;
      auVar257 = _local_8600;
      uStack_85e8 = auVar257._24_8_;
      auVar150._16_8_ = uStack_85f0;
      auVar150._0_16_ = local_8600;
      auVar150._24_8_ = uStack_85e8;
      auVar149._8_8_ = 0x7f0000007f;
      auVar149._0_8_ = 0x7f0000007f;
      auVar149._16_8_ = 0x7f0000007f;
      auVar149._24_8_ = 0x7f0000007f;
      auVar257 = vpaddd_avx2(auVar150,auVar149);
      auVar257 = vpslld_avx2(auVar257,ZEXT416(0x17));
      local_6f40 = auVar257._0_4_;
      fStack_6f3c = auVar257._4_4_;
      fStack_6f38 = auVar257._8_4_;
      fStack_6f34 = auVar257._12_4_;
      fStack_6f30 = auVar257._16_4_;
      fStack_6f2c = auVar257._20_4_;
      fStack_6f28 = auVar257._24_4_;
      local_8660._4_4_ = (fStack_805c + 1.0) * fStack_6f3c;
      local_8660._0_4_ = (local_8060 + 1.0) * local_6f40;
      uStack_8658._0_4_ = (fStack_8058 + 1.0) * fStack_6f38;
      uStack_8658._4_4_ = (fStack_8054 + 1.0) * fStack_6f34;
      uStack_8650._0_4_ = fStack_6f30 * 1.0;
      uStack_8650._4_4_ = fStack_6f2c * 1.0;
      auVar235 = _local_8660;
      uStack_8648._0_4_ = fStack_6f28 * 1.0;
      uStack_8648._4_4_ = 0x3f800000;
      auVar257 = _local_8660;
      uStack_8650 = auVar235._16_8_;
      uStack_8648 = auVar257._24_8_;
      uVar1 = *(undefined4 *)(*local_b068 + 0x10);
      auVar25._4_4_ = uVar1;
      auVar25._0_4_ = uVar1;
      auVar25._12_4_ = uVar1;
      auVar25._8_4_ = uVar1;
      uVar1 = *(undefined4 *)(*local_b068 + 0x14);
      auVar25._20_4_ = uVar1;
      auVar25._16_4_ = uVar1;
      auVar25._28_4_ = uVar1;
      auVar25._24_4_ = uVar1;
      auVar257 = vsubps_avx(*(undefined1 (*) [32])local_b060[1],auVar25);
      auVar103._8_4_ = 0x42b0c0a5;
      auVar103._0_8_ = 0x42b0c0a542b0c0a5;
      auVar103._12_4_ = 0x42b0c0a5;
      auVar103._16_4_ = 0x42b0c0a5;
      auVar103._20_4_ = 0x42b0c0a5;
      auVar103._24_4_ = 0x42b0c0a5;
      auVar103._28_4_ = 0x42b0c0a5;
      auVar257 = vminps_avx(auVar257,auVar103);
      auVar29._8_4_ = 0xc2b0c0a5;
      auVar29._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar29._12_4_ = 0xc2b0c0a5;
      auVar29._16_4_ = 0xc2b0c0a5;
      auVar29._20_4_ = 0xc2b0c0a5;
      auVar29._24_4_ = 0xc2b0c0a5;
      auVar29._28_4_ = 0xc2b0c0a5;
      auVar253 = vmaxps_avx(auVar257,auVar29);
      auVar117._8_4_ = 1.442695;
      auVar117._12_4_ = 1.442695;
      auVar117._0_4_ = 1.442695;
      auVar117._4_4_ = 1.442695;
      auVar117._16_4_ = 1.442695;
      auVar117._20_4_ = 1.442695;
      auVar117._24_4_ = 1.442695;
      auVar117._28_4_ = 1.442695;
      auVar116._8_4_ = 0.5;
      auVar116._12_4_ = 0.5;
      auVar116._0_4_ = 0.5;
      auVar116._4_4_ = 0.5;
      auVar116._16_4_ = 0.5;
      auVar116._20_4_ = 0.5;
      auVar116._24_4_ = 0.5;
      auVar116._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar117,auVar253,auVar116);
      auVar258 = vroundps_avx(ZEXT1632(auVar18),1);
      auVar257 = vcmpps_avx(ZEXT1632(auVar18),auVar258,1);
      auVar107._8_8_ = 0x3f8000003f800000;
      auVar107._0_8_ = 0x3f8000003f800000;
      auVar107._16_8_ = 0x3f8000003f800000;
      auVar107._24_8_ = 0x3f8000003f800000;
      auVar257 = vpand_avx2(auVar257,auVar107);
      auVar257 = vsubps_avx(auVar258,auVar257);
      auVar139._8_4_ = 0.6933594;
      auVar139._12_4_ = 0.6933594;
      auVar139._0_4_ = 0.6933594;
      auVar139._4_4_ = 0.6933594;
      auVar139._16_4_ = 0.6933594;
      auVar139._20_4_ = 0.6933594;
      auVar139._24_4_ = 0.6933594;
      auVar139._28_4_ = 0.6933594;
      auVar18 = vfnmadd213ps_fma(auVar139,auVar257,auVar253);
      auVar140._8_4_ = -0.00021219444;
      auVar140._12_4_ = -0.00021219444;
      auVar140._0_4_ = -0.00021219444;
      auVar140._4_4_ = -0.00021219444;
      auVar140._16_4_ = -0.00021219444;
      auVar140._20_4_ = -0.00021219444;
      auVar140._24_4_ = -0.00021219444;
      auVar140._28_4_ = -0.00021219444;
      auVar18 = vfnmadd213ps_fma(auVar140,auVar257,ZEXT1632(auVar18));
      auVar253 = ZEXT1632(auVar18);
      local_6e60 = auVar18._0_4_;
      fStack_6e5c = auVar18._4_4_;
      fStack_6e58 = auVar18._8_4_;
      fStack_6e54 = auVar18._12_4_;
      _local_8740 = ZEXT1632(CONCAT412(fStack_6e54 * fStack_6e54,
                                       CONCAT48(fStack_6e58 * fStack_6e58,
                                                CONCAT44(fStack_6e5c * fStack_6e5c,
                                                         local_6e60 * local_6e60))));
      uStack_87d8._0_4_ = 0x39506967;
      local_87e0 = (undefined1  [8])0x3950696739506967;
      uStack_87d8._4_4_ = 0x39506967;
      uStack_87d0._0_4_ = 0x39506967;
      uStack_87d0._4_4_ = 0x39506967;
      uStack_87c8._0_4_ = 0x39506967;
      uStack_87c8._4_4_ = 0x39506967;
      auVar118._8_4_ = 0.0013981999;
      auVar118._12_4_ = 0.0013981999;
      auVar118._0_4_ = 0.0013981999;
      auVar118._4_4_ = 0.0013981999;
      auVar118._16_4_ = 0.0013981999;
      auVar118._20_4_ = 0.0013981999;
      auVar118._24_4_ = 0.0013981999;
      auVar118._28_4_ = 0.0013981999;
      auVar18 = vfmadd213ps_fma(auVar253,_local_87e0,auVar118);
      auVar119._8_4_ = 0.008333452;
      auVar119._12_4_ = 0.008333452;
      auVar119._0_4_ = 0.008333452;
      auVar119._4_4_ = 0.008333452;
      auVar119._16_4_ = 0.008333452;
      auVar119._20_4_ = 0.008333452;
      auVar119._24_4_ = 0.008333452;
      auVar119._28_4_ = 0.008333452;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar119);
      auVar120._8_4_ = 0.041665796;
      auVar120._12_4_ = 0.041665796;
      auVar120._0_4_ = 0.041665796;
      auVar120._4_4_ = 0.041665796;
      auVar120._16_4_ = 0.041665796;
      auVar120._20_4_ = 0.041665796;
      auVar120._24_4_ = 0.041665796;
      auVar120._28_4_ = 0.041665796;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar120);
      auVar121._8_4_ = 0.16666666;
      auVar121._12_4_ = 0.16666666;
      auVar121._0_4_ = 0.16666666;
      auVar121._4_4_ = 0.16666666;
      auVar121._16_4_ = 0.16666666;
      auVar121._20_4_ = 0.16666666;
      auVar121._24_4_ = 0.16666666;
      auVar121._28_4_ = 0.16666666;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar121);
      auVar122._8_4_ = 0.5;
      auVar122._12_4_ = 0.5;
      auVar122._0_4_ = 0.5;
      auVar122._4_4_ = 0.5;
      auVar122._16_4_ = 0.5;
      auVar122._20_4_ = 0.5;
      auVar122._24_4_ = 0.5;
      auVar122._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar122);
      auVar18 = vfmadd213ps_fma(_local_8740,ZEXT1632(auVar18),auVar253);
      local_8020 = auVar18._0_4_;
      fStack_801c = auVar18._4_4_;
      fStack_8018 = auVar18._8_4_;
      fStack_8014 = auVar18._12_4_;
      local_3760 = auVar257._0_4_;
      fStack_375c = auVar257._4_4_;
      fStack_3758 = auVar257._8_4_;
      fStack_3754 = auVar257._12_4_;
      fStack_3750 = auVar257._16_4_;
      fStack_374c = auVar257._20_4_;
      fStack_3748 = auVar257._24_4_;
      fStack_3744 = auVar257._28_4_;
      local_8780._4_4_ = (int)fStack_375c;
      local_8780._0_4_ = (int)local_3760;
      local_8780._8_4_ = (int)fStack_3758;
      local_8780._12_4_ = (int)fStack_3754;
      uStack_8770._0_4_ = (int)fStack_3750;
      uStack_8770._4_4_ = (int)fStack_374c;
      uStack_8768._0_4_ = (int)fStack_3748;
      uStack_8768._4_4_ = (int)fStack_3744;
      auVar257 = _local_8780;
      uStack_8768 = auVar257._24_8_;
      auVar148._16_8_ = uStack_8770;
      auVar148._0_16_ = local_8780;
      auVar148._24_8_ = uStack_8768;
      auVar147._8_8_ = 0x7f0000007f;
      auVar147._0_8_ = 0x7f0000007f;
      auVar147._16_8_ = 0x7f0000007f;
      auVar147._24_8_ = 0x7f0000007f;
      auVar257 = vpaddd_avx2(auVar148,auVar147);
      auVar257 = vpslld_avx2(auVar257,ZEXT416(0x17));
      local_6ec0 = auVar257._0_4_;
      fStack_6ebc = auVar257._4_4_;
      fStack_6eb8 = auVar257._8_4_;
      fStack_6eb4 = auVar257._12_4_;
      fStack_6eb0 = auVar257._16_4_;
      fStack_6eac = auVar257._20_4_;
      fStack_6ea8 = auVar257._24_4_;
      local_87e0._4_4_ = (fStack_801c + 1.0) * fStack_6ebc;
      local_87e0._0_4_ = (local_8020 + 1.0) * local_6ec0;
      uStack_87d8._0_4_ = (fStack_8018 + 1.0) * fStack_6eb8;
      uStack_87d8._4_4_ = (fStack_8014 + 1.0) * fStack_6eb4;
      uStack_87d0._0_4_ = fStack_6eb0 * 1.0;
      uStack_87d0._4_4_ = fStack_6eac * 1.0;
      auVar235 = _local_87e0;
      uStack_87c8._0_4_ = fStack_6ea8 * 1.0;
      uStack_87c8._4_4_ = 0x3f800000;
      auVar257 = _local_87e0;
      uStack_87d0 = auVar235._16_8_;
      uStack_87c8 = auVar257._24_8_;
      uVar1 = *(undefined4 *)(*local_b068 + 0x18);
      auVar24._4_4_ = uVar1;
      auVar24._0_4_ = uVar1;
      auVar24._12_4_ = uVar1;
      auVar24._8_4_ = uVar1;
      uVar1 = *(undefined4 *)(*local_b068 + 0x1c);
      auVar24._20_4_ = uVar1;
      auVar24._16_4_ = uVar1;
      auVar24._28_4_ = uVar1;
      auVar24._24_4_ = uVar1;
      auVar257 = vsubps_avx(*(undefined1 (*) [32])(local_b060[1] + 0x20),auVar24);
      auVar104._8_4_ = 0x42b0c0a5;
      auVar104._0_8_ = 0x42b0c0a542b0c0a5;
      auVar104._12_4_ = 0x42b0c0a5;
      auVar104._16_4_ = 0x42b0c0a5;
      auVar104._20_4_ = 0x42b0c0a5;
      auVar104._24_4_ = 0x42b0c0a5;
      auVar104._28_4_ = 0x42b0c0a5;
      auVar257 = vminps_avx(auVar257,auVar104);
      auVar28._8_4_ = 0xc2b0c0a5;
      auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar28._12_4_ = 0xc2b0c0a5;
      auVar28._16_4_ = 0xc2b0c0a5;
      auVar28._20_4_ = 0xc2b0c0a5;
      auVar28._24_4_ = 0xc2b0c0a5;
      auVar28._28_4_ = 0xc2b0c0a5;
      auVar253 = vmaxps_avx(auVar257,auVar28);
      auVar110._8_4_ = 1.442695;
      auVar110._12_4_ = 1.442695;
      auVar110._0_4_ = 1.442695;
      auVar110._4_4_ = 1.442695;
      auVar110._16_4_ = 1.442695;
      auVar110._20_4_ = 1.442695;
      auVar110._24_4_ = 1.442695;
      auVar110._28_4_ = 1.442695;
      auVar109._8_4_ = 0.5;
      auVar109._12_4_ = 0.5;
      auVar109._0_4_ = 0.5;
      auVar109._4_4_ = 0.5;
      auVar109._16_4_ = 0.5;
      auVar109._20_4_ = 0.5;
      auVar109._24_4_ = 0.5;
      auVar109._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar110,auVar253,auVar109);
      auVar258 = vroundps_avx(ZEXT1632(auVar18),1);
      auVar257 = vcmpps_avx(ZEXT1632(auVar18),auVar258,1);
      auVar108._8_8_ = 0x3f8000003f800000;
      auVar108._0_8_ = 0x3f8000003f800000;
      auVar108._16_8_ = 0x3f8000003f800000;
      auVar108._24_8_ = 0x3f8000003f800000;
      auVar257 = vpand_avx2(auVar257,auVar108);
      auVar257 = vsubps_avx(auVar258,auVar257);
      auVar137._8_4_ = 0.6933594;
      auVar137._12_4_ = 0.6933594;
      auVar137._0_4_ = 0.6933594;
      auVar137._4_4_ = 0.6933594;
      auVar137._16_4_ = 0.6933594;
      auVar137._20_4_ = 0.6933594;
      auVar137._24_4_ = 0.6933594;
      auVar137._28_4_ = 0.6933594;
      auVar18 = vfnmadd213ps_fma(auVar137,auVar257,auVar253);
      auVar138._8_4_ = -0.00021219444;
      auVar138._12_4_ = -0.00021219444;
      auVar138._0_4_ = -0.00021219444;
      auVar138._4_4_ = -0.00021219444;
      auVar138._16_4_ = -0.00021219444;
      auVar138._20_4_ = -0.00021219444;
      auVar138._24_4_ = -0.00021219444;
      auVar138._28_4_ = -0.00021219444;
      auVar18 = vfnmadd213ps_fma(auVar138,auVar257,ZEXT1632(auVar18));
      auVar253 = ZEXT1632(auVar18);
      local_6de0 = auVar18._0_4_;
      fStack_6ddc = auVar18._4_4_;
      fStack_6dd8 = auVar18._8_4_;
      fStack_6dd4 = auVar18._12_4_;
      _local_88c0 = ZEXT1632(CONCAT412(fStack_6dd4 * fStack_6dd4,
                                       CONCAT48(fStack_6dd8 * fStack_6dd8,
                                                CONCAT44(fStack_6ddc * fStack_6ddc,
                                                         local_6de0 * local_6de0))));
      uStack_8958._0_4_ = 0x39506967;
      local_8960 = (undefined1  [8])0x3950696739506967;
      uStack_8958._4_4_ = 0x39506967;
      uStack_8950._0_4_ = 0x39506967;
      uStack_8950._4_4_ = 0x39506967;
      uStack_8948._0_4_ = 0x39506967;
      uStack_8948._4_4_ = 0x39506967;
      auVar111._8_4_ = 0.0013981999;
      auVar111._12_4_ = 0.0013981999;
      auVar111._0_4_ = 0.0013981999;
      auVar111._4_4_ = 0.0013981999;
      auVar111._16_4_ = 0.0013981999;
      auVar111._20_4_ = 0.0013981999;
      auVar111._24_4_ = 0.0013981999;
      auVar111._28_4_ = 0.0013981999;
      auVar18 = vfmadd213ps_fma(auVar253,_local_8960,auVar111);
      auVar112._8_4_ = 0.008333452;
      auVar112._12_4_ = 0.008333452;
      auVar112._0_4_ = 0.008333452;
      auVar112._4_4_ = 0.008333452;
      auVar112._16_4_ = 0.008333452;
      auVar112._20_4_ = 0.008333452;
      auVar112._24_4_ = 0.008333452;
      auVar112._28_4_ = 0.008333452;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar112);
      auVar113._8_4_ = 0.041665796;
      auVar113._12_4_ = 0.041665796;
      auVar113._0_4_ = 0.041665796;
      auVar113._4_4_ = 0.041665796;
      auVar113._16_4_ = 0.041665796;
      auVar113._20_4_ = 0.041665796;
      auVar113._24_4_ = 0.041665796;
      auVar113._28_4_ = 0.041665796;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar113);
      auVar114._8_4_ = 0.16666666;
      auVar114._12_4_ = 0.16666666;
      auVar114._0_4_ = 0.16666666;
      auVar114._4_4_ = 0.16666666;
      auVar114._16_4_ = 0.16666666;
      auVar114._20_4_ = 0.16666666;
      auVar114._24_4_ = 0.16666666;
      auVar114._28_4_ = 0.16666666;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar114);
      auVar115._8_4_ = 0.5;
      auVar115._12_4_ = 0.5;
      auVar115._0_4_ = 0.5;
      auVar115._4_4_ = 0.5;
      auVar115._16_4_ = 0.5;
      auVar115._20_4_ = 0.5;
      auVar115._24_4_ = 0.5;
      auVar115._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar253,ZEXT1632(auVar18),auVar115);
      auVar18 = vfmadd213ps_fma(_local_88c0,ZEXT1632(auVar18),auVar253);
      local_7fe0 = auVar18._0_4_;
      fStack_7fdc = auVar18._4_4_;
      fStack_7fd8 = auVar18._8_4_;
      fStack_7fd4 = auVar18._12_4_;
      local_3740 = auVar257._0_4_;
      fStack_373c = auVar257._4_4_;
      fStack_3738 = auVar257._8_4_;
      fStack_3734 = auVar257._12_4_;
      fStack_3730 = auVar257._16_4_;
      fStack_372c = auVar257._20_4_;
      fStack_3728 = auVar257._24_4_;
      fStack_3724 = auVar257._28_4_;
      local_8900._4_4_ = (int)fStack_373c;
      local_8900._0_4_ = (int)local_3740;
      local_8900._8_4_ = (int)fStack_3738;
      local_8900._12_4_ = (int)fStack_3734;
      uStack_88f0._0_4_ = (int)fStack_3730;
      uStack_88f0._4_4_ = (int)fStack_372c;
      uStack_88e8._0_4_ = (int)fStack_3728;
      uStack_88e8._4_4_ = (int)fStack_3724;
      auVar257 = _local_8900;
      uStack_88e8 = auVar257._24_8_;
      auVar146._16_8_ = uStack_88f0;
      auVar146._0_16_ = local_8900;
      auVar146._24_8_ = uStack_88e8;
      auVar145._8_8_ = 0x7f0000007f;
      auVar145._0_8_ = 0x7f0000007f;
      auVar145._16_8_ = 0x7f0000007f;
      auVar145._24_8_ = 0x7f0000007f;
      auVar257 = vpaddd_avx2(auVar146,auVar145);
      auVar257 = vpslld_avx2(auVar257,ZEXT416(0x17));
      local_6e40 = auVar257._0_4_;
      fStack_6e3c = auVar257._4_4_;
      fStack_6e38 = auVar257._8_4_;
      fStack_6e34 = auVar257._12_4_;
      fStack_6e30 = auVar257._16_4_;
      fStack_6e2c = auVar257._20_4_;
      fStack_6e28 = auVar257._24_4_;
      local_8960._4_4_ = (fStack_7fdc + 1.0) * fStack_6e3c;
      local_8960._0_4_ = (local_7fe0 + 1.0) * local_6e40;
      uStack_8958._0_4_ = (fStack_7fd8 + 1.0) * fStack_6e38;
      uStack_8958._4_4_ = (fStack_7fd4 + 1.0) * fStack_6e34;
      uStack_8950._0_4_ = fStack_6e30 * 1.0;
      uStack_8950._4_4_ = fStack_6e2c * 1.0;
      auVar235 = _local_8960;
      uStack_8948._0_4_ = fStack_6e28 * 1.0;
      uStack_8948._4_4_ = 0x3f800000;
      auVar257 = _local_8960;
      uStack_8950 = auVar235._16_8_;
      uStack_8948 = auVar257._24_8_;
      *(undefined1 (*) [8])*local_b060 = local_84e0;
      *(undefined8 *)(*local_b060 + 8) = uStack_84d8;
      *(undefined8 *)(*local_b060 + 0x10) = uStack_84d0;
      *(undefined8 *)(*local_b060 + 0x18) = uStack_84c8;
      *(undefined1 (*) [8])(*local_b060 + 0x20) = local_8660;
      *(undefined8 *)(*local_b060 + 0x28) = uStack_8658;
      *(undefined8 *)(*local_b060 + 0x30) = uStack_8650;
      *(undefined8 *)(*local_b060 + 0x38) = uStack_8648;
      *(undefined1 (*) [8])local_b060[1] = local_87e0;
      *(undefined8 *)(local_b060[1] + 8) = uStack_87d8;
      *(undefined8 *)(local_b060[1] + 0x10) = uStack_87d0;
      *(undefined8 *)(local_b060[1] + 0x18) = uStack_87c8;
      *(undefined1 (*) [8])(local_b060[1] + 0x20) = local_8960;
      *(undefined8 *)(local_b060[1] + 0x28) = uStack_8958;
      *(undefined8 *)(local_b060[1] + 0x30) = uStack_8950;
      *(undefined8 *)(local_b060[1] + 0x38) = uStack_8948;
      auVar221._16_8_ = uStack_84d0;
      auVar221._0_16_ = _local_84e0;
      auVar221._24_8_ = uStack_84c8;
      auVar220._16_8_ = uStack_8650;
      auVar220._0_16_ = _local_8660;
      auVar220._24_8_ = uStack_8648;
      auVar258 = vunpcklps_avx(auVar221,auVar220);
      auVar225._16_8_ = uStack_84d0;
      auVar225._0_16_ = _local_84e0;
      auVar225._24_8_ = uStack_84c8;
      auVar224._16_8_ = uStack_8650;
      auVar224._0_16_ = _local_8660;
      auVar224._24_8_ = uStack_8648;
      auVar257 = vunpckhps_avx(auVar225,auVar224);
      auVar219._16_8_ = uStack_87d0;
      auVar219._0_16_ = _local_87e0;
      auVar219._24_8_ = uStack_87c8;
      auVar218._16_8_ = uStack_8950;
      auVar218._0_16_ = _local_8960;
      auVar218._24_8_ = uStack_8948;
      auVar259 = vunpcklps_avx(auVar219,auVar218);
      auVar223._16_8_ = uStack_87d0;
      auVar223._0_16_ = _local_87e0;
      auVar223._24_8_ = uStack_87c8;
      auVar222._16_8_ = uStack_8950;
      auVar222._0_16_ = _local_8960;
      auVar222._24_8_ = uStack_8948;
      auVar253 = vunpckhps_avx(auVar223,auVar222);
      local_7ee0 = auVar258._0_4_;
      fStack_7edc = auVar258._4_4_;
      fStack_7ed8 = auVar258._8_4_;
      fStack_7ed4 = auVar258._12_4_;
      fStack_7ed0 = auVar258._16_4_;
      fStack_7ecc = auVar258._20_4_;
      fStack_7ec8 = auVar258._24_4_;
      fStack_7ec4 = auVar258._28_4_;
      local_7f00 = auVar257._0_4_;
      fStack_7efc = auVar257._4_4_;
      fStack_7ef8 = auVar257._8_4_;
      fStack_7ef4 = auVar257._12_4_;
      fStack_7ef0 = auVar257._16_4_;
      fStack_7eec = auVar257._20_4_;
      fStack_7ee8 = auVar257._24_4_;
      fStack_7ee4 = auVar257._28_4_;
      local_b720._4_4_ = fStack_7edc + fStack_7efc;
      local_b720._0_4_ = local_7ee0 + local_7f00;
      fStack_b718 = fStack_7ed8 + fStack_7ef8;
      fStack_b714 = fStack_7ed4 + fStack_7ef4;
      fStack_b710 = fStack_7ed0 + fStack_7ef0;
      fStack_b70c = fStack_7ecc + fStack_7eec;
      fStack_b708 = fStack_7ec8 + fStack_7ee8;
      fStack_b704 = fStack_7ec4 + fStack_7ee4;
      local_7f20 = auVar259._0_4_;
      fStack_7f1c = auVar259._4_4_;
      fStack_7f18 = auVar259._8_4_;
      fStack_7f14 = auVar259._12_4_;
      fStack_7f10 = auVar259._16_4_;
      fStack_7f0c = auVar259._20_4_;
      fStack_7f08 = auVar259._24_4_;
      fStack_7f04 = auVar259._28_4_;
      local_7f40 = auVar253._0_4_;
      fStack_7f3c = auVar253._4_4_;
      fStack_7f38 = auVar253._8_4_;
      fStack_7f34 = auVar253._12_4_;
      fStack_7f30 = auVar253._16_4_;
      fStack_7f2c = auVar253._20_4_;
      fStack_7f28 = auVar253._24_4_;
      fStack_7f24 = auVar253._28_4_;
      local_b740._4_4_ = fStack_7f1c + fStack_7f3c;
      local_b740._0_4_ = local_7f20 + local_7f40;
      fStack_b738 = fStack_7f18 + fStack_7f38;
      fStack_b734 = fStack_7f14 + fStack_7f34;
      fStack_b730 = fStack_7f10 + fStack_7f30;
      fStack_b72c = fStack_7f0c + fStack_7f2c;
      fStack_b728 = fStack_7f08 + fStack_7f28;
      fStack_b724 = fStack_7f04 + fStack_7f24;
      auVar257 = vperm2f128_avx(_local_b720,_local_b740,0x20);
      auVar258 = vperm2f128_avx(_local_b720,_local_b740,0x31);
      auVar253 = vunpcklps_avx(auVar257,auVar258);
      auVar257 = vunpckhps_avx(auVar257,auVar258);
      local_7f60 = auVar253._0_4_;
      fStack_7f5c = auVar253._4_4_;
      fStack_7f58 = auVar253._8_4_;
      fStack_7f54 = auVar253._12_4_;
      fStack_7f50 = auVar253._16_4_;
      fStack_7f4c = auVar253._20_4_;
      fStack_7f48 = auVar253._24_4_;
      fStack_7f44 = auVar253._28_4_;
      local_7f80 = auVar257._0_4_;
      fStack_7f7c = auVar257._4_4_;
      fStack_7f78 = auVar257._8_4_;
      fStack_7f74 = auVar257._12_4_;
      fStack_7f70 = auVar257._16_4_;
      fStack_7f6c = auVar257._20_4_;
      fStack_7f68 = auVar257._24_4_;
      fStack_7f64 = auVar257._28_4_;
      local_7fa0 = (float)*(undefined8 *)*local_b070;
      fStack_7f9c = (float)((ulong)*(undefined8 *)*local_b070 >> 0x20);
      fStack_7f98 = (float)*(undefined8 *)(*local_b070 + 8);
      fStack_7f94 = (float)((ulong)*(undefined8 *)(*local_b070 + 8) >> 0x20);
      fStack_7f90 = (float)*(undefined8 *)(*local_b070 + 0x10);
      fStack_7f8c = (float)((ulong)*(undefined8 *)(*local_b070 + 0x10) >> 0x20);
      fStack_7f88 = (float)*(undefined8 *)(*local_b070 + 0x18);
      fStack_7f84 = (float)((ulong)*(undefined8 *)(*local_b070 + 0x18) >> 0x20);
      local_b780 = CONCAT44(fStack_7f9c + fStack_7f5c + fStack_7f7c,
                            local_7fa0 + local_7f60 + local_7f80);
      uStack_b778 = CONCAT44(fStack_7f94 + fStack_7f54 + fStack_7f74,
                             fStack_7f98 + fStack_7f58 + fStack_7f78);
      uStack_b770 = CONCAT44(fStack_7f8c + fStack_7f4c + fStack_7f6c,
                             fStack_7f90 + fStack_7f50 + fStack_7f70);
      uStack_b768 = CONCAT44(fStack_7f84 + fStack_7f44 + fStack_7f64,
                             fStack_7f88 + fStack_7f48 + fStack_7f68);
      *(undefined8 *)*local_b070 = local_b780;
      *(undefined8 *)(*local_b070 + 8) = uStack_b778;
      *(undefined8 *)(*local_b070 + 0x10) = uStack_b770;
      *(undefined8 *)(*local_b070 + 0x18) = uStack_b768;
      local_b060 = local_b060 + 2;
      local_b068 = (undefined1 (*) [64])(*local_b068 + 0x20);
      local_b070 = (undefined1 (*) [64])(*local_b070 + 0x20);
    }
    for (; local_b074 + 3 < local_aa54; local_b074 = local_b074 + 4) {
      uVar1 = *(undefined4 *)*local_b068;
      auVar21._4_4_ = uVar1;
      auVar21._0_4_ = uVar1;
      auVar21._12_4_ = uVar1;
      auVar21._8_4_ = uVar1;
      auVar18 = vsubps_avx(*(undefined1 (*) [16])*local_b060,auVar21);
      auVar153._8_4_ = 0x42b0c0a5;
      auVar153._0_8_ = 0x42b0c0a542b0c0a5;
      auVar153._12_4_ = 0x42b0c0a5;
      auVar18 = vminps_avx(auVar18,auVar153);
      auVar37._8_4_ = 0xc2b0c0a5;
      auVar37._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar37._12_4_ = 0xc2b0c0a5;
      auVar17 = vmaxps_avx(auVar18,auVar37);
      local_6c70 = auVar17._0_4_;
      fStack_6c6c = auVar17._4_4_;
      fStack_6c68 = auVar17._8_4_;
      fStack_6c64 = auVar17._12_4_;
      fVar252 = local_6c70 * 1.442695 + 0.5;
      fVar254 = fStack_6c6c * 1.442695 + 0.5;
      fVar255 = fStack_6c68 * 1.442695 + 0.5;
      fVar256 = fStack_6c64 * 1.442695 + 0.5;
      local_7ad0 = CONCAT44(fVar254,fVar252);
      uStack_7ac8._0_4_ = fVar255;
      uStack_7ac8._4_4_ = fVar256;
      local_7ae0 = CONCAT44((int)fVar254,(int)fVar252);
      uStack_7ad8._0_4_ = (int)fVar255;
      uStack_7ad8._4_4_ = (int)fVar256;
      auVar158._8_8_ = uStack_7ad8;
      auVar158._0_8_ = local_7ae0;
      auVar19 = vcvtdq2ps_avx(auVar158);
      auVar163._8_8_ = uStack_7ac8;
      auVar163._0_8_ = local_7ad0;
      auVar18 = vcmpps_avx(auVar163,auVar19,1);
      auVar168._8_8_ = 0x3f8000003f800000;
      auVar168._0_8_ = 0x3f8000003f800000;
      auVar18 = vpand_avx(auVar18,auVar168);
      auVar18 = vsubps_avx(auVar19,auVar18);
      auVar191._8_4_ = 0.6933594;
      auVar191._12_4_ = 0.6933594;
      auVar191._0_4_ = 0.6933594;
      auVar191._4_4_ = 0.6933594;
      auVar19 = vfnmadd213ps_fma(auVar191,auVar18,auVar17);
      auVar192._8_4_ = -0.00021219444;
      auVar192._12_4_ = -0.00021219444;
      auVar192._0_4_ = -0.00021219444;
      auVar192._4_4_ = -0.00021219444;
      auVar17 = vfnmadd213ps_fma(auVar192,auVar18,auVar19);
      local_6c90 = auVar17._0_4_;
      fStack_6c8c = auVar17._4_4_;
      fStack_6c88 = auVar17._8_4_;
      fStack_6c84 = auVar17._12_4_;
      local_7ac0._4_4_ = fStack_6c8c * fStack_6c8c;
      local_7ac0._0_4_ = local_6c90 * local_6c90;
      fStack_7ab8 = fStack_6c88 * fStack_6c88;
      fStack_7ab4 = fStack_6c84 * fStack_6c84;
      uStack_7b08._0_4_ = 0x39506967;
      local_7b10 = (undefined1  [8])0x3950696739506967;
      uStack_7b08._4_4_ = 0x39506967;
      auVar213._8_4_ = 0.0013981999;
      auVar213._12_4_ = 0.0013981999;
      auVar213._0_4_ = 0.0013981999;
      auVar213._4_4_ = 0.0013981999;
      auVar19 = vfmadd213ps_fma(auVar17,_local_7b10,auVar213);
      auVar214._8_4_ = 0.008333452;
      auVar214._12_4_ = 0.008333452;
      auVar214._0_4_ = 0.008333452;
      auVar214._4_4_ = 0.008333452;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar214);
      auVar215._8_4_ = 0.041665796;
      auVar215._12_4_ = 0.041665796;
      auVar215._0_4_ = 0.041665796;
      auVar215._4_4_ = 0.041665796;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar215);
      auVar216._8_4_ = 0.16666666;
      auVar216._12_4_ = 0.16666666;
      auVar216._0_4_ = 0.16666666;
      auVar216._4_4_ = 0.16666666;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar216);
      auVar217._8_4_ = 0.5;
      auVar217._12_4_ = 0.5;
      auVar217._0_4_ = 0.5;
      auVar217._4_4_ = 0.5;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar217);
      auVar19 = vfmadd213ps_fma(_local_7ac0,auVar19,auVar17);
      local_78b0 = auVar19._0_4_;
      fStack_78ac = auVar19._4_4_;
      fStack_78a8 = auVar19._8_4_;
      fStack_78a4 = auVar19._12_4_;
      local_2420 = auVar18._0_4_;
      fStack_241c = auVar18._4_4_;
      fStack_2418 = auVar18._8_4_;
      fStack_2414 = auVar18._12_4_;
      local_7ae0 = CONCAT44((int)fStack_241c,(int)local_2420);
      uStack_7ad8._0_4_ = (int)fStack_2418;
      uStack_7ad8._4_4_ = (int)fStack_2414;
      auVar174._8_8_ = uStack_7ad8;
      auVar174._0_8_ = local_7ae0;
      auVar173._8_8_ = 0x7f0000007f;
      auVar173._0_8_ = 0x7f0000007f;
      auVar18 = vpaddd_avx(auVar174,auVar173);
      auVar18 = vpslld_avx(auVar18,ZEXT416(0x17));
      local_6cc0 = auVar18._0_4_;
      fStack_6cbc = auVar18._4_4_;
      fStack_6cb8 = auVar18._8_4_;
      fStack_6cb4 = auVar18._12_4_;
      local_7b10._4_4_ = (fStack_78ac + 1.0) * fStack_6cbc;
      local_7b10._0_4_ = (local_78b0 + 1.0) * local_6cc0;
      uStack_7b08._0_4_ = (fStack_78a8 + 1.0) * fStack_6cb8;
      uStack_7b08._4_4_ = (fStack_78a4 + 1.0) * fStack_6cb4;
      uVar1 = *(undefined4 *)(*local_b068 + 4);
      auVar20._4_4_ = uVar1;
      auVar20._0_4_ = uVar1;
      auVar20._12_4_ = uVar1;
      auVar20._8_4_ = uVar1;
      auVar18 = vsubps_avx(*(undefined1 (*) [16])(*local_b060 + 0x10),auVar20);
      auVar154._8_4_ = 0x42b0c0a5;
      auVar154._0_8_ = 0x42b0c0a542b0c0a5;
      auVar154._12_4_ = 0x42b0c0a5;
      auVar18 = vminps_avx(auVar18,auVar154);
      auVar36._8_4_ = 0xc2b0c0a5;
      auVar36._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar36._12_4_ = 0xc2b0c0a5;
      auVar17 = vmaxps_avx(auVar18,auVar36);
      local_6c10 = auVar17._0_4_;
      fStack_6c0c = auVar17._4_4_;
      fStack_6c08 = auVar17._8_4_;
      fStack_6c04 = auVar17._12_4_;
      fVar252 = local_6c10 * 1.442695 + 0.5;
      fVar254 = fStack_6c0c * 1.442695 + 0.5;
      fVar255 = fStack_6c08 * 1.442695 + 0.5;
      fVar256 = fStack_6c04 * 1.442695 + 0.5;
      local_7b90 = CONCAT44(fVar254,fVar252);
      uStack_7b88._0_4_ = fVar255;
      uStack_7b88._4_4_ = fVar256;
      local_7ba0 = CONCAT44((int)fVar254,(int)fVar252);
      uStack_7b98._0_4_ = (int)fVar255;
      uStack_7b98._4_4_ = (int)fVar256;
      auVar159._8_8_ = uStack_7b98;
      auVar159._0_8_ = local_7ba0;
      auVar19 = vcvtdq2ps_avx(auVar159);
      auVar164._8_8_ = uStack_7b88;
      auVar164._0_8_ = local_7b90;
      auVar18 = vcmpps_avx(auVar164,auVar19,1);
      auVar169._8_8_ = 0x3f8000003f800000;
      auVar169._0_8_ = 0x3f8000003f800000;
      auVar18 = vpand_avx(auVar18,auVar169);
      auVar18 = vsubps_avx(auVar19,auVar18);
      auVar189._8_4_ = 0.6933594;
      auVar189._12_4_ = 0.6933594;
      auVar189._0_4_ = 0.6933594;
      auVar189._4_4_ = 0.6933594;
      auVar19 = vfnmadd213ps_fma(auVar189,auVar18,auVar17);
      auVar190._8_4_ = -0.00021219444;
      auVar190._12_4_ = -0.00021219444;
      auVar190._0_4_ = -0.00021219444;
      auVar190._4_4_ = -0.00021219444;
      auVar17 = vfnmadd213ps_fma(auVar190,auVar18,auVar19);
      local_6c30 = auVar17._0_4_;
      fStack_6c2c = auVar17._4_4_;
      fStack_6c28 = auVar17._8_4_;
      fStack_6c24 = auVar17._12_4_;
      local_7b80._4_4_ = fStack_6c2c * fStack_6c2c;
      local_7b80._0_4_ = local_6c30 * local_6c30;
      fStack_7b78 = fStack_6c28 * fStack_6c28;
      fStack_7b74 = fStack_6c24 * fStack_6c24;
      uStack_7bc8._0_4_ = 0x39506967;
      local_7bd0 = (undefined1  [8])0x3950696739506967;
      uStack_7bc8._4_4_ = 0x39506967;
      auVar208._8_4_ = 0.0013981999;
      auVar208._12_4_ = 0.0013981999;
      auVar208._0_4_ = 0.0013981999;
      auVar208._4_4_ = 0.0013981999;
      auVar19 = vfmadd213ps_fma(auVar17,_local_7bd0,auVar208);
      auVar209._8_4_ = 0.008333452;
      auVar209._12_4_ = 0.008333452;
      auVar209._0_4_ = 0.008333452;
      auVar209._4_4_ = 0.008333452;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar209);
      auVar210._8_4_ = 0.041665796;
      auVar210._12_4_ = 0.041665796;
      auVar210._0_4_ = 0.041665796;
      auVar210._4_4_ = 0.041665796;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar210);
      auVar211._8_4_ = 0.16666666;
      auVar211._12_4_ = 0.16666666;
      auVar211._0_4_ = 0.16666666;
      auVar211._4_4_ = 0.16666666;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar211);
      auVar212._8_4_ = 0.5;
      auVar212._12_4_ = 0.5;
      auVar212._0_4_ = 0.5;
      auVar212._4_4_ = 0.5;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar212);
      auVar19 = vfmadd213ps_fma(_local_7b80,auVar19,auVar17);
      local_7870 = auVar19._0_4_;
      fStack_786c = auVar19._4_4_;
      fStack_7868 = auVar19._8_4_;
      fStack_7864 = auVar19._12_4_;
      local_2400 = auVar18._0_4_;
      fStack_23fc = auVar18._4_4_;
      fStack_23f8 = auVar18._8_4_;
      fStack_23f4 = auVar18._12_4_;
      local_7ba0 = CONCAT44((int)fStack_23fc,(int)local_2400);
      uStack_7b98._0_4_ = (int)fStack_23f8;
      uStack_7b98._4_4_ = (int)fStack_23f4;
      auVar176._8_8_ = uStack_7b98;
      auVar176._0_8_ = local_7ba0;
      auVar175._8_8_ = 0x7f0000007f;
      auVar175._0_8_ = 0x7f0000007f;
      auVar18 = vpaddd_avx(auVar176,auVar175);
      auVar18 = vpslld_avx(auVar18,ZEXT416(0x17));
      local_6c60 = auVar18._0_4_;
      fStack_6c5c = auVar18._4_4_;
      fStack_6c58 = auVar18._8_4_;
      fStack_6c54 = auVar18._12_4_;
      local_7bd0._4_4_ = (fStack_786c + 1.0) * fStack_6c5c;
      local_7bd0._0_4_ = (local_7870 + 1.0) * local_6c60;
      uStack_7bc8._0_4_ = (fStack_7868 + 1.0) * fStack_6c58;
      uStack_7bc8._4_4_ = (fStack_7864 + 1.0) * fStack_6c54;
      uVar1 = *(undefined4 *)(*local_b068 + 8);
      auVar17._4_4_ = uVar1;
      auVar17._0_4_ = uVar1;
      auVar17._12_4_ = uVar1;
      auVar17._8_4_ = uVar1;
      auVar18 = vsubps_avx(*(undefined1 (*) [16])(*local_b060 + 0x20),auVar17);
      auVar155._8_4_ = 0x42b0c0a5;
      auVar155._0_8_ = 0x42b0c0a542b0c0a5;
      auVar155._12_4_ = 0x42b0c0a5;
      auVar18 = vminps_avx(auVar18,auVar155);
      auVar35._8_4_ = 0xc2b0c0a5;
      auVar35._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar35._12_4_ = 0xc2b0c0a5;
      auVar17 = vmaxps_avx(auVar18,auVar35);
      local_6bb0 = auVar17._0_4_;
      fStack_6bac = auVar17._4_4_;
      fStack_6ba8 = auVar17._8_4_;
      fStack_6ba4 = auVar17._12_4_;
      fVar252 = local_6bb0 * 1.442695 + 0.5;
      fVar254 = fStack_6bac * 1.442695 + 0.5;
      fVar255 = fStack_6ba8 * 1.442695 + 0.5;
      fVar256 = fStack_6ba4 * 1.442695 + 0.5;
      local_7c50 = CONCAT44(fVar254,fVar252);
      uStack_7c48._0_4_ = fVar255;
      uStack_7c48._4_4_ = fVar256;
      local_7c60 = CONCAT44((int)fVar254,(int)fVar252);
      uStack_7c58._0_4_ = (int)fVar255;
      uStack_7c58._4_4_ = (int)fVar256;
      auVar160._8_8_ = uStack_7c58;
      auVar160._0_8_ = local_7c60;
      auVar19 = vcvtdq2ps_avx(auVar160);
      auVar165._8_8_ = uStack_7c48;
      auVar165._0_8_ = local_7c50;
      auVar18 = vcmpps_avx(auVar165,auVar19,1);
      auVar170._8_8_ = 0x3f8000003f800000;
      auVar170._0_8_ = 0x3f8000003f800000;
      auVar18 = vpand_avx(auVar18,auVar170);
      auVar18 = vsubps_avx(auVar19,auVar18);
      auVar187._8_4_ = 0.6933594;
      auVar187._12_4_ = 0.6933594;
      auVar187._0_4_ = 0.6933594;
      auVar187._4_4_ = 0.6933594;
      auVar19 = vfnmadd213ps_fma(auVar187,auVar18,auVar17);
      auVar188._8_4_ = -0.00021219444;
      auVar188._12_4_ = -0.00021219444;
      auVar188._0_4_ = -0.00021219444;
      auVar188._4_4_ = -0.00021219444;
      auVar17 = vfnmadd213ps_fma(auVar188,auVar18,auVar19);
      local_6bd0 = auVar17._0_4_;
      fStack_6bcc = auVar17._4_4_;
      fStack_6bc8 = auVar17._8_4_;
      fStack_6bc4 = auVar17._12_4_;
      local_7c40._4_4_ = fStack_6bcc * fStack_6bcc;
      local_7c40._0_4_ = local_6bd0 * local_6bd0;
      fStack_7c38 = fStack_6bc8 * fStack_6bc8;
      fStack_7c34 = fStack_6bc4 * fStack_6bc4;
      uStack_7c88._0_4_ = 0x39506967;
      local_7c90 = (undefined1  [8])0x3950696739506967;
      uStack_7c88._4_4_ = 0x39506967;
      auVar203._8_4_ = 0.0013981999;
      auVar203._12_4_ = 0.0013981999;
      auVar203._0_4_ = 0.0013981999;
      auVar203._4_4_ = 0.0013981999;
      auVar19 = vfmadd213ps_fma(auVar17,_local_7c90,auVar203);
      auVar204._8_4_ = 0.008333452;
      auVar204._12_4_ = 0.008333452;
      auVar204._0_4_ = 0.008333452;
      auVar204._4_4_ = 0.008333452;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar204);
      auVar205._8_4_ = 0.041665796;
      auVar205._12_4_ = 0.041665796;
      auVar205._0_4_ = 0.041665796;
      auVar205._4_4_ = 0.041665796;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar205);
      auVar206._8_4_ = 0.16666666;
      auVar206._12_4_ = 0.16666666;
      auVar206._0_4_ = 0.16666666;
      auVar206._4_4_ = 0.16666666;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar206);
      auVar207._8_4_ = 0.5;
      auVar207._12_4_ = 0.5;
      auVar207._0_4_ = 0.5;
      auVar207._4_4_ = 0.5;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar207);
      auVar19 = vfmadd213ps_fma(_local_7c40,auVar19,auVar17);
      local_7830 = auVar19._0_4_;
      fStack_782c = auVar19._4_4_;
      fStack_7828 = auVar19._8_4_;
      fStack_7824 = auVar19._12_4_;
      local_23e0 = auVar18._0_4_;
      fStack_23dc = auVar18._4_4_;
      fStack_23d8 = auVar18._8_4_;
      fStack_23d4 = auVar18._12_4_;
      local_7c60 = CONCAT44((int)fStack_23dc,(int)local_23e0);
      uStack_7c58._0_4_ = (int)fStack_23d8;
      uStack_7c58._4_4_ = (int)fStack_23d4;
      auVar178._8_8_ = uStack_7c58;
      auVar178._0_8_ = local_7c60;
      auVar177._8_8_ = 0x7f0000007f;
      auVar177._0_8_ = 0x7f0000007f;
      auVar18 = vpaddd_avx(auVar178,auVar177);
      auVar18 = vpslld_avx(auVar18,ZEXT416(0x17));
      local_6c00 = auVar18._0_4_;
      fStack_6bfc = auVar18._4_4_;
      fStack_6bf8 = auVar18._8_4_;
      fStack_6bf4 = auVar18._12_4_;
      local_7c90._4_4_ = (fStack_782c + 1.0) * fStack_6bfc;
      local_7c90._0_4_ = (local_7830 + 1.0) * local_6c00;
      uStack_7c88._0_4_ = (fStack_7828 + 1.0) * fStack_6bf8;
      uStack_7c88._4_4_ = (fStack_7824 + 1.0) * fStack_6bf4;
      uVar1 = *(undefined4 *)(*local_b068 + 0xc);
      auVar19._4_4_ = uVar1;
      auVar19._0_4_ = uVar1;
      auVar19._12_4_ = uVar1;
      auVar19._8_4_ = uVar1;
      auVar18 = vsubps_avx(*(undefined1 (*) [16])(*local_b060 + 0x30),auVar19);
      auVar156._8_4_ = 0x42b0c0a5;
      auVar156._0_8_ = 0x42b0c0a542b0c0a5;
      auVar156._12_4_ = 0x42b0c0a5;
      auVar18 = vminps_avx(auVar18,auVar156);
      auVar34._8_4_ = 0xc2b0c0a5;
      auVar34._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar34._12_4_ = 0xc2b0c0a5;
      auVar17 = vmaxps_avx(auVar18,auVar34);
      local_6b50 = auVar17._0_4_;
      fStack_6b4c = auVar17._4_4_;
      fStack_6b48 = auVar17._8_4_;
      fStack_6b44 = auVar17._12_4_;
      fVar252 = local_6b50 * 1.442695 + 0.5;
      fVar254 = fStack_6b4c * 1.442695 + 0.5;
      fVar255 = fStack_6b48 * 1.442695 + 0.5;
      fVar256 = fStack_6b44 * 1.442695 + 0.5;
      local_7d10 = CONCAT44(fVar254,fVar252);
      uStack_7d08._0_4_ = fVar255;
      uStack_7d08._4_4_ = fVar256;
      local_7d20 = CONCAT44((int)fVar254,(int)fVar252);
      uStack_7d18._0_4_ = (int)fVar255;
      uStack_7d18._4_4_ = (int)fVar256;
      auVar161._8_8_ = uStack_7d18;
      auVar161._0_8_ = local_7d20;
      auVar19 = vcvtdq2ps_avx(auVar161);
      auVar166._8_8_ = uStack_7d08;
      auVar166._0_8_ = local_7d10;
      auVar18 = vcmpps_avx(auVar166,auVar19,1);
      auVar171._8_8_ = 0x3f8000003f800000;
      auVar171._0_8_ = 0x3f8000003f800000;
      auVar18 = vpand_avx(auVar18,auVar171);
      auVar18 = vsubps_avx(auVar19,auVar18);
      auVar185._8_4_ = 0.6933594;
      auVar185._12_4_ = 0.6933594;
      auVar185._0_4_ = 0.6933594;
      auVar185._4_4_ = 0.6933594;
      auVar19 = vfnmadd213ps_fma(auVar185,auVar18,auVar17);
      auVar186._8_4_ = -0.00021219444;
      auVar186._12_4_ = -0.00021219444;
      auVar186._0_4_ = -0.00021219444;
      auVar186._4_4_ = -0.00021219444;
      auVar17 = vfnmadd213ps_fma(auVar186,auVar18,auVar19);
      local_6b70 = auVar17._0_4_;
      fStack_6b6c = auVar17._4_4_;
      fStack_6b68 = auVar17._8_4_;
      fStack_6b64 = auVar17._12_4_;
      local_7d00._4_4_ = fStack_6b6c * fStack_6b6c;
      local_7d00._0_4_ = local_6b70 * local_6b70;
      fStack_7cf8 = fStack_6b68 * fStack_6b68;
      fStack_7cf4 = fStack_6b64 * fStack_6b64;
      uStack_7d48._0_4_ = 0x39506967;
      local_7d50 = (undefined1  [8])0x3950696739506967;
      uStack_7d48._4_4_ = 0x39506967;
      auVar198._8_4_ = 0.0013981999;
      auVar198._12_4_ = 0.0013981999;
      auVar198._0_4_ = 0.0013981999;
      auVar198._4_4_ = 0.0013981999;
      auVar19 = vfmadd213ps_fma(auVar17,_local_7d50,auVar198);
      auVar199._8_4_ = 0.008333452;
      auVar199._12_4_ = 0.008333452;
      auVar199._0_4_ = 0.008333452;
      auVar199._4_4_ = 0.008333452;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar199);
      auVar200._8_4_ = 0.041665796;
      auVar200._12_4_ = 0.041665796;
      auVar200._0_4_ = 0.041665796;
      auVar200._4_4_ = 0.041665796;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar200);
      auVar201._8_4_ = 0.16666666;
      auVar201._12_4_ = 0.16666666;
      auVar201._0_4_ = 0.16666666;
      auVar201._4_4_ = 0.16666666;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar201);
      auVar202._8_4_ = 0.5;
      auVar202._12_4_ = 0.5;
      auVar202._0_4_ = 0.5;
      auVar202._4_4_ = 0.5;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar202);
      auVar19 = vfmadd213ps_fma(_local_7d00,auVar19,auVar17);
      local_77f0 = auVar19._0_4_;
      fStack_77ec = auVar19._4_4_;
      fStack_77e8 = auVar19._8_4_;
      fStack_77e4 = auVar19._12_4_;
      local_23c0 = auVar18._0_4_;
      fStack_23bc = auVar18._4_4_;
      fStack_23b8 = auVar18._8_4_;
      fStack_23b4 = auVar18._12_4_;
      local_7d20 = CONCAT44((int)fStack_23bc,(int)local_23c0);
      uStack_7d18._0_4_ = (int)fStack_23b8;
      uStack_7d18._4_4_ = (int)fStack_23b4;
      auVar180._8_8_ = uStack_7d18;
      auVar180._0_8_ = local_7d20;
      auVar179._8_8_ = 0x7f0000007f;
      auVar179._0_8_ = 0x7f0000007f;
      auVar18 = vpaddd_avx(auVar180,auVar179);
      auVar18 = vpslld_avx(auVar18,ZEXT416(0x17));
      local_6ba0 = auVar18._0_4_;
      fStack_6b9c = auVar18._4_4_;
      fStack_6b98 = auVar18._8_4_;
      fStack_6b94 = auVar18._12_4_;
      local_7d50._4_4_ = (fStack_77ec + 1.0) * fStack_6b9c;
      local_7d50._0_4_ = (local_77f0 + 1.0) * local_6ba0;
      uStack_7d48._0_4_ = (fStack_77e8 + 1.0) * fStack_6b98;
      uStack_7d48._4_4_ = (fStack_77e4 + 1.0) * fStack_6b94;
      *(undefined1 (*) [8])*local_b060 = local_7b10;
      *(undefined8 *)(*local_b060 + 8) = uStack_7b08;
      *(undefined1 (*) [8])(*local_b060 + 0x10) = local_7bd0;
      *(undefined8 *)(*local_b060 + 0x18) = uStack_7bc8;
      *(undefined1 (*) [8])(*local_b060 + 0x20) = local_7c90;
      *(undefined8 *)(*local_b060 + 0x28) = uStack_7c88;
      *(undefined1 (*) [8])(*local_b060 + 0x30) = local_7d50;
      *(undefined8 *)(*local_b060 + 0x38) = uStack_7d48;
      auVar229._8_8_ = uStack_7b08;
      auVar229._0_8_ = local_7b10;
      auVar228._8_8_ = uStack_7bc8;
      auVar228._0_8_ = local_7bd0;
      auVar18 = vunpcklps_avx(auVar229,auVar228);
      auVar227._8_8_ = uStack_7c88;
      auVar227._0_8_ = local_7c90;
      auVar226._8_8_ = uStack_7d48;
      auVar226._0_8_ = local_7d50;
      auVar21 = vunpcklps_avx(auVar227,auVar226);
      auVar233._8_8_ = uStack_7b08;
      auVar233._0_8_ = local_7b10;
      auVar232._8_8_ = uStack_7bc8;
      auVar232._0_8_ = local_7bd0;
      auVar19 = vunpckhps_avx(auVar233,auVar232);
      auVar231._8_8_ = uStack_7c88;
      auVar231._0_8_ = local_7c90;
      auVar230._8_8_ = uStack_7d48;
      auVar230._0_8_ = local_7d50;
      auVar17 = vunpckhps_avx(auVar231,auVar230);
      auVar20 = vunpcklpd_avx(auVar18,auVar21);
      auVar18 = vunpckhpd_avx(auVar18,auVar21);
      auVar21 = vunpcklpd_avx(auVar19,auVar17);
      auVar19 = vunpckhpd_avx(auVar19,auVar17);
      local_7710 = auVar20._0_4_;
      fStack_770c = auVar20._4_4_;
      fStack_7708 = auVar20._8_4_;
      fStack_7704 = auVar20._12_4_;
      local_7720 = auVar18._0_4_;
      fStack_771c = auVar18._4_4_;
      fStack_7718 = auVar18._8_4_;
      fStack_7714 = auVar18._12_4_;
      local_7730 = auVar21._0_4_;
      fStack_772c = auVar21._4_4_;
      fStack_7728 = auVar21._8_4_;
      fStack_7724 = auVar21._12_4_;
      local_7740 = auVar19._0_4_;
      fStack_773c = auVar19._4_4_;
      fStack_7738 = auVar19._8_4_;
      fStack_7734 = auVar19._12_4_;
      local_7770 = (float)*(undefined8 *)*local_b070;
      fStack_776c = (float)((ulong)*(undefined8 *)*local_b070 >> 0x20);
      fStack_7768 = (float)*(undefined8 *)(*local_b070 + 8);
      fStack_7764 = (float)((ulong)*(undefined8 *)(*local_b070 + 8) >> 0x20);
      local_b840 = CONCAT44(fStack_776c + fStack_770c + fStack_771c + fStack_772c + fStack_773c,
                            local_7770 + local_7710 + local_7720 + local_7730 + local_7740);
      uStack_b838 = CONCAT44(fStack_7764 + fStack_7704 + fStack_7714 + fStack_7724 + fStack_7734,
                             fStack_7768 + fStack_7708 + fStack_7718 + fStack_7728 + fStack_7738);
      *(undefined8 *)*local_b070 = local_b840;
      *(undefined8 *)(*local_b070 + 8) = uStack_b838;
      local_b060 = local_b060 + 1;
      local_b068 = (undefined1 (*) [64])(*local_b068 + 0x10);
      local_b070 = (undefined1 (*) [64])(*local_b070 + 0x10);
    }
    for (; local_b074 < local_aa54; local_b074 = local_b074 + 1) {
      uVar1 = *(undefined4 *)*local_b068;
      auVar32._4_4_ = uVar1;
      auVar32._0_4_ = uVar1;
      auVar32._12_4_ = uVar1;
      auVar32._8_4_ = uVar1;
      auVar18 = vsubps_avx(*(undefined1 (*) [16])*local_b060,auVar32);
      auVar157._8_4_ = 0x42b0c0a5;
      auVar157._0_8_ = 0x42b0c0a542b0c0a5;
      auVar157._12_4_ = 0x42b0c0a5;
      auVar18 = vminps_avx(auVar18,auVar157);
      auVar33._8_4_ = 0xc2b0c0a5;
      auVar33._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar33._12_4_ = 0xc2b0c0a5;
      auVar17 = vmaxps_avx(auVar18,auVar33);
      local_6af0 = auVar17._0_4_;
      fStack_6aec = auVar17._4_4_;
      fStack_6ae8 = auVar17._8_4_;
      fStack_6ae4 = auVar17._12_4_;
      fVar252 = local_6af0 * 1.442695 + 0.5;
      fVar254 = fStack_6aec * 1.442695 + 0.5;
      fVar255 = fStack_6ae8 * 1.442695 + 0.5;
      fVar256 = fStack_6ae4 * 1.442695 + 0.5;
      local_7dd0 = CONCAT44(fVar254,fVar252);
      uStack_7dc8._0_4_ = fVar255;
      uStack_7dc8._4_4_ = fVar256;
      local_7de0 = CONCAT44((int)fVar254,(int)fVar252);
      uStack_7dd8._0_4_ = (int)fVar255;
      uStack_7dd8._4_4_ = (int)fVar256;
      auVar162._8_8_ = uStack_7dd8;
      auVar162._0_8_ = local_7de0;
      auVar19 = vcvtdq2ps_avx(auVar162);
      auVar167._8_8_ = uStack_7dc8;
      auVar167._0_8_ = local_7dd0;
      auVar18 = vcmpps_avx(auVar167,auVar19,1);
      auVar172._8_8_ = 0x3f8000003f800000;
      auVar172._0_8_ = 0x3f8000003f800000;
      auVar18 = vpand_avx(auVar18,auVar172);
      auVar18 = vsubps_avx(auVar19,auVar18);
      auVar183._8_4_ = 0.6933594;
      auVar183._12_4_ = 0.6933594;
      auVar183._0_4_ = 0.6933594;
      auVar183._4_4_ = 0.6933594;
      auVar19 = vfnmadd213ps_fma(auVar183,auVar18,auVar17);
      auVar184._8_4_ = -0.00021219444;
      auVar184._12_4_ = -0.00021219444;
      auVar184._0_4_ = -0.00021219444;
      auVar184._4_4_ = -0.00021219444;
      auVar17 = vfnmadd213ps_fma(auVar184,auVar18,auVar19);
      local_6b10 = auVar17._0_4_;
      fStack_6b0c = auVar17._4_4_;
      fStack_6b08 = auVar17._8_4_;
      fStack_6b04 = auVar17._12_4_;
      local_7dc0._4_4_ = fStack_6b0c * fStack_6b0c;
      local_7dc0._0_4_ = local_6b10 * local_6b10;
      fStack_7db8 = fStack_6b08 * fStack_6b08;
      fStack_7db4 = fStack_6b04 * fStack_6b04;
      uStack_7e08._0_4_ = 0x39506967;
      local_7e10 = (undefined1  [8])0x3950696739506967;
      uStack_7e08._4_4_ = 0x39506967;
      auVar193._8_4_ = 0.0013981999;
      auVar193._12_4_ = 0.0013981999;
      auVar193._0_4_ = 0.0013981999;
      auVar193._4_4_ = 0.0013981999;
      auVar19 = vfmadd213ps_fma(auVar17,_local_7e10,auVar193);
      auVar194._8_4_ = 0.008333452;
      auVar194._12_4_ = 0.008333452;
      auVar194._0_4_ = 0.008333452;
      auVar194._4_4_ = 0.008333452;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar194);
      auVar195._8_4_ = 0.041665796;
      auVar195._12_4_ = 0.041665796;
      auVar195._0_4_ = 0.041665796;
      auVar195._4_4_ = 0.041665796;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar195);
      auVar196._8_4_ = 0.16666666;
      auVar196._12_4_ = 0.16666666;
      auVar196._0_4_ = 0.16666666;
      auVar196._4_4_ = 0.16666666;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar196);
      auVar197._8_4_ = 0.5;
      auVar197._12_4_ = 0.5;
      auVar197._0_4_ = 0.5;
      auVar197._4_4_ = 0.5;
      auVar19 = vfmadd213ps_fma(auVar17,auVar19,auVar197);
      auVar19 = vfmadd213ps_fma(_local_7dc0,auVar19,auVar17);
      local_77b0 = auVar19._0_4_;
      fStack_77ac = auVar19._4_4_;
      fStack_77a8 = auVar19._8_4_;
      fStack_77a4 = auVar19._12_4_;
      local_23a0 = auVar18._0_4_;
      fStack_239c = auVar18._4_4_;
      fStack_2398 = auVar18._8_4_;
      fStack_2394 = auVar18._12_4_;
      local_7de0 = CONCAT44((int)fStack_239c,(int)local_23a0);
      uStack_7dd8._0_4_ = (int)fStack_2398;
      uStack_7dd8._4_4_ = (int)fStack_2394;
      auVar182._8_8_ = uStack_7dd8;
      auVar182._0_8_ = local_7de0;
      auVar181._8_8_ = 0x7f0000007f;
      auVar181._0_8_ = 0x7f0000007f;
      auVar18 = vpaddd_avx(auVar182,auVar181);
      auVar18 = vpslld_avx(auVar18,ZEXT416(0x17));
      local_6b40 = auVar18._0_4_;
      fStack_6b3c = auVar18._4_4_;
      fStack_6b38 = auVar18._8_4_;
      fStack_6b34 = auVar18._12_4_;
      local_7e10._0_4_ = (local_77b0 + 1.0) * local_6b40;
      local_7e10._4_4_ = (fStack_77ac + 1.0) * fStack_6b3c;
      uStack_7e08._0_4_ = (fStack_77a8 + 1.0) * fStack_6b38;
      uStack_7e08._4_4_ = (fStack_77a4 + 1.0) * fStack_6b34;
      *(undefined1 (*) [8])*local_b060 = local_7e10;
      *(undefined8 *)(*local_b060 + 8) = uStack_7e08;
      auVar41._8_8_ = uStack_7e08;
      auVar41._0_8_ = local_7e10;
      auVar40._8_8_ = uStack_7e08;
      auVar40._0_8_ = local_7e10;
      auVar18 = vunpckhpd_avx(auVar40,auVar41);
      local_75e0 = auVar18._0_4_;
      fStack_75dc = auVar18._4_4_;
      *(float *)*local_b070 =
           (float)local_7e10._0_4_ + local_75e0 + (float)local_7e10._4_4_ + fStack_75dc +
           *(float *)*local_b070;
      local_b060 = (undefined1 (*) [64])(*local_b060 + 0x10);
      local_b068 = (undefined1 (*) [64])(*local_b068 + 4);
      local_b070 = (undefined1 (*) [64])(*local_b070 + 4);
    }
  }
  local_b868 = local_aa68;
  local_b86c = 0;
  auVar239 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
  for (; local_b86c + 0xf < local_aa54; local_b86c = local_b86c + 0x10) {
    auVar240 = vdivps_avx512f(auVar239,*local_b868);
    local_b900 = auVar240._0_8_;
    uStack_b8f8 = auVar240._8_8_;
    uStack_b8f0 = auVar240._16_8_;
    uStack_b8e8 = auVar240._24_8_;
    uStack_b8e0 = auVar240._32_8_;
    uStack_b8d8 = auVar240._40_8_;
    uStack_b8d0 = auVar240._48_8_;
    uStack_b8c8 = auVar240._56_8_;
    *(undefined8 *)*local_b868 = local_b900;
    *(undefined8 *)(*local_b868 + 8) = uStack_b8f8;
    *(undefined8 *)(*local_b868 + 0x10) = uStack_b8f0;
    *(undefined8 *)(*local_b868 + 0x18) = uStack_b8e8;
    *(undefined8 *)(*local_b868 + 0x20) = uStack_b8e0;
    *(undefined8 *)(*local_b868 + 0x28) = uStack_b8d8;
    *(undefined8 *)(*local_b868 + 0x30) = uStack_b8d0;
    *(undefined8 *)(*local_b868 + 0x38) = uStack_b8c8;
    local_b868 = local_b868 + 1;
  }
  auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
  auVar19 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3f800000),0x20);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3f800000),0x30);
  uStack_6a30 = auVar18._0_8_;
  uStack_6a28 = auVar18._8_8_;
  for (; local_b86c + 7 < local_aa54; local_b86c = local_b86c + 8) {
    auVar38._16_8_ = uStack_6a30;
    auVar38._0_16_ = auVar19;
    auVar38._24_8_ = uStack_6a28;
    auVar257 = vdivps_avx(auVar38,*(undefined1 (*) [32])*local_b868);
    local_b940 = auVar257._0_8_;
    uStack_b938 = auVar257._8_8_;
    uStack_b930 = auVar257._16_8_;
    uStack_b928 = auVar257._24_8_;
    *(undefined8 *)*local_b868 = local_b940;
    *(undefined8 *)(*local_b868 + 8) = uStack_b938;
    *(undefined8 *)(*local_b868 + 0x10) = uStack_b930;
    *(undefined8 *)(*local_b868 + 0x18) = uStack_b928;
    local_b868 = (undefined1 (*) [64])(*local_b868 + 0x20);
  }
  for (; local_b86c + 3 < local_aa54; local_b86c = local_b86c + 4) {
    auVar39._8_8_ = 0x3f8000003f800000;
    auVar39._0_8_ = 0x3f8000003f800000;
    auVar18 = vdivps_avx(auVar39,*(undefined1 (*) [16])*local_b868);
    local_b960 = auVar18._0_8_;
    uStack_b958 = auVar18._8_8_;
    *(undefined8 *)*local_b868 = local_b960;
    *(undefined8 *)(*local_b868 + 8) = uStack_b958;
    local_b868 = (undefined1 (*) [64])(*local_b868 + 0x10);
  }
  for (; local_b86c < local_aa54; local_b86c = local_b86c + 1) {
    *(float *)*local_b868 = 1.0 / *(float *)*local_b868;
    local_b868 = (undefined1 (*) [64])(*local_b868 + 4);
  }
  for (local_b964 = 0; local_b964 < local_aa4c; local_b964 = local_b964 + 1) {
    local_b970 = (undefined1 (*) [64])(local_aa48 + (long)(local_b964 * local_aa50) * 4);
    local_b978 = local_aa68;
    local_b97c = 0;
    auVar18 = vpinsrd_avx(ZEXT416(3),3,1);
    auVar18 = vpinsrd_avx(auVar18,3,2);
    auVar18 = vpinsrd_avx(auVar18,3,3);
    auVar19 = vpinsrd_avx(ZEXT416(2),2,1);
    auVar19 = vpinsrd_avx(auVar19,2,2);
    auVar19 = vpinsrd_avx(auVar19,2,3);
    auVar262._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
    auVar262._16_16_ = ZEXT116(1) * auVar18;
    auVar18 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar18 = vpinsrd_avx(auVar18,1,2);
    auVar18 = vpinsrd_avx(auVar18,1,3);
    auVar19 = vpinsrd_avx(ZEXT416(0),0,1);
    auVar19 = vpinsrd_avx(auVar19,0,2);
    auVar19 = vpinsrd_avx(auVar19,0,3);
    auVar239 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar18,
                                              ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19)),auVar262
                          ,1);
    auVar239 = vmovdqa64_avx512f(auVar239);
    auVar239 = vmovdqa64_avx512f(auVar239);
    auVar239 = vmovdqa64_avx512f(auVar239);
    auVar18 = vpinsrd_avx(ZEXT416(7),7,1);
    auVar18 = vpinsrd_avx(auVar18,7,2);
    auVar18 = vpinsrd_avx(auVar18,7,3);
    auVar19 = vpinsrd_avx(ZEXT416(6),6,1);
    auVar19 = vpinsrd_avx(auVar19,6,2);
    auVar19 = vpinsrd_avx(auVar19,6,3);
    auVar263._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
    auVar263._16_16_ = ZEXT116(1) * auVar18;
    auVar18 = vpinsrd_avx(ZEXT416(5),5,1);
    auVar18 = vpinsrd_avx(auVar18,5,2);
    auVar18 = vpinsrd_avx(auVar18,5,3);
    auVar19 = vpinsrd_avx(ZEXT416(4),4,1);
    auVar19 = vpinsrd_avx(auVar19,4,2);
    auVar19 = vpinsrd_avx(auVar19,4,3);
    auVar240 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar18,
                                              ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19)),auVar263
                          ,1);
    auVar240 = vmovdqa64_avx512f(auVar240);
    auVar240 = vmovdqa64_avx512f(auVar240);
    auVar240 = vmovdqa64_avx512f(auVar240);
    auVar18 = vpinsrd_avx(ZEXT416(0xb),0xb,1);
    auVar18 = vpinsrd_avx(auVar18,0xb,2);
    auVar18 = vpinsrd_avx(auVar18,0xb,3);
    auVar19 = vpinsrd_avx(ZEXT416(10),10,1);
    auVar19 = vpinsrd_avx(auVar19,10,2);
    auVar19 = vpinsrd_avx(auVar19,10,3);
    auVar264._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
    auVar264._16_16_ = ZEXT116(1) * auVar18;
    auVar18 = vpinsrd_avx(ZEXT416(9),9,1);
    auVar18 = vpinsrd_avx(auVar18,9,2);
    auVar18 = vpinsrd_avx(auVar18,9,3);
    auVar19 = vpinsrd_avx(ZEXT416(8),8,1);
    auVar19 = vpinsrd_avx(auVar19,8,2);
    auVar19 = vpinsrd_avx(auVar19,8,3);
    auVar241 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar18,
                                              ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19)),auVar264
                          ,1);
    auVar241 = vmovdqa64_avx512f(auVar241);
    auVar241 = vmovdqa64_avx512f(auVar241);
    auVar241 = vmovdqa64_avx512f(auVar241);
    auVar18 = vpinsrd_avx(ZEXT416(0xf),0xf,1);
    auVar18 = vpinsrd_avx(auVar18,0xf,2);
    auVar18 = vpinsrd_avx(auVar18,0xf,3);
    auVar19 = vpinsrd_avx(ZEXT416(0xe),0xe,1);
    auVar19 = vpinsrd_avx(auVar19,0xe,2);
    auVar19 = vpinsrd_avx(auVar19,0xe,3);
    auVar265._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19;
    auVar265._16_16_ = ZEXT116(1) * auVar18;
    auVar18 = vpinsrd_avx(ZEXT416(0xd),0xd,1);
    auVar18 = vpinsrd_avx(auVar18,0xd,2);
    auVar18 = vpinsrd_avx(auVar18,0xd,3);
    auVar19 = vpinsrd_avx(ZEXT416(0xc),0xc,1);
    auVar19 = vpinsrd_avx(auVar19,0xc,2);
    auVar19 = vpinsrd_avx(auVar19,0xc,3);
    auVar242 = vinserti64x4_avx512f
                         (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar18,
                                              ZEXT116(0) * auVar18 + ZEXT116(1) * auVar19)),auVar265
                          ,1);
    auVar242 = vmovdqa64_avx512f(auVar242);
    auVar242 = vmovdqa64_avx512f(auVar242);
    auVar242 = vmovdqa64_avx512f(auVar242);
    for (; local_b97c + 0xf < local_aa54; local_b97c = local_b97c + 0x10) {
      auVar243 = vmovdqa64_avx512f(auVar239);
      auVar243 = vmovdqa64_avx512f(auVar243);
      auVar243 = vmovdqa64_avx512f(auVar243);
      auVar244 = vpermps_avx512f(auVar243,*local_b978);
      auVar243 = vmovdqa64_avx512f(auVar240);
      auVar243 = vmovdqa64_avx512f(auVar243);
      auVar243 = vmovdqa64_avx512f(auVar243);
      auVar245 = vpermps_avx512f(auVar243,*local_b978);
      auVar243 = vmovdqa64_avx512f(auVar241);
      auVar243 = vmovdqa64_avx512f(auVar243);
      auVar243 = vmovdqa64_avx512f(auVar243);
      auVar246 = vpermps_avx512f(auVar243,*local_b978);
      auVar243 = vmovdqa64_avx512f(auVar242);
      auVar243 = vmovdqa64_avx512f(auVar243);
      auVar243 = vmovdqa64_avx512f(auVar243);
      auVar243 = vpermps_avx512f(auVar243,*local_b978);
      auVar244 = vmulps_avx512f(*local_b970,auVar244);
      auVar245 = vmulps_avx512f(local_b970[1],auVar245);
      auVar246 = vmulps_avx512f(local_b970[2],auVar246);
      auVar243 = vmulps_avx512f(local_b970[3],auVar243);
      local_bac0 = auVar244._0_8_;
      uStack_bab8 = auVar244._8_8_;
      uStack_bab0 = auVar244._16_8_;
      uStack_baa8 = auVar244._24_8_;
      uStack_baa0 = auVar244._32_8_;
      uStack_ba98 = auVar244._40_8_;
      uStack_ba90 = auVar244._48_8_;
      uStack_ba88 = auVar244._56_8_;
      *(undefined8 *)*local_b970 = local_bac0;
      *(undefined8 *)(*local_b970 + 8) = uStack_bab8;
      *(undefined8 *)(*local_b970 + 0x10) = uStack_bab0;
      *(undefined8 *)(*local_b970 + 0x18) = uStack_baa8;
      *(undefined8 *)(*local_b970 + 0x20) = uStack_baa0;
      *(undefined8 *)(*local_b970 + 0x28) = uStack_ba98;
      *(undefined8 *)(*local_b970 + 0x30) = uStack_ba90;
      *(undefined8 *)(*local_b970 + 0x38) = uStack_ba88;
      local_bb00 = auVar245._0_8_;
      uStack_baf8 = auVar245._8_8_;
      uStack_baf0 = auVar245._16_8_;
      uStack_bae8 = auVar245._24_8_;
      uStack_bae0 = auVar245._32_8_;
      uStack_bad8 = auVar245._40_8_;
      uStack_bad0 = auVar245._48_8_;
      uStack_bac8 = auVar245._56_8_;
      *(undefined8 *)local_b970[1] = local_bb00;
      *(undefined8 *)(local_b970[1] + 8) = uStack_baf8;
      *(undefined8 *)(local_b970[1] + 0x10) = uStack_baf0;
      *(undefined8 *)(local_b970[1] + 0x18) = uStack_bae8;
      *(undefined8 *)(local_b970[1] + 0x20) = uStack_bae0;
      *(undefined8 *)(local_b970[1] + 0x28) = uStack_bad8;
      *(undefined8 *)(local_b970[1] + 0x30) = uStack_bad0;
      *(undefined8 *)(local_b970[1] + 0x38) = uStack_bac8;
      local_bb40 = auVar246._0_8_;
      uStack_bb38 = auVar246._8_8_;
      uStack_bb30 = auVar246._16_8_;
      uStack_bb28 = auVar246._24_8_;
      uStack_bb20 = auVar246._32_8_;
      uStack_bb18 = auVar246._40_8_;
      uStack_bb10 = auVar246._48_8_;
      uStack_bb08 = auVar246._56_8_;
      *(undefined8 *)local_b970[2] = local_bb40;
      *(undefined8 *)(local_b970[2] + 8) = uStack_bb38;
      *(undefined8 *)(local_b970[2] + 0x10) = uStack_bb30;
      *(undefined8 *)(local_b970[2] + 0x18) = uStack_bb28;
      *(undefined8 *)(local_b970[2] + 0x20) = uStack_bb20;
      *(undefined8 *)(local_b970[2] + 0x28) = uStack_bb18;
      *(undefined8 *)(local_b970[2] + 0x30) = uStack_bb10;
      *(undefined8 *)(local_b970[2] + 0x38) = uStack_bb08;
      local_bb80 = auVar243._0_8_;
      uStack_bb78 = auVar243._8_8_;
      uStack_bb70 = auVar243._16_8_;
      uStack_bb68 = auVar243._24_8_;
      uStack_bb60 = auVar243._32_8_;
      uStack_bb58 = auVar243._40_8_;
      uStack_bb50 = auVar243._48_8_;
      uStack_bb48 = auVar243._56_8_;
      *(undefined8 *)local_b970[3] = local_bb80;
      *(undefined8 *)(local_b970[3] + 8) = uStack_bb78;
      *(undefined8 *)(local_b970[3] + 0x10) = uStack_bb70;
      *(undefined8 *)(local_b970[3] + 0x18) = uStack_bb68;
      *(undefined8 *)(local_b970[3] + 0x20) = uStack_bb60;
      *(undefined8 *)(local_b970[3] + 0x28) = uStack_bb58;
      *(undefined8 *)(local_b970[3] + 0x30) = uStack_bb50;
      *(undefined8 *)(local_b970[3] + 0x38) = uStack_bb48;
      local_b970 = local_b970 + 4;
      local_b978 = local_b978 + 1;
    }
    for (; local_b97c + 7 < local_aa54; local_b97c = local_b97c + 8) {
      fVar252 = *(float *)*local_b978;
      fVar254 = *(float *)(*local_b978 + 4);
      local_6ce0 = (float)*(undefined8 *)*local_b970;
      fStack_6cdc = (float)((ulong)*(undefined8 *)*local_b970 >> 0x20);
      fStack_6cd8 = (float)*(undefined8 *)(*local_b970 + 8);
      fStack_6cd4 = (float)((ulong)*(undefined8 *)(*local_b970 + 8) >> 0x20);
      fStack_6cd0 = (float)*(undefined8 *)(*local_b970 + 0x10);
      fStack_6ccc = (float)((ulong)*(undefined8 *)(*local_b970 + 0x10) >> 0x20);
      fStack_6cc8 = (float)*(undefined8 *)(*local_b970 + 0x18);
      uStack_6cc4 = (undefined4)((ulong)*(undefined8 *)(*local_b970 + 0x18) >> 0x20);
      local_bce0 = CONCAT44(fStack_6cdc * fVar252,local_6ce0 * fVar252);
      uStack_bcd8 = CONCAT44(fStack_6cd4 * fVar252,fStack_6cd8 * fVar252);
      uStack_bcd0 = CONCAT44(fStack_6ccc * fVar254,fStack_6cd0 * fVar254);
      uStack_bcc8 = CONCAT44(uStack_6cc4,fStack_6cc8 * fVar254);
      fVar252 = *(float *)(*local_b978 + 8);
      fVar254 = *(float *)(*local_b978 + 0xc);
      local_6d20 = (float)*(undefined8 *)(*local_b970 + 0x20);
      fStack_6d1c = (float)((ulong)*(undefined8 *)(*local_b970 + 0x20) >> 0x20);
      fStack_6d18 = (float)*(undefined8 *)(*local_b970 + 0x28);
      fStack_6d14 = (float)((ulong)*(undefined8 *)(*local_b970 + 0x28) >> 0x20);
      fStack_6d10 = (float)*(undefined8 *)(*local_b970 + 0x30);
      fStack_6d0c = (float)((ulong)*(undefined8 *)(*local_b970 + 0x30) >> 0x20);
      fStack_6d08 = (float)*(undefined8 *)(*local_b970 + 0x38);
      uStack_6d04 = (undefined4)((ulong)*(undefined8 *)(*local_b970 + 0x38) >> 0x20);
      local_bd00 = CONCAT44(fStack_6d1c * fVar252,local_6d20 * fVar252);
      uStack_bcf8 = CONCAT44(fStack_6d14 * fVar252,fStack_6d18 * fVar252);
      uStack_bcf0 = CONCAT44(fStack_6d0c * fVar254,fStack_6d10 * fVar254);
      uStack_bce8 = CONCAT44(uStack_6d04,fStack_6d08 * fVar254);
      fVar252 = *(float *)(*local_b978 + 0x10);
      fVar254 = *(float *)(*local_b978 + 0x14);
      local_6d60 = (float)*(undefined8 *)local_b970[1];
      fStack_6d5c = (float)((ulong)*(undefined8 *)local_b970[1] >> 0x20);
      fStack_6d58 = (float)*(undefined8 *)(local_b970[1] + 8);
      fStack_6d54 = (float)((ulong)*(undefined8 *)(local_b970[1] + 8) >> 0x20);
      fStack_6d50 = (float)*(undefined8 *)(local_b970[1] + 0x10);
      fStack_6d4c = (float)((ulong)*(undefined8 *)(local_b970[1] + 0x10) >> 0x20);
      fStack_6d48 = (float)*(undefined8 *)(local_b970[1] + 0x18);
      uStack_6d44 = (undefined4)((ulong)*(undefined8 *)(local_b970[1] + 0x18) >> 0x20);
      local_bd20 = CONCAT44(fStack_6d5c * fVar252,local_6d60 * fVar252);
      uStack_bd18 = CONCAT44(fStack_6d54 * fVar252,fStack_6d58 * fVar252);
      uStack_bd10 = CONCAT44(fStack_6d4c * fVar254,fStack_6d50 * fVar254);
      uStack_bd08 = CONCAT44(uStack_6d44,fStack_6d48 * fVar254);
      fVar252 = *(float *)(*local_b978 + 0x18);
      fVar254 = *(float *)(*local_b978 + 0x1c);
      local_6da0 = (float)*(undefined8 *)(local_b970[1] + 0x20);
      fStack_6d9c = (float)((ulong)*(undefined8 *)(local_b970[1] + 0x20) >> 0x20);
      fStack_6d98 = (float)*(undefined8 *)(local_b970[1] + 0x28);
      fStack_6d94 = (float)((ulong)*(undefined8 *)(local_b970[1] + 0x28) >> 0x20);
      fStack_6d90 = (float)*(undefined8 *)(local_b970[1] + 0x30);
      fStack_6d8c = (float)((ulong)*(undefined8 *)(local_b970[1] + 0x30) >> 0x20);
      fStack_6d88 = (float)*(undefined8 *)(local_b970[1] + 0x38);
      uStack_6d84 = (undefined4)((ulong)*(undefined8 *)(local_b970[1] + 0x38) >> 0x20);
      local_bd40 = CONCAT44(fStack_6d9c * fVar252,local_6da0 * fVar252);
      uStack_bd38 = CONCAT44(fStack_6d94 * fVar252,fStack_6d98 * fVar252);
      uStack_bd30 = CONCAT44(fStack_6d8c * fVar254,fStack_6d90 * fVar254);
      uStack_bd28 = CONCAT44(uStack_6d84,fStack_6d88 * fVar254);
      *(undefined8 *)*local_b970 = local_bce0;
      *(undefined8 *)(*local_b970 + 8) = uStack_bcd8;
      *(undefined8 *)(*local_b970 + 0x10) = uStack_bcd0;
      *(undefined8 *)(*local_b970 + 0x18) = uStack_bcc8;
      *(undefined8 *)(*local_b970 + 0x20) = local_bd00;
      *(undefined8 *)(*local_b970 + 0x28) = uStack_bcf8;
      *(undefined8 *)(*local_b970 + 0x30) = uStack_bcf0;
      *(undefined8 *)(*local_b970 + 0x38) = uStack_bce8;
      *(undefined8 *)local_b970[1] = local_bd20;
      *(undefined8 *)(local_b970[1] + 8) = uStack_bd18;
      *(undefined8 *)(local_b970[1] + 0x10) = uStack_bd10;
      *(undefined8 *)(local_b970[1] + 0x18) = uStack_bd08;
      *(undefined8 *)(local_b970[1] + 0x20) = local_bd40;
      *(undefined8 *)(local_b970[1] + 0x28) = uStack_bd38;
      *(undefined8 *)(local_b970[1] + 0x30) = uStack_bd30;
      *(undefined8 *)(local_b970[1] + 0x38) = uStack_bd28;
      local_b970 = local_b970 + 2;
      local_b978 = (undefined1 (*) [64])(*local_b978 + 0x20);
    }
    for (; local_b97c + 3 < local_aa54; local_b97c = local_b97c + 4) {
      fVar252 = *(float *)*local_b978;
      local_6a50 = (float)*(undefined8 *)*local_b970;
      fStack_6a4c = (float)((ulong)*(undefined8 *)*local_b970 >> 0x20);
      fStack_6a48 = (float)*(undefined8 *)(*local_b970 + 8);
      fStack_6a44 = (float)((ulong)*(undefined8 *)(*local_b970 + 8) >> 0x20);
      local_bd50 = CONCAT44(fStack_6a4c * fVar252,local_6a50 * fVar252);
      uStack_bd48 = CONCAT44(fStack_6a44 * fVar252,fStack_6a48 * fVar252);
      fVar252 = *(float *)(*local_b978 + 4);
      local_6a70 = (float)*(undefined8 *)(*local_b970 + 0x10);
      fStack_6a6c = (float)((ulong)*(undefined8 *)(*local_b970 + 0x10) >> 0x20);
      fStack_6a68 = (float)*(undefined8 *)(*local_b970 + 0x18);
      fStack_6a64 = (float)((ulong)*(undefined8 *)(*local_b970 + 0x18) >> 0x20);
      local_bd60 = CONCAT44(fStack_6a6c * fVar252,local_6a70 * fVar252);
      uStack_bd58 = CONCAT44(fStack_6a64 * fVar252,fStack_6a68 * fVar252);
      fVar252 = *(float *)(*local_b978 + 8);
      local_6a90 = (float)*(undefined8 *)(*local_b970 + 0x20);
      fStack_6a8c = (float)((ulong)*(undefined8 *)(*local_b970 + 0x20) >> 0x20);
      fStack_6a88 = (float)*(undefined8 *)(*local_b970 + 0x28);
      fStack_6a84 = (float)((ulong)*(undefined8 *)(*local_b970 + 0x28) >> 0x20);
      local_bd70 = CONCAT44(fStack_6a8c * fVar252,local_6a90 * fVar252);
      uStack_bd68 = CONCAT44(fStack_6a84 * fVar252,fStack_6a88 * fVar252);
      fVar252 = *(float *)(*local_b978 + 0xc);
      local_6ab0 = (float)*(undefined8 *)(*local_b970 + 0x30);
      fStack_6aac = (float)((ulong)*(undefined8 *)(*local_b970 + 0x30) >> 0x20);
      fStack_6aa8 = (float)*(undefined8 *)(*local_b970 + 0x38);
      fStack_6aa4 = (float)((ulong)*(undefined8 *)(*local_b970 + 0x38) >> 0x20);
      local_bd80 = CONCAT44(fStack_6aac * fVar252,local_6ab0 * fVar252);
      uStack_bd78 = CONCAT44(fStack_6aa4 * fVar252,fStack_6aa8 * fVar252);
      *(undefined8 *)*local_b970 = local_bd50;
      *(undefined8 *)(*local_b970 + 8) = uStack_bd48;
      *(undefined8 *)(*local_b970 + 0x10) = local_bd60;
      *(undefined8 *)(*local_b970 + 0x18) = uStack_bd58;
      *(undefined8 *)(*local_b970 + 0x20) = local_bd70;
      *(undefined8 *)(*local_b970 + 0x28) = uStack_bd68;
      *(undefined8 *)(*local_b970 + 0x30) = local_bd80;
      *(undefined8 *)(*local_b970 + 0x38) = uStack_bd78;
      local_b970 = local_b970 + 1;
      local_b978 = (undefined1 (*) [64])(*local_b978 + 0x10);
    }
    for (; local_b97c < local_aa54; local_b97c = local_b97c + 1) {
      fVar252 = *(float *)*local_b978;
      local_6ad0 = (float)*(undefined8 *)*local_b970;
      fStack_6acc = (float)((ulong)*(undefined8 *)*local_b970 >> 0x20);
      fStack_6ac8 = (float)*(undefined8 *)(*local_b970 + 8);
      fStack_6ac4 = (float)((ulong)*(undefined8 *)(*local_b970 + 8) >> 0x20);
      local_bd90 = CONCAT44(fStack_6acc * fVar252,local_6ad0 * fVar252);
      uStack_bd88 = CONCAT44(fStack_6ac4 * fVar252,fStack_6ac8 * fVar252);
      *(undefined8 *)*local_b970 = local_bd90;
      *(undefined8 *)(*local_b970 + 8) = uStack_bd88;
      local_b970 = (undefined1 (*) [64])(*local_b970 + 0x10);
      local_b978 = (undefined1 (*) [64])(*local_b978 + 4);
    }
  }
  return;
}

Assistant:

static void softmax_pack4(float* _ptr, int elemcount, int stride, int size1, float* _maxptr, float* _sumptr)
{
    // reduce max
    for (int i = 0; i < elemcount; i++)
    {
        const float* ptr = _ptr + i * stride;
        float* maxptr = _maxptr;

        int j = 0;
#if __AVX__
#if __AVX512F__
        __m512i _pidx = _mm512_setr_epi32(0, 4, 8, 12, 2, 6, 10, 14, 1, 5, 9, 13, 3, 7, 11, 15);
        for (; j + 15 < size1; j += 16)
        {
            __m512 _p0 = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr + 16);
            __m512 _p2 = _mm512_loadu_ps(ptr + 32);
            __m512 _p3 = _mm512_loadu_ps(ptr + 48);

            __m512 _tmp0 = _mm512_unpacklo_ps(_p0, _p1);
            __m512 _tmp1 = _mm512_unpackhi_ps(_p0, _p1);
            __m512 _tmp2 = _mm512_unpacklo_ps(_p2, _p3);
            __m512 _tmp3 = _mm512_unpackhi_ps(_p2, _p3);

            __m512 _max01 = _mm512_max_ps(_tmp0, _tmp1);
            __m512 _max23 = _mm512_max_ps(_tmp2, _tmp3);

            _tmp0 = _mm512_unpacklo_ps(_max01, _max23);
            _tmp1 = _mm512_unpackhi_ps(_max01, _max23);

            __m512 _max0123 = _mm512_max_ps(_tmp0, _tmp1);

            _max0123 = _mm512_permutexvar_ps(_pidx, _max0123);

            __m512 _max = _mm512_loadu_ps(maxptr);
            _max = _mm512_max_ps(_max, _max0123);
            _mm512_storeu_ps(maxptr, _max);
            ptr += 64;
            maxptr += 16;
        }
#endif // __AVX512F__
        for (; j + 7 < size1; j += 8)
        {
            __m256 _p0 = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr + 8);
            __m256 _p2 = _mm256_loadu_ps(ptr + 16);
            __m256 _p3 = _mm256_loadu_ps(ptr + 24);

            __m256 _tmp0 = _mm256_unpacklo_ps(_p0, _p1);
            __m256 _tmp1 = _mm256_unpackhi_ps(_p0, _p1);
            __m256 _tmp2 = _mm256_unpacklo_ps(_p2, _p3);
            __m256 _tmp3 = _mm256_unpackhi_ps(_p2, _p3);
            __m256 _max01 = _mm256_max_ps(_tmp0, _tmp1);
            __m256 _max23 = _mm256_max_ps(_tmp2, _tmp3);

            _tmp0 = _mm256_permute2f128_ps(_max01, _max23, _MM_SHUFFLE(0, 2, 0, 0));
            _tmp1 = _mm256_permute2f128_ps(_max01, _max23, _MM_SHUFFLE(0, 3, 0, 1));
            _max01 = _mm256_unpacklo_ps(_tmp0, _tmp1);
            _max23 = _mm256_unpackhi_ps(_tmp0, _tmp1);
            __m256 _max0123 = _mm256_max_ps(_max01, _max23);
            __m256 _max = _mm256_loadu_ps(maxptr);
            _max = _mm256_max_ps(_max, _max0123);
            _mm256_storeu_ps(maxptr, _max);
            ptr += 32;
            maxptr += 8;
        }
#endif // __AVX__
        for (; j + 3 < size1; j += 4)
        {
            __m128 _p0 = _mm_loadu_ps(ptr);
            __m128 _p1 = _mm_loadu_ps(ptr + 4);
            __m128 _p2 = _mm_loadu_ps(ptr + 8);
            __m128 _p3 = _mm_loadu_ps(ptr + 12);
            _MM_TRANSPOSE4_PS(_p0, _p1, _p2, _p3);
            __m128 _max01 = _mm_max_ps(_p0, _p1);
            __m128 _max23 = _mm_max_ps(_p2, _p3);
            __m128 _max0123 = _mm_max_ps(_max01, _max23);
            __m128 _max = _mm_loadu_ps(maxptr);
            _max = _mm_max_ps(_max, _max0123);
            _mm_storeu_ps(maxptr, _max);
            ptr += 16;
            maxptr += 4;
        }
        for (; j < size1; j++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            *maxptr = std::max(*maxptr, _mm_reduce_max_ps(_p));
            ptr += 4;
            maxptr++;
        }
    }

    // reduce exp(x - max)
    for (int i = 0; i < elemcount; i++)
    {
        float* ptr = _ptr + i * stride;
        const float* maxptr = _maxptr;
        float* sumptr = _sumptr;

        int j = 0;
#if __AVX__
#if __AVX512F__
        __m512i _pidx0 = _mm512_setr_epi32(0, 0, 0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3);
        __m512i _pidx1 = _mm512_setr_epi32(4, 4, 4, 4, 5, 5, 5, 5, 6, 6, 6, 6, 7, 7, 7, 7);
        __m512i _pidx2 = _mm512_setr_epi32(8, 8, 8, 8, 9, 9, 9, 9, 10, 10, 10, 10, 11, 11, 11, 11);
        __m512i _pidx3 = _mm512_setr_epi32(12, 12, 12, 12, 13, 13, 13, 13, 14, 14, 14, 14, 15, 15, 15, 15);
        __m512i _pidx = _mm512_setr_epi32(0, 4, 8, 12, 2, 6, 10, 14, 1, 5, 9, 13, 3, 7, 11, 15);
        for (; j + 15 < size1; j += 16)
        {
            __m512 _p0 = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr + 16);
            __m512 _p2 = _mm512_loadu_ps(ptr + 32);
            __m512 _p3 = _mm512_loadu_ps(ptr + 48);

            __m512 _max = _mm512_loadu_ps(maxptr);
            __m512 _max0 = _mm512_permutexvar_ps(_pidx0, _max);
            __m512 _max1 = _mm512_permutexvar_ps(_pidx1, _max);
            __m512 _max2 = _mm512_permutexvar_ps(_pidx2, _max);
            __m512 _max3 = _mm512_permutexvar_ps(_pidx3, _max);

            _p0 = exp512_ps(_mm512_sub_ps(_p0, _max0));
            _p1 = exp512_ps(_mm512_sub_ps(_p1, _max1));
            _p2 = exp512_ps(_mm512_sub_ps(_p2, _max2));
            _p3 = exp512_ps(_mm512_sub_ps(_p3, _max3));

            _mm512_storeu_ps(ptr, _p0);
            _mm512_storeu_ps(ptr + 16, _p1);
            _mm512_storeu_ps(ptr + 32, _p2);
            _mm512_storeu_ps(ptr + 48, _p3);

            __m512 _tmp0 = _mm512_unpacklo_ps(_p0, _p1);
            __m512 _tmp1 = _mm512_unpackhi_ps(_p0, _p1);
            __m512 _tmp2 = _mm512_unpacklo_ps(_p2, _p3);
            __m512 _tmp3 = _mm512_unpackhi_ps(_p2, _p3);

            __m512 _sum01 = _mm512_add_ps(_tmp0, _tmp1);
            __m512 _sum23 = _mm512_add_ps(_tmp2, _tmp3);

            _tmp0 = _mm512_unpacklo_ps(_sum01, _sum23);
            _tmp1 = _mm512_unpackhi_ps(_sum01, _sum23);

            __m512 _sum0123 = _mm512_add_ps(_tmp0, _tmp1);

            _sum0123 = _mm512_permutexvar_ps(_pidx, _sum0123);

            __m512 _sum = _mm512_loadu_ps(sumptr);
            _sum = _mm512_add_ps(_sum, _sum0123);
            _mm512_storeu_ps(sumptr, _sum);
            ptr += 64;
            maxptr += 16;
            sumptr += 16;
        }
#endif // __AVX512F__
        for (; j + 7 < size1; j += 8)
        {
            __m256 _p0 = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr + 8);
            __m256 _p2 = _mm256_loadu_ps(ptr + 16);
            __m256 _p3 = _mm256_loadu_ps(ptr + 24);
            _p0 = exp256_ps(_mm256_sub_ps(_p0, combine4x2_ps(_mm_set1_ps(maxptr[0]), _mm_set1_ps(maxptr[1]))));
            _p1 = exp256_ps(_mm256_sub_ps(_p1, combine4x2_ps(_mm_set1_ps(maxptr[2]), _mm_set1_ps(maxptr[3]))));
            _p2 = exp256_ps(_mm256_sub_ps(_p2, combine4x2_ps(_mm_set1_ps(maxptr[4]), _mm_set1_ps(maxptr[5]))));
            _p3 = exp256_ps(_mm256_sub_ps(_p3, combine4x2_ps(_mm_set1_ps(maxptr[6]), _mm_set1_ps(maxptr[7]))));
            _mm256_storeu_ps(ptr, _p0);
            _mm256_storeu_ps(ptr + 8, _p1);
            _mm256_storeu_ps(ptr + 16, _p2);
            _mm256_storeu_ps(ptr + 24, _p3);
            __m256 _tmp0 = _mm256_unpacklo_ps(_p0, _p1);
            __m256 _tmp1 = _mm256_unpackhi_ps(_p0, _p1);
            __m256 _tmp2 = _mm256_unpacklo_ps(_p2, _p3);
            __m256 _tmp3 = _mm256_unpackhi_ps(_p2, _p3);
            __m256 _sum01 = _mm256_add_ps(_tmp0, _tmp1);
            __m256 _sum23 = _mm256_add_ps(_tmp2, _tmp3);
            _tmp0 = _mm256_permute2f128_ps(_sum01, _sum23, _MM_SHUFFLE(0, 2, 0, 0));
            _tmp1 = _mm256_permute2f128_ps(_sum01, _sum23, _MM_SHUFFLE(0, 3, 0, 1));
            _sum01 = _mm256_unpacklo_ps(_tmp0, _tmp1);
            _sum23 = _mm256_unpackhi_ps(_tmp0, _tmp1);
            __m256 _sum0123 = _mm256_add_ps(_sum01, _sum23);
            __m256 _sum = _mm256_loadu_ps(sumptr);
            _sum = _mm256_add_ps(_sum, _sum0123);
            _mm256_storeu_ps(sumptr, _sum);
            ptr += 32;
            maxptr += 8;
            sumptr += 8;
        }
#endif // __AVX__
        for (; j + 3 < size1; j += 4)
        {
            __m128 _p0 = _mm_loadu_ps(ptr);
            __m128 _p1 = _mm_loadu_ps(ptr + 4);
            __m128 _p2 = _mm_loadu_ps(ptr + 8);
            __m128 _p3 = _mm_loadu_ps(ptr + 12);
            _p0 = exp_ps(_mm_sub_ps(_p0, _mm_set1_ps(maxptr[0])));
            _p1 = exp_ps(_mm_sub_ps(_p1, _mm_set1_ps(maxptr[1])));
            _p2 = exp_ps(_mm_sub_ps(_p2, _mm_set1_ps(maxptr[2])));
            _p3 = exp_ps(_mm_sub_ps(_p3, _mm_set1_ps(maxptr[3])));
            _mm_storeu_ps(ptr, _p0);
            _mm_storeu_ps(ptr + 4, _p1);
            _mm_storeu_ps(ptr + 8, _p2);
            _mm_storeu_ps(ptr + 12, _p3);
            _MM_TRANSPOSE4_PS(_p0, _p1, _p2, _p3);
            __m128 _sum01 = _mm_add_ps(_p0, _p1);
            __m128 _sum23 = _mm_add_ps(_p2, _p3);
            __m128 _sum0123 = _mm_add_ps(_sum01, _sum23);
            __m128 _sum = _mm_loadu_ps(sumptr);
            _sum = _mm_add_ps(_sum, _sum0123);
            _mm_storeu_ps(sumptr, _sum);
            ptr += 16;
            maxptr += 4;
            sumptr += 4;
        }
        for (; j < size1; j++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _max = _mm_set1_ps(*maxptr);
            _p = exp_ps(_mm_sub_ps(_p, _max));
            _mm_storeu_ps(ptr, _p);
            *sumptr += _mm_reduce_add_ps(_p);
            ptr += 4;
            maxptr++;
            sumptr++;
        }
    }

    {
        float* sumptr = _sumptr;
        int j = 0;
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; j + 15 < size1; j += 16)
        {
            __m512 _sum = _mm512_loadu_ps(sumptr);
            _sum = _mm512_div_ps(_one_avx512, _sum);
            _mm512_storeu_ps(sumptr, _sum);
            sumptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; j + 7 < size1; j += 8)
        {
            __m256 _sum = _mm256_loadu_ps(sumptr);
            _sum = _mm256_div_ps(_one_avx, _sum);
            _mm256_storeu_ps(sumptr, _sum);
            sumptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        for (; j + 3 < size1; j += 4)
        {
            __m128 _sum = _mm_loadu_ps(sumptr);
            _sum = _mm_div_ps(_one, _sum);
            _mm_storeu_ps(sumptr, _sum);
            sumptr += 4;
        }
        for (; j < size1; j++)
        {
            *sumptr = 1.f / *sumptr;
            sumptr++;
        }
    }

    // div sum
    for (int i = 0; i < elemcount; i++)
    {
        float* ptr = _ptr + i * stride;
        const float* sumptr = _sumptr;

        int j = 0;
#if __AVX__
#if __AVX512F__
        __m512i _pidx0 = _mm512_setr_epi32(0, 0, 0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3);
        __m512i _pidx1 = _mm512_setr_epi32(4, 4, 4, 4, 5, 5, 5, 5, 6, 6, 6, 6, 7, 7, 7, 7);
        __m512i _pidx2 = _mm512_setr_epi32(8, 8, 8, 8, 9, 9, 9, 9, 10, 10, 10, 10, 11, 11, 11, 11);
        __m512i _pidx3 = _mm512_setr_epi32(12, 12, 12, 12, 13, 13, 13, 13, 14, 14, 14, 14, 15, 15, 15, 15);
        for (; j + 15 < size1; j += 16)
        {
            __m512 _p0 = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr + 16);
            __m512 _p2 = _mm512_loadu_ps(ptr + 32);
            __m512 _p3 = _mm512_loadu_ps(ptr + 48);

            __m512 _sum = _mm512_loadu_ps(sumptr);
            __m512 _sum0 = _mm512_permutexvar_ps(_pidx0, _sum);
            __m512 _sum1 = _mm512_permutexvar_ps(_pidx1, _sum);
            __m512 _sum2 = _mm512_permutexvar_ps(_pidx2, _sum);
            __m512 _sum3 = _mm512_permutexvar_ps(_pidx3, _sum);

            _p0 = _mm512_mul_ps(_p0, _sum0);
            _p1 = _mm512_mul_ps(_p1, _sum1);
            _p2 = _mm512_mul_ps(_p2, _sum2);
            _p3 = _mm512_mul_ps(_p3, _sum3);
            _mm512_storeu_ps(ptr, _p0);
            _mm512_storeu_ps(ptr + 16, _p1);
            _mm512_storeu_ps(ptr + 32, _p2);
            _mm512_storeu_ps(ptr + 48, _p3);
            ptr += 64;
            sumptr += 16;
        }
#endif // __AVX512F__
        for (; j + 7 < size1; j += 8)
        {
            __m256 _p0 = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr + 8);
            __m256 _p2 = _mm256_loadu_ps(ptr + 16);
            __m256 _p3 = _mm256_loadu_ps(ptr + 24);
            _p0 = _mm256_mul_ps(_p0, combine4x2_ps(_mm_set1_ps(sumptr[0]), _mm_set1_ps(sumptr[1])));
            _p1 = _mm256_mul_ps(_p1, combine4x2_ps(_mm_set1_ps(sumptr[2]), _mm_set1_ps(sumptr[3])));
            _p2 = _mm256_mul_ps(_p2, combine4x2_ps(_mm_set1_ps(sumptr[4]), _mm_set1_ps(sumptr[5])));
            _p3 = _mm256_mul_ps(_p3, combine4x2_ps(_mm_set1_ps(sumptr[6]), _mm_set1_ps(sumptr[7])));
            _mm256_storeu_ps(ptr, _p0);
            _mm256_storeu_ps(ptr + 8, _p1);
            _mm256_storeu_ps(ptr + 16, _p2);
            _mm256_storeu_ps(ptr + 24, _p3);
            ptr += 32;
            sumptr += 8;
        }
#endif // __AVX__
        for (; j + 3 < size1; j += 4)
        {
            __m128 _p0 = _mm_loadu_ps(ptr);
            __m128 _p1 = _mm_loadu_ps(ptr + 4);
            __m128 _p2 = _mm_loadu_ps(ptr + 8);
            __m128 _p3 = _mm_loadu_ps(ptr + 12);
            _p0 = _mm_mul_ps(_p0, _mm_set1_ps(sumptr[0]));
            _p1 = _mm_mul_ps(_p1, _mm_set1_ps(sumptr[1]));
            _p2 = _mm_mul_ps(_p2, _mm_set1_ps(sumptr[2]));
            _p3 = _mm_mul_ps(_p3, _mm_set1_ps(sumptr[3]));
            _mm_storeu_ps(ptr, _p0);
            _mm_storeu_ps(ptr + 4, _p1);
            _mm_storeu_ps(ptr + 8, _p2);
            _mm_storeu_ps(ptr + 12, _p3);
            ptr += 16;
            sumptr += 4;
        }
        for (; j < size1; j++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _sum = _mm_set1_ps(*sumptr);
            _p = _mm_mul_ps(_p, _sum);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
            sumptr++;
        }
    }
}